

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

char * duckdb_yyjson::yyjson_mut_write_opts_impl
                 (yyjson_mut_val *val,usize estimated_val_num,yyjson_write_flag flg,
                 yyjson_alc *alc_ptr,usize *dat_len,yyjson_write_err *err)

{
  byte bVar1;
  ushort uVar2;
  undefined4 uVar3;
  _func_void_ptr_void_ptr_size_t *p_Var4;
  _func_void_void_ptr_void_ptr *p_Var5;
  void *pvVar6;
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t *p_Var7;
  void *pvVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  long lVar57;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  uint64_t uVar58;
  uint *puVar59;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  char *pcVar60;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  int iVar61;
  char *pcVar62;
  long lVar63;
  size_t sVar64;
  ulong uVar65;
  yyjson_write_err *pyVar66;
  yyjson_write_err *pyVar67;
  undefined2 uVar68;
  uint uVar69;
  int iVar70;
  undefined8 *puVar71;
  undefined8 uVar72;
  size_t sVar73;
  ulong uVar74;
  uint *puVar75;
  ulong uVar76;
  uint uVar77;
  ulong uVar78;
  long lVar79;
  byte *pbVar80;
  ulong uVar81;
  int iVar82;
  uint uVar83;
  int iVar84;
  yyjson_mut_val *pyVar85;
  yyjson_mut_val *pyVar86;
  uint *puVar87;
  undefined2 *puVar88;
  ulong *puVar89;
  ulong *puVar90;
  int iVar91;
  uint uVar92;
  long lVar93;
  ulong uVar94;
  ulong uVar95;
  uint uVar96;
  undefined **ppuVar97;
  ulong uVar98;
  undefined1 *puVar99;
  long lVar100;
  byte *pbVar101;
  byte bVar102;
  undefined1 *puVar103;
  uint *puVar104;
  ulong uVar105;
  uint *puVar106;
  uint *puVar107;
  size_t sVar108;
  bool bVar109;
  bool bVar110;
  yyjson_write_err dummy_err;
  byte *local_f8;
  char local_ec;
  ulong local_e0;
  uint local_c0;
  uint *local_90;
  ulong *local_88;
  yyjson_mut_val *local_80;
  uint *local_70;
  uint *local_58;
  yyjson_write_err local_48;
  long local_38;
  
  ppuVar97 = &YYJSON_DEFAULT_ALC;
  if (alc_ptr != (yyjson_alc *)0x0) {
    ppuVar97 = &alc_ptr->malloc;
  }
  pyVar67 = err;
  if (err == (yyjson_write_err *)0x0) {
    pyVar67 = &local_48;
  }
  if (val != (yyjson_mut_val *)0x0) {
    p_Var4 = ((yyjson_alc *)ppuVar97)->malloc;
    p_Var5 = ((yyjson_alc *)ppuVar97)->free;
    pvVar6 = ((yyjson_alc *)ppuVar97)->ctx;
    uVar78 = val->tag;
    bVar102 = (byte)uVar78;
    local_ec = (char)flg;
    if (0xff < uVar78 && (~bVar102 & 6) == 0) {
      p_Var7 = ((yyjson_alc *)ppuVar97)->realloc;
      if ((flg & 0x41) == 0) {
        if ((flg & 2) == 0) {
          puVar99 = enc_table_cpy;
          puVar103 = enc_table_cpy_slash;
        }
        else {
          puVar99 = enc_table_esc;
          puVar103 = enc_table_esc_slash;
        }
        if ((flg & 4) == 0) {
          puVar103 = puVar99;
        }
        sVar108 = estimated_val_num * 0x12 + 0x4f & 0xfffffffffffffff0;
        local_f8 = (byte *)(*p_Var4)(pvVar6,sVar108);
        if (local_f8 != (byte *)0x0) {
          uVar69 = (uint)val->tag & 7;
          bVar110 = uVar69 == 7;
          local_e0 = (ulong)bVar110;
          lVar93 = (val->tag >> 8) << bVar110;
          *local_f8 = bVar110 << 5 | 0x5b;
          local_80 = (yyjson_mut_val *)(val->uni).u64;
          if (uVar69 == 7) {
            local_80 = local_80->next;
          }
          puVar106 = (uint *)(local_f8 + sVar108);
          puVar104 = (uint *)(local_f8 + 1);
          local_90 = puVar106;
LAB_018d6a8c:
          uVar78 = local_e0 & 0xff;
          puVar87 = puVar106;
          pyVar85 = local_80;
          puVar75 = puVar104;
LAB_018d6aab:
          pyVar85 = pyVar85->next;
          uVar95 = pyVar85->tag;
          bVar102 = (byte)uVar95 & 7;
          if (bVar102 == 4) {
            if (puVar87 <= puVar75 + 8) {
              uVar95 = sVar108 >> 1;
              if (uVar95 < 0x21) {
                uVar95 = 0x20;
              }
              sVar64 = (uVar95 + 0xf & 0xfffffffffffffff0) + sVar108;
              pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar108,sVar64);
              if (pbVar80 == (byte *)0x0) goto LAB_018d8ec1;
              sVar73 = (long)local_90 - (long)puVar87;
              memmove(pbVar80 + (sVar64 - sVar73),pbVar80 + ((long)puVar87 - (long)local_f8),sVar73)
              ;
              puVar75 = (uint *)(pbVar80 + ((long)puVar75 - (long)local_f8));
              local_90 = (uint *)(pbVar80 + sVar64);
              sVar108 = sVar64;
              puVar87 = (uint *)(pbVar80 + (sVar64 - sVar73));
              local_f8 = pbVar80;
            }
            pcVar60 = (char *)(pyVar85->uni).u64;
            uVar69 = (uint)((ulong)pcVar60 >> 0x20);
            if ((pyVar85->tag & 0x10) == 0) {
              uVar69 = uVar69 >> 0x1f & (uint)(pyVar85->tag >> 3);
              *(byte *)puVar75 = 0x2d;
              pcVar62 = (char *)-(long)pcVar60;
              if (uVar69 == 0) {
                pcVar62 = pcVar60;
              }
              pbVar80 = (byte *)((ulong)uVar69 + (long)puVar75);
              if (pcVar62 < (char *)0x5f5e100) {
                if (pcVar62 < (char *)0x64) {
                  *(undefined2 *)pbVar80 =
                       *(undefined2 *)
                        (digit_table + (ulong)(pcVar62 < (char *)0xa) + (long)pcVar62 * 2);
                  puVar75 = (uint *)(pbVar80 + (2 - (ulong)(pcVar62 < (char *)0xa)));
                }
                else {
                  iVar70 = (int)pcVar62;
                  if (pcVar62 < (char *)0x2710) {
                    uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                    uVar95 = (ulong)(pcVar62 < (char *)0x3e8);
                    *(undefined2 *)pbVar80 =
                         *(undefined2 *)(digit_table + uVar95 + (ulong)uVar69 * 2);
                    *(undefined2 *)(pbVar80 + (2 - uVar95)) =
                         *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                    puVar75 = (uint *)(pbVar80 + (4 - uVar95));
                  }
                  else if (pcVar62 < (char *)0xf4240) {
                    iVar70 = (int)((ulong)((long)pcVar62 * 0x68db9) >> 0x20) * -10000 + iVar70;
                    uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                    uVar95 = (ulong)(pcVar62 < (char *)0x186a0);
                    *(undefined2 *)pbVar80 =
                         *(undefined2 *)
                          (digit_table + uVar95 + ((ulong)((long)pcVar62 * 0x68db9) >> 0x20) * 2);
                    *(undefined2 *)(pbVar80 + (2 - uVar95)) =
                         *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                    *(undefined2 *)(pbVar80 + (4 - uVar95)) =
                         *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                    puVar75 = (uint *)(pbVar80 + (6 - uVar95));
                  }
                  else {
                    uVar69 = (uint)((ulong)((long)pcVar62 * 0x68db8bb) >> 0x20);
                    uVar77 = uVar69 >> 8;
                    iVar70 = uVar77 * -10000 + iVar70;
                    uVar77 = uVar77 * 0x147b >> 0x13;
                    uVar83 = (uint)(iVar70 * 0x147b) >> 0x13;
                    uVar95 = (ulong)(pcVar62 < "edRowGroupE");
                    *(undefined2 *)pbVar80 =
                         *(undefined2 *)(digit_table + uVar95 + (ulong)uVar77 * 2);
                    *(undefined2 *)(pbVar80 + (2 - uVar95)) =
                         *(undefined2 *)(digit_table + (uVar77 * -100 + (uVar69 >> 8)) * 2);
                    *(undefined2 *)(pbVar80 + (4 - uVar95)) =
                         *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                    *(undefined2 *)(pbVar80 + (6 - uVar95)) =
                         *(undefined2 *)(digit_table + (uVar83 * -100 + iVar70) * 2);
                    puVar75 = (uint *)(pbVar80 + (8 - uVar95));
                  }
                }
              }
              else {
                uVar95 = (ulong)pcVar62 / 100000000;
                pcVar60 = pcVar62 + uVar95 * 0xfa0a1f00;
                iVar70 = (int)uVar95;
                if (pcVar62 < (char *)0x2386f26fc10000) {
                  if (pcVar62 < (char *)0x2540be400) {
                    *(undefined2 *)pbVar80 =
                         *(undefined2 *)
                          (digit_table + (ulong)(pcVar62 < (char *)0x3b9aca00) + uVar95 * 2);
                    pbVar80 = pbVar80 + (2 - (ulong)(pcVar62 < (char *)0x3b9aca00));
                  }
                  else if (pcVar62 < (char *)0xe8d4a51000) {
                    uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                    uVar95 = (ulong)(pcVar62 < (char *)0x174876e800);
                    *(undefined2 *)pbVar80 =
                         *(undefined2 *)(digit_table + uVar95 + (ulong)uVar69 * 2);
                    *(undefined2 *)(pbVar80 + (2 - uVar95)) =
                         *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                    pbVar80 = pbVar80 + (4 - uVar95);
                  }
                  else if (pcVar62 < (char *)0x5af3107a4000) {
                    iVar70 = (int)(uVar95 * 0x68db9 >> 0x20) * -10000 + iVar70;
                    uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                    uVar76 = (ulong)(pcVar62 < (char *)0x9184e72a000);
                    *(undefined2 *)pbVar80 =
                         *(undefined2 *)(digit_table + uVar76 + (uVar95 * 0x68db9 >> 0x20) * 2);
                    *(undefined2 *)(pbVar80 + (2 - uVar76)) =
                         *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                    *(undefined2 *)(pbVar80 + (4 - uVar76)) =
                         *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                    pbVar80 = pbVar80 + (6 - uVar76);
                  }
                  else {
                    uVar69 = (uint)(uVar95 * 0x68db8bb >> 0x20);
                    uVar77 = uVar69 >> 8;
                    iVar70 = uVar77 * -10000 + iVar70;
                    uVar77 = uVar77 * 0x147b >> 0x13;
                    uVar83 = (uint)(iVar70 * 0x147b) >> 0x13;
                    uVar95 = (ulong)(pcVar62 < (char *)0x38d7ea4c68000);
                    *(undefined2 *)pbVar80 =
                         *(undefined2 *)(digit_table + uVar95 + (ulong)uVar77 * 2);
                    *(undefined2 *)(pbVar80 + (2 - uVar95)) =
                         *(undefined2 *)(digit_table + (uVar77 * -100 + (uVar69 >> 8)) * 2);
                    *(undefined2 *)(pbVar80 + (4 - uVar95)) =
                         *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                    *(undefined2 *)(pbVar80 + (6 - uVar95)) =
                         *(undefined2 *)(digit_table + (uVar83 * -100 + iVar70) * 2);
                    pbVar80 = pbVar80 + (8 - uVar95);
                  }
                  uVar69 = (uint)(((ulong)pcVar60 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar77 = uVar69 >> 8;
                  iVar70 = uVar77 * -10000 + (int)pcVar60;
                  uVar77 = uVar77 * 0x147b >> 0x13;
                  uVar83 = (uint)(iVar70 * 0x147b) >> 0x13;
                  *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + (ulong)uVar77 * 2);
                  *(undefined2 *)(pbVar80 + 2) =
                       *(undefined2 *)(digit_table + (uVar77 * -100 + (uVar69 >> 8)) * 2);
                  *(undefined2 *)(pbVar80 + 4) = *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                  *(undefined2 *)(pbVar80 + 6) =
                       *(undefined2 *)(digit_table + (uVar83 * 0x7fffff9c + iVar70) * 2);
                  puVar75 = (uint *)(pbVar80 + 8);
                }
                else {
                  uVar95 = (ulong)pcVar62 / 1000000000000;
                  iVar61 = (int)uVar95;
                  if (pcVar62 < (char *)0xde0b6b3a7640000) {
                    iVar91 = (int)(uVar95 * 0x68db9 >> 0x20) * -10000 + iVar61;
                    uVar69 = (uint)(iVar91 * 0x147b) >> 0x13;
                    uVar76 = (ulong)(pcVar62 < (char *)0x16345785d8a0000);
                    *(undefined2 *)pbVar80 =
                         *(undefined2 *)(digit_table + uVar76 + (uVar95 * 0x68db9 >> 0x20) * 2);
                    *(undefined2 *)(pbVar80 + (2 - uVar76)) =
                         *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                    *(undefined2 *)(pbVar80 + (4 - uVar76)) =
                         *(undefined2 *)(digit_table + (uVar69 * -100 + iVar91) * 2);
                    lVar100 = 6 - uVar76;
                  }
                  else {
                    uVar69 = (uint)(uVar95 / 10000);
                    iVar91 = uVar69 * -10000 + iVar61;
                    uVar69 = uVar69 / 100;
                    uVar77 = (uint)(iVar91 * 0x147b) >> 0x13;
                    uVar76 = (ulong)(pcVar62 < (char *)0x8ac7230489e80000);
                    *(undefined2 *)pbVar80 =
                         *(undefined2 *)(digit_table + uVar76 + (ulong)uVar69 * 2);
                    *(undefined2 *)(pbVar80 + (2 - uVar76)) =
                         *(undefined2 *)(digit_table + (uVar69 * -100 + (int)(uVar95 / 10000)) * 2);
                    *(undefined2 *)(pbVar80 + (4 - uVar76)) =
                         *(undefined2 *)(digit_table + (ulong)uVar77 * 2);
                    *(undefined2 *)(pbVar80 + (6 - uVar76)) =
                         *(undefined2 *)(digit_table + (uVar77 * -100 + iVar91) * 2);
                    lVar100 = 8 - uVar76;
                  }
                  pbVar80 = pbVar80 + lVar100;
                  iVar70 = iVar70 + iVar61 * -10000;
                  uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                  *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                  *(undefined2 *)(pbVar80 + 2) =
                       *(undefined2 *)(digit_table + (uVar69 * 0x7fffff9c + iVar70) * 2);
                  uVar69 = (uint)(((ulong)pcVar60 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar77 = uVar69 >> 8;
                  iVar70 = uVar77 * -10000 + (int)pcVar60;
                  uVar77 = uVar77 * 0x147b >> 0x13;
                  uVar83 = (uint)(iVar70 * 0x147b) >> 0x13;
                  *(undefined2 *)(pbVar80 + 4) = *(undefined2 *)(digit_table + (ulong)uVar77 * 2);
                  *(undefined2 *)(pbVar80 + 6) =
                       *(undefined2 *)(digit_table + (uVar77 * -100 + (uVar69 >> 8)) * 2);
                  *(undefined2 *)(pbVar80 + 8) = *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                  *(undefined2 *)(pbVar80 + 10) =
                       *(undefined2 *)(digit_table + (uVar83 * 0x7fffff9c + iVar70) * 2);
                  puVar75 = (uint *)(pbVar80 + 0xc);
                }
              }
            }
            else {
              uVar95 = (ulong)pcVar60 & 0xfffffffffffff;
              uVar69 = uVar69 >> 0x14 & 0x7ff;
              if (uVar69 == 0x7ff) {
                if ((flg & 0x10) == 0) {
                  if ((flg & 8) == 0) {
                    puVar75 = (uint *)0x0;
                  }
                  else if (uVar95 == 0) {
                    *(byte *)puVar75 = 0x2d;
                    puVar71 = (undefined8 *)((long)puVar75 - ((long)pcVar60 >> 0x3f));
                    *puVar71 = 0x7974696e69666e49;
                    puVar75 = (uint *)(puVar71 + 1);
                  }
                  else {
                    *puVar75 = 0x4e614e;
                    puVar75 = (uint *)((long)puVar75 + 3);
                  }
                }
                else {
                  *puVar75 = 0x6c6c756e;
                  puVar75 = puVar75 + 1;
                }
              }
              else {
                *(byte *)puVar75 = 0x2d;
                lVar100 = -((long)pcVar60 >> 0x3f);
                puVar71 = (undefined8 *)((long)puVar75 + lVar100);
                if (((ulong)pcVar60 & 0x7fffffffffffffff) == 0) {
                  *(undefined4 *)puVar71 = 0x302e30;
                  puVar75 = (uint *)((long)puVar71 + 3);
                }
                else if (uVar69 == 0) {
                  yyjson_mut_write_opts_impl();
                  puVar75 = local_70;
                }
                else {
                  uVar76 = uVar95 + 0x10000000000000;
                  if (uVar69 - 0x3ff < 0x35) {
                    lVar79 = 0;
                    if (uVar76 != 0) {
                      for (; (uVar76 >> lVar79 & 1) == 0; lVar79 = lVar79 + 1) {
                      }
                    }
                    if (0x433 - uVar69 <= (uint)lVar79) {
                      pcVar60 = (char *)(uVar76 >> ((byte)(0x433 - uVar69) & 0x3f));
                      if (pcVar60 < (char *)0x5f5e100) {
                        if (pcVar60 < (char *)0x64) {
                          *(undefined2 *)puVar71 =
                               *(undefined2 *)
                                (digit_table + (ulong)(pcVar60 < (char *)0xa) + (long)pcVar60 * 2);
                          puVar88 = (undefined2 *)
                                    ((long)puVar71 + (2 - (ulong)(pcVar60 < (char *)0xa)));
                        }
                        else {
                          iVar70 = (int)pcVar60;
                          if (pcVar60 < (char *)0x2710) {
                            uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                            uVar95 = (ulong)(pcVar60 < (char *)0x3e8);
                            *(undefined2 *)puVar71 =
                                 *(undefined2 *)(digit_table + uVar95 + (ulong)uVar69 * 2);
                            *(undefined2 *)((long)puVar71 + (2 - uVar95)) =
                                 *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                            puVar88 = (undefined2 *)((long)puVar71 + (4 - uVar95));
                          }
                          else if (pcVar60 < (char *)0xf4240) {
                            iVar70 = (int)((ulong)((long)pcVar60 * 0x68db9) >> 0x20) * -10000 +
                                     iVar70;
                            uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                            uVar95 = (ulong)(pcVar60 < (char *)0x186a0);
                            *(undefined2 *)puVar71 =
                                 *(undefined2 *)
                                  (digit_table +
                                  uVar95 + ((ulong)((long)pcVar60 * 0x68db9) >> 0x20) * 2);
                            *(undefined2 *)((long)puVar71 + (2 - uVar95)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                            *(undefined2 *)((long)puVar71 + (4 - uVar95)) =
                                 *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                            puVar88 = (undefined2 *)((long)puVar71 + (6 - uVar95));
                          }
                          else {
                            uVar69 = (uint)((ulong)((long)pcVar60 * 0x68db8bb) >> 0x20);
                            uVar77 = uVar69 >> 8;
                            iVar70 = uVar77 * -10000 + iVar70;
                            uVar77 = uVar77 * 0x147b >> 0x13;
                            uVar83 = (uint)(iVar70 * 0x147b) >> 0x13;
                            uVar95 = (ulong)(pcVar60 < "edRowGroupE");
                            *(undefined2 *)puVar71 =
                                 *(undefined2 *)(digit_table + uVar95 + (ulong)uVar77 * 2);
                            *(undefined2 *)((long)puVar71 + (2 - uVar95)) =
                                 *(undefined2 *)(digit_table + (uVar77 * -100 + (uVar69 >> 8)) * 2);
                            *(undefined2 *)((long)puVar71 + (4 - uVar95)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                            *(undefined2 *)((long)puVar71 + (6 - uVar95)) =
                                 *(undefined2 *)(digit_table + (uVar83 * -100 + iVar70) * 2);
                            puVar88 = (undefined2 *)((long)puVar71 + (8 - uVar95));
                          }
                        }
                      }
                      else {
                        auVar22._8_8_ = 0;
                        auVar22._0_8_ = pcVar60;
                        uVar95 = SUB168(auVar22 * ZEXT816(0xabcc77118461d),8) >> 0xe;
                        if (pcVar60 < (char *)0x2540be400) {
                          *(undefined2 *)puVar71 =
                               *(undefined2 *)
                                (digit_table + (ulong)(pcVar60 < (char *)0x3b9aca00) + uVar95 * 2);
                          puVar88 = (undefined2 *)
                                    ((long)puVar71 + (2 - (ulong)(pcVar60 < (char *)0x3b9aca00)));
                        }
                        else {
                          iVar70 = (int)uVar95;
                          if (pcVar60 < (char *)0xe8d4a51000) {
                            uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                            uVar76 = (ulong)(pcVar60 < (char *)0x174876e800);
                            *(undefined2 *)puVar71 =
                                 *(undefined2 *)(digit_table + uVar76 + (ulong)uVar69 * 2);
                            *(undefined2 *)((long)puVar71 + (2 - uVar76)) =
                                 *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                            puVar88 = (undefined2 *)((long)puVar71 + (4 - uVar76));
                          }
                          else if (pcVar60 < (char *)0x5af3107a4000) {
                            iVar70 = (int)(uVar95 * 0x68db9 >> 0x20) * -10000 + iVar70;
                            uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                            uVar76 = (ulong)(pcVar60 < (char *)0x9184e72a000);
                            *(undefined2 *)puVar71 =
                                 *(undefined2 *)
                                  (digit_table + uVar76 + (uVar95 * 0x68db9 >> 0x20) * 2);
                            *(undefined2 *)((long)puVar71 + (2 - uVar76)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                            *(undefined2 *)((long)puVar71 + (4 - uVar76)) =
                                 *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                            puVar88 = (undefined2 *)((long)puVar71 + (6 - uVar76));
                          }
                          else {
                            uVar69 = (uint)(uVar95 * 0x68db8bb >> 0x20);
                            uVar77 = uVar69 >> 8;
                            iVar70 = uVar77 * -10000 + iVar70;
                            uVar77 = uVar77 * 0x147b >> 0x13;
                            uVar83 = (uint)(iVar70 * 0x147b) >> 0x13;
                            uVar76 = (ulong)(pcVar60 < (char *)0x38d7ea4c68000);
                            *(undefined2 *)puVar71 =
                                 *(undefined2 *)(digit_table + uVar76 + (ulong)uVar77 * 2);
                            *(undefined2 *)((long)puVar71 + (2 - uVar76)) =
                                 *(undefined2 *)(digit_table + (uVar77 * -100 + (uVar69 >> 8)) * 2);
                            *(undefined2 *)((long)puVar71 + (4 - uVar76)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                            *(undefined2 *)((long)puVar71 + (6 - uVar76)) =
                                 *(undefined2 *)(digit_table + (uVar83 * -100 + iVar70) * 2);
                            puVar88 = (undefined2 *)((long)puVar71 + (8 - uVar76));
                          }
                        }
                        uVar69 = (uint)(((ulong)(pcVar60 + uVar95 * 0xfa0a1f00) & 0xffffffff) *
                                        0x68db8bb >> 0x20);
                        uVar77 = uVar69 >> 8;
                        iVar70 = uVar77 * -10000 + (int)(pcVar60 + uVar95 * 0xfa0a1f00);
                        uVar77 = uVar77 * 0x147b >> 0x13;
                        uVar83 = (uint)(iVar70 * 0x147b) >> 0x13;
                        *puVar88 = *(undefined2 *)(digit_table + (ulong)uVar77 * 2);
                        puVar88[1] = *(undefined2 *)
                                      (digit_table + (uVar77 * -100 + (uVar69 >> 8)) * 2);
                        puVar88[2] = *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                        puVar88[3] = *(undefined2 *)
                                      (digit_table + (uVar83 * 0x7fffff9c + iVar70) * 2);
                        puVar88 = puVar88 + 4;
                      }
                      *puVar88 = 0x302e;
                      puVar75 = (uint *)(puVar88 + 1);
                      goto LAB_018d8494;
                    }
                  }
                  uVar65 = (ulong)((uint)pcVar60 & 1);
                  iVar70 = uVar69 * 0x4d105 + -0x200a5;
                  if (uVar69 == 1 || uVar95 != 0) {
                    iVar70 = uVar69 * 0x4d105;
                  }
                  iVar70 = iVar70 + -0x1439b7ff >> 0x14;
                  uVar105 = *(ulong *)(pow10_sig_table + (ulong)(iVar70 * -2 + 0x2ae) * 8);
                  uVar81 = *(long *)(pow10_sig_table + (ulong)(iVar70 * -2 + 0x2af) * 8) +
                           (ulong)(iVar70 - 1U < 0xffffffc8);
                  bVar102 = ((char)((uint)(iVar70 * -0x3526b) >> 0x10) + (char)uVar69) - 0x32;
                  uVar95 = (ulong)(uVar69 != 1 && uVar95 == 0) + uVar76 * 4 + -2 << (bVar102 & 0x3f)
                  ;
                  auVar16._8_8_ = 0;
                  auVar16._0_8_ = uVar81;
                  auVar36._8_8_ = 0;
                  auVar36._0_8_ = uVar95;
                  auVar51._8_8_ = 0;
                  auVar51._0_8_ = SUB168(auVar16 * auVar36,8);
                  auVar17._8_8_ = 0;
                  auVar17._0_8_ = uVar105;
                  auVar37._8_8_ = 0;
                  auVar37._0_8_ = uVar95;
                  auVar51 = auVar17 * auVar37 + auVar51;
                  uVar95 = uVar76 * 4 << (bVar102 & 0x3f);
                  auVar18._8_8_ = 0;
                  auVar18._0_8_ = uVar81;
                  auVar38._8_8_ = 0;
                  auVar38._0_8_ = uVar95;
                  auVar52._8_8_ = 0;
                  auVar52._0_8_ = SUB168(auVar18 * auVar38,8);
                  auVar19._8_8_ = 0;
                  auVar19._0_8_ = uVar105;
                  auVar39._8_8_ = 0;
                  auVar39._0_8_ = uVar95;
                  auVar52 = auVar19 * auVar39 + auVar52;
                  uVar74 = auVar52._8_8_;
                  uVar95 = uVar76 * 4 + 2 << (bVar102 & 0x3f);
                  auVar20._8_8_ = 0;
                  auVar20._0_8_ = uVar81;
                  auVar40._8_8_ = 0;
                  auVar40._0_8_ = uVar95;
                  auVar53._8_8_ = 0;
                  auVar53._0_8_ = SUB168(auVar20 * auVar40,8);
                  auVar21._8_8_ = 0;
                  auVar21._0_8_ = uVar105;
                  auVar41._8_8_ = 0;
                  auVar41._0_8_ = uVar95;
                  auVar53 = auVar21 * auVar41 + auVar53;
                  uVar95 = ((ulong)((auVar51 & (undefined1  [16])0xfffffffffffffffe) !=
                                   (undefined1  [16])0x0) | auVar51._8_8_) + uVar65;
                  uVar65 = ((ulong)((auVar53 & (undefined1  [16])0xfffffffffffffffe) !=
                                   (undefined1  [16])0x0) | auVar53._8_8_) - uVar65;
                  if (uVar74 < 0x28) {
LAB_018d6e8e:
                    uVar105 = (auVar52 & (undefined1  [16])0xfffffffffffffffe) !=
                              (undefined1  [16])0x0 | uVar74;
                    uVar76 = uVar74 & 0xfffffffffffffffc;
                    bVar110 = true;
                    if (uVar105 <= uVar76 + 2) {
                      bVar110 = (bool)((byte)((uVar74 & 0xffffffff) >> 2) & 0x3f &
                                      uVar105 == uVar76 + 2);
                    }
                    bVar109 = uVar76 + 4 <= uVar65;
                    if (uVar76 < uVar95 == bVar109) {
                      bVar110 = bVar109;
                    }
                    uVar95 = (ulong)bVar110 + (uVar74 >> 2);
                  }
                  else {
                    uVar105 = uVar74 / 0x28;
                    uVar76 = uVar105 * 0x28 + 0x28;
                    if (uVar105 * 0x28 < uVar95 != uVar76 <= uVar65) goto LAB_018d6e8e;
                    uVar95 = (uVar105 + 1) - (ulong)(uVar65 < uVar76);
                    iVar70 = iVar70 + 1;
                  }
                  iVar61 = (0x11 - (uint)(uVar95 < 10000000000000000)) -
                           (uint)(uVar95 < 1000000000000000);
                  if (iVar61 + iVar70 + 5U < 0x1b) {
                    uVar69 = iVar61 + iVar70;
                    if ((int)uVar69 < 1) {
                      uVar76 = uVar95 / 100000000;
                      uVar77 = (uint)uVar76;
                      puVar88 = (undefined2 *)
                                ((long)puVar71 +
                                (((ulong)(2 - uVar69) + 1) - (ulong)(uVar77 < 100000000)));
                      iVar91 = (int)((uVar76 & 0xffffffff) / 10000);
                      iVar61 = iVar91 * -10000 + uVar77;
                      uVar95 = uVar76 * 0xfa0a1f00 + uVar95;
                      iVar70 = (int)(((uVar76 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                      uVar96 = (uint)(iVar70 * 0x29) >> 0xc;
                      uVar92 = uVar96 * -100 + iVar70;
                      uVar83 = iVar70 * -100 + iVar91;
                      *(char *)((long)puVar71 + (ulong)(2 - uVar69)) = (char)uVar96 + '0';
                      uVar76 = (ulong)(uVar92 < 10 && uVar77 < 100000000);
                      *puVar88 = *(undefined2 *)(digit_table + uVar76 + uVar92 * 2);
                      *(undefined2 *)((long)puVar88 + (2 - uVar76)) =
                           *(undefined2 *)(digit_table + uVar83 * 2);
                      iVar70 = (int)uVar95;
                      if (iVar70 == 0) {
                        if (iVar61 == 0) {
                          uVar95 = (ulong)(byte)dec_trailing_zero_table[uVar92];
                          if (uVar83 != 0) {
                            uVar95 = 0;
                          }
                          uVar95 = uVar95 + (byte)dec_trailing_zero_table[uVar83];
                          lVar100 = 4;
                        }
                        else {
                          uVar77 = (uint)(iVar61 * 0x147b) >> 0x13;
                          uVar83 = uVar77 * -100 + iVar61;
                          *(undefined2 *)((long)puVar88 + (4 - uVar76)) =
                               *(undefined2 *)(digit_table + (ulong)uVar77 * 2);
                          *(undefined2 *)((long)puVar88 + (6 - uVar76)) =
                               *(undefined2 *)(digit_table + uVar83 * 2);
                          uVar95 = (ulong)(byte)dec_trailing_zero_table[uVar77] + 2;
                          if (uVar83 != 0) {
                            uVar95 = (ulong)(byte)dec_trailing_zero_table[uVar83];
                          }
                          lVar100 = 8;
                        }
                        uVar95 = lVar100 - uVar95;
                      }
                      else {
                        uVar92 = (uint)(iVar61 * 0x147b) >> 0x13;
                        uVar77 = (uint)((uVar95 & 0xffffffff) * 0x68db8bb >> 0x20);
                        uVar96 = uVar77 >> 8;
                        uVar83 = uVar96 * 0x147b >> 0x13;
                        uVar95 = (ulong)uVar83;
                        uVar77 = uVar83 * -100 + (uVar77 >> 8);
                        *(undefined2 *)((long)puVar88 + (4 - uVar76)) =
                             *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                        *(undefined2 *)((long)puVar88 + (6 - uVar76)) =
                             *(undefined2 *)(digit_table + (uVar92 * 0x7fffff9c + iVar61) * 2);
                        *(undefined2 *)((long)puVar88 + (8 - uVar76)) =
                             *(undefined2 *)(digit_table + uVar95 * 2);
                        *(undefined2 *)((long)puVar88 + (10 - uVar76)) =
                             *(undefined2 *)(digit_table + uVar77 * 2);
                        iVar70 = uVar96 * -10000 + iVar70;
                        if (iVar70 == 0) {
                          lVar100 = 0xc;
                        }
                        else {
                          uVar77 = (uint)(iVar70 * 0x147b) >> 0x13;
                          uVar95 = (ulong)uVar77;
                          uVar77 = uVar77 * -100 + iVar70;
                          *(undefined2 *)((long)puVar88 + (0xc - uVar76)) =
                               *(undefined2 *)(digit_table + uVar95 * 2);
                          *(undefined2 *)((long)puVar88 + (0xe - uVar76)) =
                               *(undefined2 *)(digit_table + uVar77 * 2);
                          lVar100 = 0x10;
                        }
                        uVar95 = (ulong)(byte)dec_trailing_zero_table[uVar95] + 2;
                        if (uVar77 != 0) {
                          uVar95 = (ulong)(byte)dec_trailing_zero_table[uVar77];
                        }
                        uVar95 = lVar100 - uVar95;
                      }
                      puVar75 = (uint *)((long)puVar88 + ((uVar95 & 0xffffffff) - uVar76));
                      *(undefined2 *)puVar71 = 0x2e30;
                      if ((int)uVar69 < 0) {
                        uVar77 = -uVar69;
                        if ((int)-uVar69 < 2) {
                          uVar77 = 1;
                        }
                        switchD_01306cb1::default
                                  ((undefined2 *)((long)puVar71 + 2),0x30,(ulong)uVar77);
                      }
                    }
                    else {
                      uVar76 = uVar95 / 100000000;
                      uVar77 = (uint)uVar76;
                      puVar88 = (undefined2 *)((long)puVar71 + (2 - (ulong)(uVar77 < 100000000)));
                      iVar91 = (int)((uVar76 & 0xffffffff) / 10000);
                      iVar61 = iVar91 * -10000 + uVar77;
                      uVar95 = uVar76 * 0xfa0a1f00 + uVar95;
                      iVar70 = (int)(((uVar76 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                      uVar96 = (uint)(iVar70 * 0x29) >> 0xc;
                      uVar92 = uVar96 * -100 + iVar70;
                      uVar83 = iVar70 * -100 + iVar91;
                      *puVar71 = 0x3030303030303030;
                      puVar71[1] = 0x3030303030303030;
                      puVar71[2] = 0x3030303030303030;
                      *(char *)((long)puVar71 + 1) = (char)uVar96 + '0';
                      uVar76 = (ulong)(uVar92 < 10 && uVar77 < 100000000);
                      *puVar88 = *(undefined2 *)(digit_table + uVar76 + uVar92 * 2);
                      *(undefined2 *)((long)puVar88 + (2 - uVar76)) =
                           *(undefined2 *)(digit_table + uVar83 * 2);
                      iVar70 = (int)uVar95;
                      if (iVar70 == 0) {
                        if (iVar61 == 0) {
                          uVar95 = (ulong)(byte)dec_trailing_zero_table[uVar92];
                          if (uVar83 != 0) {
                            uVar95 = 0;
                          }
                          uVar95 = uVar95 + (byte)dec_trailing_zero_table[uVar83];
                          lVar79 = 4;
                        }
                        else {
                          uVar77 = (uint)(iVar61 * 0x147b) >> 0x13;
                          uVar83 = uVar77 * -100 + iVar61;
                          *(undefined2 *)((long)puVar88 + (4 - uVar76)) =
                               *(undefined2 *)(digit_table + (ulong)uVar77 * 2);
                          *(undefined2 *)((long)puVar88 + (6 - uVar76)) =
                               *(undefined2 *)(digit_table + uVar83 * 2);
                          uVar95 = (ulong)(byte)dec_trailing_zero_table[uVar77] + 2;
                          if (uVar83 != 0) {
                            uVar95 = (ulong)(byte)dec_trailing_zero_table[uVar83];
                          }
                          lVar79 = 8;
                        }
                        uVar95 = lVar79 - uVar95;
                      }
                      else {
                        uVar92 = (uint)(iVar61 * 0x147b) >> 0x13;
                        uVar77 = (uint)((uVar95 & 0xffffffff) * 0x68db8bb >> 0x20);
                        uVar96 = uVar77 >> 8;
                        uVar83 = uVar96 * 0x147b >> 0x13;
                        uVar95 = (ulong)uVar83;
                        uVar77 = uVar83 * -100 + (uVar77 >> 8);
                        *(undefined2 *)((long)puVar88 + (4 - uVar76)) =
                             *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                        *(undefined2 *)((long)puVar88 + (6 - uVar76)) =
                             *(undefined2 *)(digit_table + (uVar92 * 0x7fffff9c + iVar61) * 2);
                        *(undefined2 *)((long)puVar88 + (8 - uVar76)) =
                             *(undefined2 *)(digit_table + uVar95 * 2);
                        *(undefined2 *)((long)puVar88 + (10 - uVar76)) =
                             *(undefined2 *)(digit_table + uVar77 * 2);
                        iVar70 = uVar96 * -10000 + iVar70;
                        if (iVar70 == 0) {
                          lVar79 = 0xc;
                        }
                        else {
                          uVar77 = (uint)(iVar70 * 0x147b) >> 0x13;
                          uVar95 = (ulong)uVar77;
                          uVar77 = uVar77 * -100 + iVar70;
                          *(undefined2 *)((long)puVar88 + (0xc - uVar76)) =
                               *(undefined2 *)(digit_table + uVar95 * 2);
                          *(undefined2 *)((long)puVar88 + (0xe - uVar76)) =
                               *(undefined2 *)(digit_table + uVar77 * 2);
                          lVar79 = 0x10;
                        }
                        uVar95 = (ulong)(byte)dec_trailing_zero_table[uVar95] + 2;
                        if (uVar77 != 0) {
                          uVar95 = (ulong)(byte)dec_trailing_zero_table[uVar77];
                        }
                        uVar95 = lVar79 - uVar95;
                      }
                      puVar106 = (uint *)((long)puVar88 + ((uVar95 & 0xffffffff) - uVar76));
                      uVar95 = 1;
                      if (1 < (int)uVar69) {
                        uVar95 = (ulong)uVar69;
                      }
                      uVar76 = 0;
                      do {
                        *(byte *)((long)puVar75 + uVar76 + lVar100) =
                             *(byte *)((long)puVar75 + uVar76 + lVar100 + 1);
                        uVar76 = uVar76 + 1;
                      } while (uVar95 != uVar76);
                      puVar75 = (uint *)((undefined1 *)((ulong)uVar69 + (long)puVar71) + 2);
                      *(undefined1 *)((ulong)uVar69 + (long)puVar71) = 0x2e;
                      if (puVar75 < puVar106) {
                        puVar75 = puVar106;
                      }
                    }
                  }
                  else {
                    uVar76 = uVar95 / 100000000;
                    uVar69 = (uint)uVar76;
                    lVar100 = 2 - (ulong)(uVar69 < 100000000);
                    iVar84 = (int)((uVar76 & 0xffffffff) / 10000);
                    iVar82 = iVar84 * -10000 + uVar69;
                    uVar95 = uVar76 * 0xfa0a1f00 + uVar95;
                    iVar91 = (int)(((uVar76 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                    uVar92 = (uint)(iVar91 * 0x29) >> 0xc;
                    uVar83 = uVar92 * -100 + iVar91;
                    uVar77 = iVar91 * -100 + iVar84;
                    *(char *)((long)puVar71 + 1) = (char)uVar92 + '0';
                    uVar76 = (ulong)(uVar83 < 10 && uVar69 < 100000000);
                    *(undefined2 *)((long)puVar71 + lVar100) =
                         *(undefined2 *)(digit_table + uVar76 + uVar83 * 2);
                    lVar100 = lVar100 - uVar76;
                    *(undefined2 *)((long)puVar71 + lVar100 + 2) =
                         *(undefined2 *)(digit_table + uVar77 * 2);
                    iVar91 = (int)uVar95;
                    if (iVar91 == 0) {
                      if (iVar82 == 0) {
                        uVar69 = (uint)(byte)dec_trailing_zero_table[uVar83];
                        if (uVar77 != 0) {
                          uVar69 = 0;
                        }
                        uVar69 = uVar69 + (byte)dec_trailing_zero_table[uVar77];
                        iVar91 = 4;
                      }
                      else {
                        uVar69 = (uint)(iVar82 * 0x147b) >> 0x13;
                        uVar77 = uVar69 * -100 + iVar82;
                        *(undefined2 *)((long)puVar71 + lVar100 + 4) =
                             *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                        *(undefined2 *)((long)puVar71 + lVar100 + 6) =
                             *(undefined2 *)(digit_table + uVar77 * 2);
                        uVar69 = (byte)dec_trailing_zero_table[uVar69] + 2;
                        if (uVar77 != 0) {
                          uVar69 = (uint)(byte)dec_trailing_zero_table[uVar77];
                        }
                        iVar91 = 8;
                      }
                      uVar69 = iVar91 - uVar69;
                    }
                    else {
                      uVar92 = (uint)(iVar82 * 0x147b) >> 0x13;
                      uVar69 = (uint)((uVar95 & 0xffffffff) * 0x68db8bb >> 0x20);
                      uVar96 = uVar69 >> 8;
                      uVar83 = uVar96 * 0x147b >> 0x13;
                      uVar77 = uVar83 * -100 + (uVar69 >> 8);
                      *(undefined2 *)((long)puVar71 + lVar100 + 4) =
                           *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                      *(undefined2 *)((long)puVar71 + lVar100 + 6) =
                           *(undefined2 *)(digit_table + (uVar92 * 0x7fffff9c + iVar82) * 2);
                      *(undefined2 *)((long)puVar71 + lVar100 + 8) =
                           *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                      *(undefined2 *)((long)puVar71 + lVar100 + 10) =
                           *(undefined2 *)(digit_table + uVar77 * 2);
                      iVar91 = uVar96 * -10000 + iVar91;
                      if (iVar91 == 0) {
                        uVar69 = (byte)dec_trailing_zero_table[uVar83] + 2;
                        if (uVar77 != 0) {
                          uVar69 = (uint)(byte)dec_trailing_zero_table[uVar77];
                        }
                        iVar91 = 0xc;
                      }
                      else {
                        uVar69 = (uint)(iVar91 * 0x147b) >> 0x13;
                        uVar77 = uVar69 * -100 + iVar91;
                        *(undefined2 *)((long)puVar71 + lVar100 + 0xc) =
                             *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                        *(undefined2 *)((long)puVar71 + lVar100 + 0xe) =
                             *(undefined2 *)(digit_table + uVar77 * 2);
                        uVar69 = (byte)dec_trailing_zero_table[uVar69] + 2;
                        if (uVar77 != 0) {
                          uVar69 = (uint)(byte)dec_trailing_zero_table[uVar77];
                        }
                        iVar91 = 0x10;
                      }
                      uVar69 = iVar91 - uVar69;
                    }
                    puVar88 = (undefined2 *)
                              ((long)puVar71 +
                              (((ulong)uVar69 + lVar100) - (ulong)((ulong)uVar69 + lVar100 == 2)));
                    uVar77 = (iVar61 + iVar70) - 1;
                    *(undefined1 *)puVar71 = *(undefined1 *)((long)puVar71 + 1);
                    *(undefined1 *)((long)puVar71 + 1) = 0x2e;
                    *puVar88 = 0x2d65;
                    uVar83 = uVar77 >> 0x1f;
                    pcVar60 = (char *)((long)puVar88 + (ulong)uVar83 + 1);
                    uVar69 = -uVar77;
                    if (0 < (int)uVar77) {
                      uVar69 = uVar77;
                    }
                    if (uVar69 < 100) {
                      *(undefined2 *)pcVar60 =
                           *(undefined2 *)(digit_table + (ulong)(uVar69 < 10) + (ulong)uVar69 * 2);
                      puVar75 = (uint *)(pcVar60 + (2 - (ulong)(uVar69 < 10)));
                    }
                    else {
                      *pcVar60 = (char)(uVar69 * 0x290 >> 0x10) + '0';
                      *(undefined2 *)((long)puVar88 + (ulong)uVar83 + 2) =
                           *(undefined2 *)
                            (digit_table + ((uVar69 * 0x290 >> 0x10) * 0x7fffff9c + uVar69) * 2);
                      puVar75 = (uint *)((long)puVar88 + (ulong)uVar83 + 4);
                    }
                  }
                }
              }
            }
LAB_018d8494:
            if (puVar75 != (uint *)0x0) {
              *(byte *)puVar75 = 0x2c;
              puVar75 = (uint *)((long)puVar75 + 1);
              goto LAB_018d84dd;
            }
            goto LAB_018d8f1a;
          }
          if (((uint)uVar95 & 7) == 5) {
            uVar76 = uVar95 >> 8;
            puVar106 = (uint *)(pyVar85->uni).str;
            uVar65 = sVar108;
            puVar104 = puVar87;
            if (puVar87 <= (uint *)((long)puVar75 + uVar76 * 6 + 0x10)) {
              uVar65 = uVar76 * 6 + 0x10;
              uVar105 = sVar108 >> 1;
              if (sVar108 >> 1 <= uVar65) {
                uVar105 = uVar65;
              }
              uVar65 = (uVar105 + 0xf & 0xfffffffffffffff0) + sVar108;
              pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar108,uVar65);
              if (pbVar80 == (byte *)0x0) goto LAB_018d8ec1;
              puVar104 = (uint *)(pbVar80 + (uVar65 - ((long)local_90 - (long)puVar87)));
              memmove(puVar104,pbVar80 + ((long)puVar87 - (long)local_f8),
                      (long)local_90 - (long)puVar87);
              puVar75 = (uint *)(pbVar80 + ((long)puVar75 - (long)local_f8));
              local_90 = (uint *)(pbVar80 + uVar65);
              local_f8 = pbVar80;
            }
            if ((puVar103 != enc_table_cpy) || ((pyVar85->tag & 0x18) == 0)) {
              puVar87 = (uint *)(uVar76 + (long)puVar106);
              *(byte *)puVar75 = 0x22;
LAB_018d6eea:
              lVar100 = (long)puVar87 - (long)puVar106;
              if (0xf < lVar100) {
                lVar79 = 0;
                do {
                  puVar59 = (uint *)((long)puVar75 + lVar79 + 1);
                  puVar107 = (uint *)((long)puVar106 + lVar79);
                  if (puVar103[*(byte *)((long)puVar106 + lVar79)] != '\0') goto LAB_018d727f;
                  if (puVar103[*(byte *)((long)puVar106 + lVar79 + 1)] != '\0') {
                    puVar59 = (uint *)((long)puVar75 + lVar79 + 1);
                    puVar107 = (uint *)((long)puVar106 + lVar79);
                    goto LAB_018d70ad;
                  }
                  if (puVar103[*(byte *)((long)puVar106 + lVar79 + 2)] != '\0') {
                    puVar59 = (uint *)((long)puVar75 + lVar79 + 1);
                    puVar107 = (uint *)((long)puVar106 + lVar79);
                    goto LAB_018d70c9;
                  }
                  if (puVar103[*(byte *)((long)puVar106 + lVar79 + 3)] != '\0') {
                    puVar59 = (uint *)((long)puVar75 + lVar79 + 1);
                    puVar107 = (uint *)((long)puVar106 + lVar79);
                    goto LAB_018d70e9;
                  }
                  if (puVar103[*(byte *)((long)puVar106 + lVar79 + 4)] != '\0') {
                    puVar107 = (uint *)((byte *)((long)puVar106 + lVar79) + 4);
                    puVar59 = (uint *)((long)puVar75 + lVar79 + 5);
                    *(undefined4 *)((long)puVar75 + lVar79 + 1) =
                         *(undefined4 *)((long)puVar106 + lVar79);
                    goto LAB_018d727f;
                  }
                  if (puVar103[*(byte *)((long)puVar106 + lVar79 + 5)] != '\0') {
                    pbVar80 = (byte *)((long)puVar106 + lVar79);
                    puVar107 = (uint *)(pbVar80 + 5);
                    puVar59 = (uint *)((long)puVar75 + lVar79 + 6);
                    *(byte *)((long)puVar59 + -1) = pbVar80[4];
                    *(undefined4 *)((long)puVar59 + -5) = *(undefined4 *)pbVar80;
                    goto LAB_018d727f;
                  }
                  if (puVar103[*(byte *)((long)puVar106 + lVar79 + 6)] != '\0') {
                    pbVar80 = (byte *)((long)puVar106 + lVar79);
                    puVar107 = (uint *)(pbVar80 + 6);
                    puVar59 = (uint *)((long)puVar75 + lVar79 + 7);
                    *(ushort *)((long)puVar59 + -2) = *(ushort *)(pbVar80 + 4);
                    *(undefined4 *)((long)puVar59 + -6) = *(undefined4 *)pbVar80;
                    goto LAB_018d727f;
                  }
                  if (puVar103[*(byte *)((long)puVar106 + lVar79 + 7)] != '\0') {
                    pbVar80 = (byte *)((long)puVar106 + lVar79);
                    puVar107 = (uint *)(pbVar80 + 7);
                    uVar3 = *(undefined4 *)pbVar80;
                    puVar59 = (uint *)((long)puVar75 + lVar79 + 8);
                    *(undefined4 *)((long)puVar75 + lVar79 + 4) = *(undefined4 *)(pbVar80 + 3);
                    *(undefined4 *)((long)puVar75 + lVar79 + 1) = uVar3;
                    goto LAB_018d727f;
                  }
                  if (puVar103[*(byte *)((long)puVar106 + lVar79 + 8)] != '\0') {
                    puVar107 = (uint *)((byte *)((long)puVar106 + lVar79) + 8);
                    puVar59 = (uint *)((long)puVar75 + lVar79 + 9);
                    *(undefined8 *)((long)puVar75 + lVar79 + 1) =
                         *(undefined8 *)((long)puVar106 + lVar79);
                    goto LAB_018d727f;
                  }
                  if (puVar103[*(byte *)((long)puVar106 + lVar79 + 9)] != '\0') {
                    pbVar80 = (byte *)((long)puVar106 + lVar79);
                    puVar107 = (uint *)(pbVar80 + 9);
                    puVar59 = (uint *)((long)puVar75 + lVar79 + 10);
                    *(byte *)((long)puVar59 + -1) = pbVar80[8];
                    *(undefined8 *)((long)puVar59 + -9) = *(undefined8 *)pbVar80;
                    goto LAB_018d727f;
                  }
                  if (puVar103[*(byte *)((long)puVar106 + lVar79 + 10)] != '\0') {
                    pbVar80 = (byte *)((long)puVar106 + lVar79);
                    puVar107 = (uint *)(pbVar80 + 10);
                    puVar59 = (uint *)((long)puVar75 + lVar79 + 0xb);
                    *(ushort *)((long)puVar59 + -2) = *(ushort *)(pbVar80 + 8);
                    *(undefined8 *)((long)puVar59 + -10) = *(undefined8 *)pbVar80;
                    goto LAB_018d727f;
                  }
                  if (puVar103[*(byte *)((long)puVar106 + lVar79 + 0xb)] != '\0') {
                    pbVar80 = (byte *)((long)puVar106 + lVar79);
                    puVar107 = (uint *)(pbVar80 + 0xb);
                    puVar59 = (uint *)((long)puVar75 + lVar79 + 0xc);
                    puVar59[-1] = *(uint *)(pbVar80 + 7);
                    *(undefined8 *)((long)puVar59 + -0xb) = *(undefined8 *)pbVar80;
                    goto LAB_018d727f;
                  }
                  if (puVar103[*(byte *)((long)puVar106 + lVar79 + 0xc)] != '\0') {
                    pbVar80 = (byte *)((long)puVar106 + lVar79);
                    puVar107 = (uint *)(pbVar80 + 0xc);
                    puVar59 = (uint *)((long)puVar75 + lVar79 + 0xd);
                    puVar59[-1] = *(uint *)(pbVar80 + 8);
                    *(undefined8 *)(puVar59 + -3) = *(undefined8 *)pbVar80;
                    goto LAB_018d727f;
                  }
                  if (puVar103[*(byte *)((long)puVar106 + lVar79 + 0xd)] != '\0') {
                    pbVar80 = (byte *)((long)puVar106 + lVar79);
                    puVar107 = (uint *)(pbVar80 + 0xd);
                    uVar72 = *(undefined8 *)pbVar80;
                    puVar59 = (uint *)((long)puVar75 + lVar79 + 0xe);
                    *(undefined8 *)((long)puVar75 + lVar79 + 6) = *(undefined8 *)(pbVar80 + 5);
                    *(undefined8 *)((long)puVar75 + lVar79 + 1) = uVar72;
                    goto LAB_018d727f;
                  }
                  if (puVar103[*(byte *)((long)puVar106 + lVar79 + 0xe)] != '\0') {
                    pbVar80 = (byte *)((long)puVar106 + lVar79);
                    puVar107 = (uint *)(pbVar80 + 0xe);
                    uVar72 = *(undefined8 *)pbVar80;
                    puVar59 = (uint *)((long)puVar75 + lVar79 + 0xf);
                    *(undefined8 *)((long)puVar75 + lVar79 + 7) = *(undefined8 *)(pbVar80 + 6);
                    *(undefined8 *)((long)puVar75 + lVar79 + 1) = uVar72;
                    goto LAB_018d727f;
                  }
                  if (puVar103[*(byte *)((long)puVar106 + lVar79 + 0xf)] != '\0') {
                    pbVar80 = (byte *)((long)puVar106 + lVar79);
                    puVar107 = (uint *)(pbVar80 + 0xf);
                    uVar72 = *(undefined8 *)pbVar80;
                    puVar59 = (uint *)((long)puVar75 + lVar79 + 0x10);
                    *(undefined8 *)((long)puVar75 + lVar79 + 8) = *(undefined8 *)(pbVar80 + 7);
                    *(undefined8 *)((long)puVar75 + lVar79 + 1) = uVar72;
                    goto LAB_018d727f;
                  }
                  uVar72 = *(undefined8 *)(puVar107 + 2);
                  *(undefined8 *)puVar59 = *(undefined8 *)puVar107;
                  *(undefined8 *)((long)puVar75 + lVar79 + 9) = uVar72;
                  lVar79 = lVar79 + 0x10;
                  lVar100 = lVar100 + -0x10;
                } while (0xf < lVar100);
                puVar75 = (uint *)((long)puVar75 + lVar79);
                puVar106 = (uint *)((long)puVar106 + lVar79);
              }
              puVar59 = (uint *)((long)puVar75 + 1);
              puVar107 = puVar106;
              for (lVar100 = (long)puVar87 - (long)puVar106; 3 < lVar100; lVar100 = lVar100 + -4) {
                if (puVar103[(byte)*puVar107] != '\0') goto LAB_018d727f;
                if (puVar103[*(byte *)((long)puVar107 + 1)] != '\0') goto LAB_018d70ad;
                if (puVar103[*(byte *)((long)puVar107 + 2)] != '\0') goto LAB_018d70c9;
                if (puVar103[*(byte *)((long)puVar107 + 3)] != '\0') goto LAB_018d70e9;
                *puVar59 = *puVar107;
                puVar59 = puVar59 + 1;
                puVar107 = puVar107 + 1;
              }
              while( true ) {
                if (puVar87 <= puVar107) goto switchD_018d72a6_default;
                uVar69 = *puVar107;
                if (puVar103[(byte)uVar69] != '\0') break;
                puVar107 = (uint *)((long)puVar107 + 1);
                *(byte *)puVar59 = (byte)uVar69;
                puVar59 = (uint *)((long)puVar59 + 1);
              }
              goto LAB_018d727f;
            }
            *(byte *)puVar75 = 0x22;
            puVar75 = (uint *)((long)puVar75 + 1);
            if (0xfff < uVar95) {
              do {
                uVar72 = *(undefined8 *)(puVar106 + 2);
                *(undefined8 *)puVar75 = *(undefined8 *)puVar106;
                *(undefined8 *)(puVar75 + 2) = uVar72;
                puVar75 = puVar75 + 4;
                puVar106 = puVar106 + 4;
                uVar76 = uVar76 - 0x10;
              } while (0xf < uVar76);
            }
            for (; 3 < uVar76; uVar76 = uVar76 - 4) {
              *puVar75 = *puVar106;
              puVar75 = puVar75 + 1;
              puVar106 = puVar106 + 1;
            }
            if (uVar76 != 0) {
              uVar95 = 0;
              do {
                *(byte *)((long)puVar75 + uVar95) = *(byte *)((long)puVar106 + uVar95);
                uVar95 = uVar95 + 1;
              } while (uVar76 != uVar95);
              puVar75 = (uint *)((long)puVar75 + uVar95);
            }
            *(byte *)puVar75 = 0x22;
            pbVar80 = (byte *)((long)puVar75 + 1);
            goto LAB_018d84c0;
          }
          if ((~(byte)uVar95 & 6) == 0) {
            if (puVar87 <= puVar75 + 4) {
              uVar76 = sVar108 >> 1;
              if (uVar76 < 0x11) {
                uVar76 = 0x10;
              }
              sVar64 = (uVar76 + 0xf & 0xfffffffffffffff0) + sVar108;
              pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar108,sVar64);
              if (pbVar80 == (byte *)0x0) goto LAB_018d8ec1;
              sVar73 = (long)local_90 - (long)puVar87;
              memmove(pbVar80 + (sVar64 - sVar73),pbVar80 + ((long)puVar87 - (long)local_f8),sVar73)
              ;
              puVar75 = (uint *)(pbVar80 + ((long)puVar75 - (long)local_f8));
              local_90 = (uint *)(pbVar80 + sVar64);
              puVar87 = (uint *)(pbVar80 + (sVar64 - sVar73));
              sVar108 = sVar64;
              local_f8 = pbVar80;
            }
            if (0xff < uVar95) {
              bVar110 = bVar102 == 7;
              local_e0 = (ulong)bVar110;
              lVar100 = (uVar95 >> 8) << bVar110;
              puVar106 = puVar87 + -4;
              puVar104 = (uint *)((long)puVar75 + 1);
              *(ulong *)(puVar87 + -4) = uVar78 + lVar93 * 2;
              *(yyjson_mut_val **)(puVar87 + -2) = val;
              *(byte *)puVar75 = bVar110 << 5 | 0x5b;
              local_80 = (yyjson_mut_val *)(pyVar85->uni).u64;
              val = pyVar85;
              lVar93 = lVar100;
              if (bVar102 == 7) {
                local_80 = local_80->next;
              }
              goto LAB_018d6a8c;
            }
            bVar102 = (bVar102 == 7) * ' ';
            *(byte *)puVar75 = bVar102 + 0x5b;
            *(byte *)((long)puVar75 + 1) = bVar102 | 0x5d;
            *(byte *)((long)puVar75 + 2) = 0x2c;
            puVar75 = (uint *)((long)puVar75 + 3);
          }
          else {
            if (bVar102 == 1) {
              uVar95 = uVar95 >> 8;
              pvVar8 = (pyVar85->uni).ptr;
              if (puVar87 <= (uint *)((long)puVar75 + uVar95 + 2)) {
                uVar76 = sVar108 >> 1;
                if (sVar108 >> 1 <= uVar95 + 2) {
                  uVar76 = uVar95 + 2;
                }
                sVar64 = (uVar76 + 0xf & 0xfffffffffffffff0) + sVar108;
                pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar108,sVar64);
                if (pbVar80 == (byte *)0x0) goto LAB_018d8ec1;
                sVar73 = (long)local_90 - (long)puVar87;
                memmove(pbVar80 + (sVar64 - sVar73),pbVar80 + ((long)puVar87 - (long)local_f8),
                        sVar73);
                puVar75 = (uint *)(pbVar80 + ((long)puVar75 - (long)local_f8));
                local_90 = (uint *)(pbVar80 + sVar64);
                puVar87 = (uint *)(pbVar80 + (sVar64 - sVar73));
                sVar108 = sVar64;
                local_f8 = pbVar80;
              }
              switchD_012dd528::default(puVar75,pvVar8,uVar95);
              pbVar80 = (byte *)((long)puVar75 + uVar95);
              puVar75 = (uint *)(pbVar80 + 1);
              *pbVar80 = 0x2c;
              goto LAB_018d84dd;
            }
            if (bVar102 == 2) {
              uVar95 = sVar108;
              puVar106 = puVar87;
              if (puVar87 <= puVar75 + 4) {
                uVar95 = sVar108 >> 1;
                if (uVar95 < 0x11) {
                  uVar95 = 0x10;
                }
                uVar95 = (uVar95 + 0xf & 0xfffffffffffffff0) + sVar108;
                pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar108,uVar95);
                if (pbVar80 == (byte *)0x0) goto LAB_018d8ec1;
                puVar106 = (uint *)(pbVar80 + (uVar95 - ((long)local_90 - (long)puVar87)));
                memmove(puVar106,pbVar80 + ((long)puVar87 - (long)local_f8),
                        (long)local_90 - (long)puVar87);
                puVar75 = (uint *)(pbVar80 + ((long)puVar75 - (long)local_f8));
                local_90 = (uint *)(pbVar80 + uVar95);
                local_f8 = pbVar80;
              }
              puVar75[0] = 0x6c6c756e;
              puVar75[1] = 0xa2c;
              puVar75 = (uint *)((long)puVar75 + 5);
              sVar108 = uVar95;
              puVar87 = puVar106;
            }
            else {
              if (bVar102 != 3) goto LAB_018d8e16;
              uVar95 = sVar108;
              puVar106 = puVar87;
              if (puVar87 <= puVar75 + 4) {
                uVar95 = sVar108 >> 1;
                if (uVar95 < 0x11) {
                  uVar95 = 0x10;
                }
                uVar95 = (uVar95 + 0xf & 0xfffffffffffffff0) + sVar108;
                pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar108,uVar95);
                if (pbVar80 == (byte *)0x0) goto LAB_018d8ec1;
                puVar106 = (uint *)(pbVar80 + (uVar95 - ((long)local_90 - (long)puVar87)));
                memmove(puVar106,pbVar80 + ((long)puVar87 - (long)local_f8),
                        (long)local_90 - (long)puVar87);
                puVar75 = (uint *)(pbVar80 + ((long)puVar75 - (long)local_f8));
                local_90 = (uint *)(pbVar80 + uVar95);
                local_f8 = pbVar80;
              }
              bVar110 = (pyVar85->tag & 0x18) != 0;
              uVar72 = 0xa2c65736c6166;
              if (bVar110) {
                uVar72 = 0xa2c65757274;
              }
              *(undefined8 *)puVar75 = uVar72;
              puVar75 = (uint *)((long)puVar75 + (6 - (ulong)bVar110));
              sVar108 = uVar95;
              puVar87 = puVar106;
            }
          }
          goto LAB_018d84dd;
        }
        local_f8 = (byte *)0x0;
LAB_018d8ec1:
        if (dat_len != (usize *)0x0) {
          *dat_len = 0;
        }
        pyVar66 = &local_48;
        if (err != (yyjson_write_err *)0x0) {
          pyVar66 = err;
        }
        pyVar67->code = 2;
        pyVar66->msg = "memory allocation failed";
      }
      else {
        puVar103 = enc_table_cpy;
        if ((flg & 2) == 0) {
          puVar99 = enc_table_cpy_slash;
        }
        else {
          puVar103 = enc_table_esc;
          puVar99 = enc_table_esc_slash;
        }
        if ((flg & 4) == 0) {
          puVar99 = puVar103;
        }
        uVar78 = estimated_val_num * 0x20 + 0x40;
        local_f8 = (byte *)(*p_Var4)(pvVar6,uVar78);
        if (local_f8 != (byte *)0x0) {
          uVar69 = (uint)val->tag & 7;
          bVar110 = uVar69 == 7;
          local_90 = (uint *)(ulong)bVar110;
          lVar93 = (val->tag >> 8) << bVar110;
          *local_f8 = bVar110 << 5 | 0x5b;
          local_f8[1] = 10;
          uVar58 = (val->uni).u64;
          if (uVar69 == 7) {
            uVar58 = *(uint64_t *)(uVar58 + 0x10);
          }
          lVar100 = (ulong)((flg & 0x40) == 0) * 2 + 2;
          puVar89 = (ulong *)(local_f8 + (estimated_val_num * 8 + 0x10) * 4);
          puVar106 = (uint *)(local_f8 + 2);
          pyVar85 = *(yyjson_mut_val **)(uVar58 + 0x10);
          lVar79 = 1;
          local_88 = puVar89;
          local_80 = val;
LAB_018d424a:
          do {
            uVar65 = (ulong)local_90 & 0xff;
            uVar95 = lVar79 * 4 + 0x20;
            uVar76 = lVar79 * 4 + 0x10;
            pyVar86 = pyVar85;
            sVar108 = uVar78;
            puVar90 = puVar89;
LAB_018d4276:
            uVar105 = pyVar86->tag;
            bVar102 = (byte)uVar105 & 7;
            uVar69 = (uint)lVar93;
            local_c0 = (uint)uVar65;
            sVar64 = sVar108;
            puVar89 = puVar90;
            if (bVar102 == 4) {
              uVar78 = uVar95;
              if ((uVar69 & local_c0) != 0) {
                uVar78 = 0x20;
              }
              if (puVar90 <= (ulong *)((long)puVar106 + uVar78)) {
                uVar105 = sVar108 >> 1;
                if (sVar108 >> 1 <= uVar78) {
                  uVar105 = uVar78;
                }
                sVar64 = (uVar105 + 0xf & 0xfffffffffffffff0) + sVar108;
                pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar108,sVar64);
                if (pbVar80 == (byte *)0x0) goto LAB_018d8e77;
                puVar89 = (ulong *)(pbVar80 + (sVar64 - ((long)local_88 - (long)puVar90)));
                memmove(puVar89,pbVar80 + ((long)puVar90 - (long)local_f8),
                        (long)local_88 - (long)puVar90);
                puVar106 = (uint *)(pbVar80 + ((long)puVar106 - (long)local_f8));
                local_88 = (ulong *)(pbVar80 + sVar64);
                local_f8 = pbVar80;
              }
              lVar63 = lVar79;
              puVar104 = puVar106;
              if (lVar79 != 0 && (uVar69 & local_c0) == 0) {
                do {
                  puVar106 = (uint *)((long)puVar104 + lVar100);
                  *puVar104 = 0x20202020;
                  lVar63 = lVar63 + -1;
                  puVar104 = puVar106;
                } while (lVar63 != 0);
              }
              pcVar60 = (char *)(pyVar86->uni).u64;
              uVar69 = (uint)((ulong)pcVar60 >> 0x20);
              if ((pyVar86->tag & 0x10) == 0) {
                uVar69 = uVar69 >> 0x1f & (uint)(pyVar86->tag >> 3);
                *(byte *)puVar106 = 0x2d;
                pcVar62 = (char *)-(long)pcVar60;
                if (uVar69 == 0) {
                  pcVar62 = pcVar60;
                }
                pbVar80 = (byte *)((ulong)uVar69 + (long)puVar106);
                if (pcVar62 < (char *)0x5f5e100) {
                  if (pcVar62 < (char *)0x64) {
                    *(undefined2 *)pbVar80 =
                         *(undefined2 *)
                          (digit_table + (ulong)(pcVar62 < (char *)0xa) + (long)pcVar62 * 2);
                    puVar106 = (uint *)(pbVar80 + (2 - (ulong)(pcVar62 < (char *)0xa)));
                  }
                  else {
                    iVar70 = (int)pcVar62;
                    if (pcVar62 < (char *)0x2710) {
                      uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                      uVar78 = (ulong)(pcVar62 < (char *)0x3e8);
                      *(undefined2 *)pbVar80 =
                           *(undefined2 *)(digit_table + uVar78 + (ulong)uVar69 * 2);
                      *(undefined2 *)(pbVar80 + (2 - uVar78)) =
                           *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                      puVar106 = (uint *)(pbVar80 + (4 - uVar78));
                    }
                    else if (pcVar62 < (char *)0xf4240) {
                      iVar70 = (int)((ulong)((long)pcVar62 * 0x68db9) >> 0x20) * -10000 + iVar70;
                      uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                      uVar78 = (ulong)(pcVar62 < (char *)0x186a0);
                      *(undefined2 *)pbVar80 =
                           *(undefined2 *)
                            (digit_table + uVar78 + ((ulong)((long)pcVar62 * 0x68db9) >> 0x20) * 2);
                      *(undefined2 *)(pbVar80 + (2 - uVar78)) =
                           *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                      *(undefined2 *)(pbVar80 + (4 - uVar78)) =
                           *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                      puVar106 = (uint *)(pbVar80 + (6 - uVar78));
                    }
                    else {
                      uVar69 = (uint)((ulong)((long)pcVar62 * 0x68db8bb) >> 0x20);
                      uVar77 = uVar69 >> 8;
                      iVar70 = uVar77 * -10000 + iVar70;
                      uVar77 = uVar77 * 0x147b >> 0x13;
                      uVar83 = (uint)(iVar70 * 0x147b) >> 0x13;
                      uVar78 = (ulong)(pcVar62 < "edRowGroupE");
                      *(undefined2 *)pbVar80 =
                           *(undefined2 *)(digit_table + uVar78 + (ulong)uVar77 * 2);
                      *(undefined2 *)(pbVar80 + (2 - uVar78)) =
                           *(undefined2 *)(digit_table + (uVar77 * -100 + (uVar69 >> 8)) * 2);
                      *(undefined2 *)(pbVar80 + (4 - uVar78)) =
                           *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                      *(undefined2 *)(pbVar80 + (6 - uVar78)) =
                           *(undefined2 *)(digit_table + (uVar83 * -100 + iVar70) * 2);
                      puVar106 = (uint *)(pbVar80 + (8 - uVar78));
                    }
                  }
                }
                else {
                  uVar78 = (ulong)pcVar62 / 100000000;
                  pcVar60 = pcVar62 + uVar78 * 0xfa0a1f00;
                  iVar70 = (int)uVar78;
                  if (pcVar62 < (char *)0x2386f26fc10000) {
                    if (pcVar62 < (char *)0x2540be400) {
                      *(undefined2 *)pbVar80 =
                           *(undefined2 *)
                            (digit_table + (ulong)(pcVar62 < (char *)0x3b9aca00) + uVar78 * 2);
                      pbVar80 = pbVar80 + (2 - (ulong)(pcVar62 < (char *)0x3b9aca00));
                    }
                    else if (pcVar62 < (char *)0xe8d4a51000) {
                      uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                      uVar78 = (ulong)(pcVar62 < (char *)0x174876e800);
                      *(undefined2 *)pbVar80 =
                           *(undefined2 *)(digit_table + uVar78 + (ulong)uVar69 * 2);
                      *(undefined2 *)(pbVar80 + (2 - uVar78)) =
                           *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                      pbVar80 = pbVar80 + (4 - uVar78);
                    }
                    else if (pcVar62 < (char *)0x5af3107a4000) {
                      iVar70 = (int)(uVar78 * 0x68db9 >> 0x20) * -10000 + iVar70;
                      uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                      uVar105 = (ulong)(pcVar62 < (char *)0x9184e72a000);
                      *(undefined2 *)pbVar80 =
                           *(undefined2 *)(digit_table + uVar105 + (uVar78 * 0x68db9 >> 0x20) * 2);
                      *(undefined2 *)(pbVar80 + (2 - uVar105)) =
                           *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                      *(undefined2 *)(pbVar80 + (4 - uVar105)) =
                           *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                      pbVar80 = pbVar80 + (6 - uVar105);
                    }
                    else {
                      uVar69 = (uint)(uVar78 * 0x68db8bb >> 0x20);
                      uVar77 = uVar69 >> 8;
                      iVar70 = uVar77 * -10000 + iVar70;
                      uVar77 = uVar77 * 0x147b >> 0x13;
                      uVar83 = (uint)(iVar70 * 0x147b) >> 0x13;
                      uVar78 = (ulong)(pcVar62 < (char *)0x38d7ea4c68000);
                      *(undefined2 *)pbVar80 =
                           *(undefined2 *)(digit_table + uVar78 + (ulong)uVar77 * 2);
                      *(undefined2 *)(pbVar80 + (2 - uVar78)) =
                           *(undefined2 *)(digit_table + (uVar77 * -100 + (uVar69 >> 8)) * 2);
                      *(undefined2 *)(pbVar80 + (4 - uVar78)) =
                           *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                      *(undefined2 *)(pbVar80 + (6 - uVar78)) =
                           *(undefined2 *)(digit_table + (uVar83 * -100 + iVar70) * 2);
                      pbVar80 = pbVar80 + (8 - uVar78);
                    }
                    uVar69 = (uint)(((ulong)pcVar60 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar77 = uVar69 >> 8;
                    iVar70 = uVar77 * -10000 + (int)pcVar60;
                    uVar77 = uVar77 * 0x147b >> 0x13;
                    uVar83 = (uint)(iVar70 * 0x147b) >> 0x13;
                    *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + (ulong)uVar77 * 2);
                    *(undefined2 *)(pbVar80 + 2) =
                         *(undefined2 *)(digit_table + (uVar77 * -100 + (uVar69 >> 8)) * 2);
                    *(undefined2 *)(pbVar80 + 4) = *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                    *(undefined2 *)(pbVar80 + 6) =
                         *(undefined2 *)(digit_table + (uVar83 * 0x7fffff9c + iVar70) * 2);
                    puVar106 = (uint *)(pbVar80 + 8);
                  }
                  else {
                    uVar78 = (ulong)pcVar62 / 1000000000000;
                    iVar61 = (int)uVar78;
                    if (pcVar62 < (char *)0xde0b6b3a7640000) {
                      iVar91 = (int)(uVar78 * 0x68db9 >> 0x20) * -10000 + iVar61;
                      uVar69 = (uint)(iVar91 * 0x147b) >> 0x13;
                      uVar105 = (ulong)(pcVar62 < (char *)0x16345785d8a0000);
                      *(undefined2 *)pbVar80 =
                           *(undefined2 *)(digit_table + uVar105 + (uVar78 * 0x68db9 >> 0x20) * 2);
                      *(undefined2 *)(pbVar80 + (2 - uVar105)) =
                           *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                      *(undefined2 *)(pbVar80 + (4 - uVar105)) =
                           *(undefined2 *)(digit_table + (uVar69 * -100 + iVar91) * 2);
                      lVar63 = 6 - uVar105;
                    }
                    else {
                      uVar69 = (uint)(uVar78 / 10000);
                      iVar91 = uVar69 * -10000 + iVar61;
                      uVar69 = uVar69 / 100;
                      uVar77 = (uint)(iVar91 * 0x147b) >> 0x13;
                      uVar105 = (ulong)(pcVar62 < (char *)0x8ac7230489e80000);
                      *(undefined2 *)pbVar80 =
                           *(undefined2 *)(digit_table + uVar105 + (ulong)uVar69 * 2);
                      *(undefined2 *)(pbVar80 + (2 - uVar105)) =
                           *(undefined2 *)
                            (digit_table + (uVar69 * -100 + (int)(uVar78 / 10000)) * 2);
                      *(undefined2 *)(pbVar80 + (4 - uVar105)) =
                           *(undefined2 *)(digit_table + (ulong)uVar77 * 2);
                      *(undefined2 *)(pbVar80 + (6 - uVar105)) =
                           *(undefined2 *)(digit_table + (uVar77 * -100 + iVar91) * 2);
                      lVar63 = 8 - uVar105;
                    }
                    pbVar80 = pbVar80 + lVar63;
                    iVar70 = iVar70 + iVar61 * -10000;
                    uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                    *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                    *(undefined2 *)(pbVar80 + 2) =
                         *(undefined2 *)(digit_table + (uVar69 * 0x7fffff9c + iVar70) * 2);
                    uVar69 = (uint)(((ulong)pcVar60 & 0xffffffff) * 0x68db8bb >> 0x20);
                    uVar77 = uVar69 >> 8;
                    iVar70 = uVar77 * -10000 + (int)pcVar60;
                    uVar77 = uVar77 * 0x147b >> 0x13;
                    uVar83 = (uint)(iVar70 * 0x147b) >> 0x13;
                    *(undefined2 *)(pbVar80 + 4) = *(undefined2 *)(digit_table + (ulong)uVar77 * 2);
                    *(undefined2 *)(pbVar80 + 6) =
                         *(undefined2 *)(digit_table + (uVar77 * -100 + (uVar69 >> 8)) * 2);
                    *(undefined2 *)(pbVar80 + 8) = *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                    *(undefined2 *)(pbVar80 + 10) =
                         *(undefined2 *)(digit_table + (uVar83 * 0x7fffff9c + iVar70) * 2);
                    puVar106 = (uint *)(pbVar80 + 0xc);
                  }
                }
              }
              else {
                uVar78 = (ulong)pcVar60 & 0xfffffffffffff;
                uVar69 = uVar69 >> 0x14 & 0x7ff;
                if (uVar69 == 0x7ff) {
                  if ((flg & 0x10) == 0) {
                    if ((flg & 8) == 0) {
                      puVar106 = (uint *)0x0;
                    }
                    else if (uVar78 == 0) {
                      *(byte *)puVar106 = 0x2d;
                      puVar71 = (undefined8 *)((long)puVar106 - ((long)pcVar60 >> 0x3f));
                      puVar106 = (uint *)(puVar71 + 1);
                      *puVar71 = 0x7974696e69666e49;
                    }
                    else {
                      *puVar106 = 0x4e614e;
                      puVar106 = (uint *)((long)puVar106 + 3);
                    }
                  }
                  else {
                    *puVar106 = 0x6c6c756e;
                    puVar106 = puVar106 + 1;
                  }
                }
                else {
                  *(byte *)puVar106 = 0x2d;
                  lVar63 = -((long)pcVar60 >> 0x3f);
                  puVar71 = (undefined8 *)((long)puVar106 + lVar63);
                  if (((ulong)pcVar60 & 0x7fffffffffffffff) == 0) {
                    *(undefined4 *)puVar71 = 0x302e30;
                    puVar106 = (uint *)((long)puVar71 + 3);
                  }
                  else if (uVar69 == 0) {
                    yyjson_mut_write_opts_impl();
                    puVar106 = local_70;
                  }
                  else {
                    uVar105 = uVar78 + 0x10000000000000;
                    if (uVar69 - 0x3ff < 0x35) {
                      lVar57 = 0;
                      if (uVar105 != 0) {
                        for (; (uVar105 >> lVar57 & 1) == 0; lVar57 = lVar57 + 1) {
                        }
                      }
                      if (0x433 - uVar69 <= (uint)lVar57) {
                        pcVar60 = (char *)(uVar105 >> ((byte)(0x433 - uVar69) & 0x3f));
                        if (pcVar60 < (char *)0x5f5e100) {
                          if (pcVar60 < (char *)0x64) {
                            *(undefined2 *)puVar71 =
                                 *(undefined2 *)
                                  (digit_table + (ulong)(pcVar60 < (char *)0xa) + (long)pcVar60 * 2)
                            ;
                            puVar88 = (undefined2 *)
                                      ((long)puVar71 + (2 - (ulong)(pcVar60 < (char *)0xa)));
                          }
                          else {
                            iVar70 = (int)pcVar60;
                            if (pcVar60 < (char *)0x2710) {
                              uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                              uVar78 = (ulong)(pcVar60 < (char *)0x3e8);
                              *(undefined2 *)puVar71 =
                                   *(undefined2 *)(digit_table + uVar78 + (ulong)uVar69 * 2);
                              *(undefined2 *)((long)puVar71 + (2 - uVar78)) =
                                   *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                              puVar88 = (undefined2 *)((long)puVar71 + (4 - uVar78));
                            }
                            else if (pcVar60 < (char *)0xf4240) {
                              iVar70 = (int)((ulong)((long)pcVar60 * 0x68db9) >> 0x20) * -10000 +
                                       iVar70;
                              uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                              uVar78 = (ulong)(pcVar60 < (char *)0x186a0);
                              *(undefined2 *)puVar71 =
                                   *(undefined2 *)
                                    (digit_table +
                                    uVar78 + ((ulong)((long)pcVar60 * 0x68db9) >> 0x20) * 2);
                              *(undefined2 *)((long)puVar71 + (2 - uVar78)) =
                                   *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                              *(undefined2 *)((long)puVar71 + (4 - uVar78)) =
                                   *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                              puVar88 = (undefined2 *)((long)puVar71 + (6 - uVar78));
                            }
                            else {
                              uVar69 = (uint)((ulong)((long)pcVar60 * 0x68db8bb) >> 0x20);
                              uVar77 = uVar69 >> 8;
                              iVar70 = uVar77 * -10000 + iVar70;
                              uVar83 = uVar77 * 0x147b >> 0x13;
                              uVar77 = (uint)(iVar70 * 0x147b) >> 0x13;
                              uVar78 = (ulong)(pcVar60 < "edRowGroupE");
                              *(undefined2 *)puVar71 =
                                   *(undefined2 *)(digit_table + uVar78 + (ulong)uVar83 * 2);
                              *(undefined2 *)((long)puVar71 + (2 - uVar78)) =
                                   *(undefined2 *)
                                    (digit_table + (uVar83 * -100 + (uVar69 >> 8)) * 2);
                              *(undefined2 *)((long)puVar71 + (4 - uVar78)) =
                                   *(undefined2 *)(digit_table + (ulong)uVar77 * 2);
                              *(undefined2 *)((long)puVar71 + (6 - uVar78)) =
                                   *(undefined2 *)(digit_table + (uVar77 * -100 + iVar70) * 2);
                              puVar88 = (undefined2 *)((long)puVar71 + (8 - uVar78));
                            }
                          }
                        }
                        else {
                          auVar15._8_8_ = 0;
                          auVar15._0_8_ = pcVar60;
                          uVar78 = SUB168(auVar15 * ZEXT816(0xabcc77118461d),8) >> 0xe;
                          if (pcVar60 < (char *)0x2540be400) {
                            *(undefined2 *)puVar71 =
                                 *(undefined2 *)
                                  (digit_table + (ulong)(pcVar60 < (char *)0x3b9aca00) + uVar78 * 2)
                            ;
                            puVar88 = (undefined2 *)
                                      ((long)puVar71 + (2 - (ulong)(pcVar60 < (char *)0x3b9aca00)));
                          }
                          else {
                            iVar70 = (int)uVar78;
                            if (pcVar60 < (char *)0xe8d4a51000) {
                              uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                              uVar105 = (ulong)(pcVar60 < (char *)0x174876e800);
                              *(undefined2 *)puVar71 =
                                   *(undefined2 *)(digit_table + uVar105 + (ulong)uVar69 * 2);
                              *(undefined2 *)((long)puVar71 + (2 - uVar105)) =
                                   *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                              puVar88 = (undefined2 *)((long)puVar71 + (4 - uVar105));
                            }
                            else if (pcVar60 < (char *)0x5af3107a4000) {
                              iVar70 = (int)(uVar78 * 0x68db9 >> 0x20) * -10000 + iVar70;
                              uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                              uVar105 = (ulong)(pcVar60 < (char *)0x9184e72a000);
                              *(undefined2 *)puVar71 =
                                   *(undefined2 *)
                                    (digit_table + uVar105 + (uVar78 * 0x68db9 >> 0x20) * 2);
                              *(undefined2 *)((long)puVar71 + (2 - uVar105)) =
                                   *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                              *(undefined2 *)((long)puVar71 + (4 - uVar105)) =
                                   *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                              puVar88 = (undefined2 *)((long)puVar71 + (6 - uVar105));
                            }
                            else {
                              uVar69 = (uint)(uVar78 * 0x68db8bb >> 0x20);
                              uVar77 = uVar69 >> 8;
                              iVar70 = uVar77 * -10000 + iVar70;
                              uVar77 = uVar77 * 0x147b >> 0x13;
                              uVar83 = (uint)(iVar70 * 0x147b) >> 0x13;
                              uVar105 = (ulong)(pcVar60 < (char *)0x38d7ea4c68000);
                              *(undefined2 *)puVar71 =
                                   *(undefined2 *)(digit_table + uVar105 + (ulong)uVar77 * 2);
                              *(undefined2 *)((long)puVar71 + (2 - uVar105)) =
                                   *(undefined2 *)
                                    (digit_table + (uVar77 * -100 + (uVar69 >> 8)) * 2);
                              *(undefined2 *)((long)puVar71 + (4 - uVar105)) =
                                   *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                              *(undefined2 *)((long)puVar71 + (6 - uVar105)) =
                                   *(undefined2 *)(digit_table + (uVar83 * -100 + iVar70) * 2);
                              puVar88 = (undefined2 *)((long)puVar71 + (8 - uVar105));
                            }
                          }
                          uVar69 = (uint)(((ulong)(pcVar60 + uVar78 * 0xfa0a1f00) & 0xffffffff) *
                                          0x68db8bb >> 0x20);
                          uVar77 = uVar69 >> 8;
                          iVar70 = uVar77 * -10000 + (int)(pcVar60 + uVar78 * 0xfa0a1f00);
                          uVar77 = uVar77 * 0x147b >> 0x13;
                          uVar83 = (uint)(iVar70 * 0x147b) >> 0x13;
                          *puVar88 = *(undefined2 *)(digit_table + (ulong)uVar77 * 2);
                          puVar88[1] = *(undefined2 *)
                                        (digit_table + (uVar77 * -100 + (uVar69 >> 8)) * 2);
                          puVar88[2] = *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                          puVar88[3] = *(undefined2 *)
                                        (digit_table + (uVar83 * 0x7fffff9c + iVar70) * 2);
                          puVar88 = puVar88 + 4;
                        }
                        *puVar88 = 0x302e;
                        puVar106 = (uint *)(puVar88 + 1);
                        goto LAB_018d627c;
                      }
                    }
                    uVar74 = (ulong)((uint)pcVar60 & 1);
                    iVar70 = uVar69 * 0x4d105 + -0x200a5;
                    if (uVar69 == 1 || uVar78 != 0) {
                      iVar70 = uVar69 * 0x4d105;
                    }
                    iVar70 = iVar70 + -0x1439b7ff >> 0x14;
                    uVar81 = *(ulong *)(pow10_sig_table + (ulong)(iVar70 * -2 + 0x2ae) * 8);
                    uVar98 = *(long *)(pow10_sig_table + (ulong)(iVar70 * -2 + 0x2af) * 8) +
                             (ulong)(iVar70 - 1U < 0xffffffc8);
                    bVar102 = ((char)((uint)(iVar70 * -0x3526b) >> 0x10) + (char)uVar69) - 0x32;
                    uVar78 = (ulong)(uVar69 != 1 && uVar78 == 0) + uVar105 * 4 + -2 <<
                             (bVar102 & 0x3f);
                    auVar9._8_8_ = 0;
                    auVar9._0_8_ = uVar98;
                    auVar30._8_8_ = 0;
                    auVar30._0_8_ = uVar78;
                    auVar48._8_8_ = 0;
                    auVar48._0_8_ = SUB168(auVar9 * auVar30,8);
                    auVar10._8_8_ = 0;
                    auVar10._0_8_ = uVar81;
                    auVar31._8_8_ = 0;
                    auVar31._0_8_ = uVar78;
                    auVar48 = auVar10 * auVar31 + auVar48;
                    uVar78 = uVar105 * 4 << (bVar102 & 0x3f);
                    auVar11._8_8_ = 0;
                    auVar11._0_8_ = uVar98;
                    auVar32._8_8_ = 0;
                    auVar32._0_8_ = uVar78;
                    auVar49._8_8_ = 0;
                    auVar49._0_8_ = SUB168(auVar11 * auVar32,8);
                    auVar12._8_8_ = 0;
                    auVar12._0_8_ = uVar81;
                    auVar33._8_8_ = 0;
                    auVar33._0_8_ = uVar78;
                    auVar49 = auVar12 * auVar33 + auVar49;
                    uVar94 = auVar49._8_8_;
                    uVar78 = uVar105 * 4 + 2 << (bVar102 & 0x3f);
                    auVar13._8_8_ = 0;
                    auVar13._0_8_ = uVar98;
                    auVar34._8_8_ = 0;
                    auVar34._0_8_ = uVar78;
                    auVar50._8_8_ = 0;
                    auVar50._0_8_ = SUB168(auVar13 * auVar34,8);
                    auVar14._8_8_ = 0;
                    auVar14._0_8_ = uVar81;
                    auVar35._8_8_ = 0;
                    auVar35._0_8_ = uVar78;
                    auVar50 = auVar14 * auVar35 + auVar50;
                    uVar78 = ((ulong)((auVar48 & (undefined1  [16])0xfffffffffffffffe) !=
                                     (undefined1  [16])0x0) | auVar48._8_8_) + uVar74;
                    uVar74 = ((ulong)((auVar50 & (undefined1  [16])0xfffffffffffffffe) !=
                                     (undefined1  [16])0x0) | auVar50._8_8_) - uVar74;
                    if (uVar94 < 0x28) {
LAB_018d470d:
                      uVar81 = (auVar49 & (undefined1  [16])0xfffffffffffffffe) !=
                               (undefined1  [16])0x0 | uVar94;
                      uVar105 = uVar94 & 0xfffffffffffffffc;
                      bVar110 = true;
                      if (uVar81 <= uVar105 + 2) {
                        bVar110 = (bool)((byte)((uVar94 & 0xffffffff) >> 2) & 0x3f &
                                        uVar81 == uVar105 + 2);
                      }
                      bVar109 = uVar105 + 4 <= uVar74;
                      if (uVar105 < uVar78 == bVar109) {
                        bVar110 = bVar109;
                      }
                      uVar78 = (ulong)bVar110 + (uVar94 >> 2);
                    }
                    else {
                      uVar81 = uVar94 / 0x28;
                      uVar105 = uVar81 * 0x28 + 0x28;
                      if (uVar81 * 0x28 < uVar78 != uVar105 <= uVar74) goto LAB_018d470d;
                      uVar78 = (uVar81 + 1) - (ulong)(uVar74 < uVar105);
                      iVar70 = iVar70 + 1;
                    }
                    iVar61 = (0x11 - (uint)(uVar78 < 10000000000000000)) -
                             (uint)(uVar78 < 1000000000000000);
                    local_38 = lVar63;
                    if (iVar61 + iVar70 + 5U < 0x1b) {
                      uVar69 = iVar61 + iVar70;
                      if ((int)uVar69 < 1) {
                        uVar105 = uVar78 / 100000000;
                        uVar77 = (uint)uVar105;
                        puVar88 = (undefined2 *)
                                  ((long)puVar71 +
                                  (((ulong)(2 - uVar69) + 1) - (ulong)(uVar77 < 100000000)));
                        iVar91 = (int)((uVar105 & 0xffffffff) / 10000);
                        iVar61 = iVar91 * -10000 + uVar77;
                        uVar78 = uVar105 * 0xfa0a1f00 + uVar78;
                        iVar70 = (int)(((uVar105 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                        uVar96 = (uint)(iVar70 * 0x29) >> 0xc;
                        uVar92 = uVar96 * -100 + iVar70;
                        uVar83 = iVar70 * -100 + iVar91;
                        *(char *)((long)puVar71 + (ulong)(2 - uVar69)) = (char)uVar96 + '0';
                        uVar105 = (ulong)(uVar92 < 10 && uVar77 < 100000000);
                        *puVar88 = *(undefined2 *)(digit_table + uVar105 + uVar92 * 2);
                        *(undefined2 *)((long)puVar88 + (2 - uVar105)) =
                             *(undefined2 *)(digit_table + uVar83 * 2);
                        iVar70 = (int)uVar78;
                        if (iVar70 == 0) {
                          if (iVar61 == 0) {
                            uVar78 = (ulong)(byte)dec_trailing_zero_table[uVar92];
                            if (uVar83 != 0) {
                              uVar78 = 0;
                            }
                            uVar78 = uVar78 + (byte)dec_trailing_zero_table[uVar83];
                            lVar63 = 4;
                          }
                          else {
                            uVar77 = (uint)(iVar61 * 0x147b) >> 0x13;
                            uVar83 = uVar77 * -100 + iVar61;
                            *(undefined2 *)((long)puVar88 + (4 - uVar105)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar77 * 2);
                            *(undefined2 *)((long)puVar88 + (6 - uVar105)) =
                                 *(undefined2 *)(digit_table + uVar83 * 2);
                            uVar78 = (ulong)(byte)dec_trailing_zero_table[uVar77] + 2;
                            if (uVar83 != 0) {
                              uVar78 = (ulong)(byte)dec_trailing_zero_table[uVar83];
                            }
                            lVar63 = 8;
                          }
                          uVar78 = lVar63 - uVar78;
                        }
                        else {
                          uVar92 = (uint)(iVar61 * 0x147b) >> 0x13;
                          uVar77 = (uint)((uVar78 & 0xffffffff) * 0x68db8bb >> 0x20);
                          uVar96 = uVar77 >> 8;
                          uVar83 = uVar96 * 0x147b >> 0x13;
                          uVar78 = (ulong)uVar83;
                          uVar77 = uVar83 * -100 + (uVar77 >> 8);
                          *(undefined2 *)((long)puVar88 + (4 - uVar105)) =
                               *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                          *(undefined2 *)((long)puVar88 + (6 - uVar105)) =
                               *(undefined2 *)(digit_table + (uVar92 * 0x7fffff9c + iVar61) * 2);
                          *(undefined2 *)((long)puVar88 + (8 - uVar105)) =
                               *(undefined2 *)(digit_table + uVar78 * 2);
                          *(undefined2 *)((long)puVar88 + (10 - uVar105)) =
                               *(undefined2 *)(digit_table + uVar77 * 2);
                          iVar70 = uVar96 * -10000 + iVar70;
                          if (iVar70 == 0) {
                            lVar63 = 0xc;
                          }
                          else {
                            uVar77 = (uint)(iVar70 * 0x147b) >> 0x13;
                            uVar78 = (ulong)uVar77;
                            uVar77 = uVar77 * -100 + iVar70;
                            *(undefined2 *)((long)puVar88 + (0xc - uVar105)) =
                                 *(undefined2 *)(digit_table + uVar78 * 2);
                            *(undefined2 *)((long)puVar88 + (0xe - uVar105)) =
                                 *(undefined2 *)(digit_table + uVar77 * 2);
                            lVar63 = 0x10;
                          }
                          uVar78 = (ulong)(byte)dec_trailing_zero_table[uVar78] + 2;
                          if (uVar77 != 0) {
                            uVar78 = (ulong)(byte)dec_trailing_zero_table[uVar77];
                          }
                          uVar78 = lVar63 - uVar78;
                        }
                        puVar106 = (uint *)((long)puVar88 + ((uVar78 & 0xffffffff) - uVar105));
                        *(undefined2 *)puVar71 = 0x2e30;
                        if ((int)uVar69 < 0) {
                          uVar77 = -uVar69;
                          if ((int)-uVar69 < 2) {
                            uVar77 = 1;
                          }
                          switchD_01306cb1::default
                                    ((undefined2 *)((long)puVar71 + 2),0x30,(ulong)uVar77);
                        }
                      }
                      else {
                        uVar105 = uVar78 / 100000000;
                        uVar77 = (uint)uVar105;
                        puVar88 = (undefined2 *)((long)puVar71 + (2 - (ulong)(uVar77 < 100000000)));
                        iVar91 = (int)((uVar105 & 0xffffffff) / 10000);
                        iVar61 = iVar91 * -10000 + uVar77;
                        uVar78 = uVar105 * 0xfa0a1f00 + uVar78;
                        iVar70 = (int)(((uVar105 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                        uVar96 = (uint)(iVar70 * 0x29) >> 0xc;
                        uVar92 = uVar96 * -100 + iVar70;
                        uVar83 = iVar70 * -100 + iVar91;
                        *puVar71 = 0x3030303030303030;
                        puVar71[1] = 0x3030303030303030;
                        puVar71[2] = 0x3030303030303030;
                        *(char *)((long)puVar71 + 1) = (char)uVar96 + '0';
                        uVar105 = (ulong)(uVar92 < 10 && uVar77 < 100000000);
                        *puVar88 = *(undefined2 *)(digit_table + uVar105 + uVar92 * 2);
                        *(undefined2 *)((long)puVar88 + (2 - uVar105)) =
                             *(undefined2 *)(digit_table + uVar83 * 2);
                        iVar70 = (int)uVar78;
                        if (iVar70 == 0) {
                          if (iVar61 == 0) {
                            uVar78 = (ulong)(byte)dec_trailing_zero_table[uVar92];
                            if (uVar83 != 0) {
                              uVar78 = 0;
                            }
                            uVar78 = uVar78 + (byte)dec_trailing_zero_table[uVar83];
                            lVar57 = 4;
                          }
                          else {
                            uVar77 = (uint)(iVar61 * 0x147b) >> 0x13;
                            uVar83 = uVar77 * -100 + iVar61;
                            *(undefined2 *)((long)puVar88 + (4 - uVar105)) =
                                 *(undefined2 *)(digit_table + (ulong)uVar77 * 2);
                            *(undefined2 *)((long)puVar88 + (6 - uVar105)) =
                                 *(undefined2 *)(digit_table + uVar83 * 2);
                            uVar78 = (ulong)(byte)dec_trailing_zero_table[uVar77] + 2;
                            if (uVar83 != 0) {
                              uVar78 = (ulong)(byte)dec_trailing_zero_table[uVar83];
                            }
                            lVar57 = 8;
                          }
                          uVar78 = lVar57 - uVar78;
                        }
                        else {
                          uVar92 = (uint)(iVar61 * 0x147b) >> 0x13;
                          uVar77 = (uint)((uVar78 & 0xffffffff) * 0x68db8bb >> 0x20);
                          uVar96 = uVar77 >> 8;
                          uVar83 = uVar96 * 0x147b >> 0x13;
                          uVar78 = (ulong)uVar83;
                          uVar77 = uVar83 * -100 + (uVar77 >> 8);
                          *(undefined2 *)((long)puVar88 + (4 - uVar105)) =
                               *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                          *(undefined2 *)((long)puVar88 + (6 - uVar105)) =
                               *(undefined2 *)(digit_table + (uVar92 * 0x7fffff9c + iVar61) * 2);
                          *(undefined2 *)((long)puVar88 + (8 - uVar105)) =
                               *(undefined2 *)(digit_table + uVar78 * 2);
                          *(undefined2 *)((long)puVar88 + (10 - uVar105)) =
                               *(undefined2 *)(digit_table + uVar77 * 2);
                          iVar70 = uVar96 * -10000 + iVar70;
                          if (iVar70 == 0) {
                            lVar57 = 0xc;
                          }
                          else {
                            uVar77 = (uint)(iVar70 * 0x147b) >> 0x13;
                            uVar78 = (ulong)uVar77;
                            uVar77 = uVar77 * -100 + iVar70;
                            *(undefined2 *)((long)puVar88 + (0xc - uVar105)) =
                                 *(undefined2 *)(digit_table + uVar78 * 2);
                            *(undefined2 *)((long)puVar88 + (0xe - uVar105)) =
                                 *(undefined2 *)(digit_table + uVar77 * 2);
                            lVar57 = 0x10;
                          }
                          uVar78 = (ulong)(byte)dec_trailing_zero_table[uVar78] + 2;
                          if (uVar77 != 0) {
                            uVar78 = (ulong)(byte)dec_trailing_zero_table[uVar77];
                          }
                          uVar78 = lVar57 - uVar78;
                        }
                        puVar104 = (uint *)((long)puVar88 + ((uVar78 & 0xffffffff) - uVar105));
                        uVar78 = 1;
                        if (1 < (int)uVar69) {
                          uVar78 = (ulong)uVar69;
                        }
                        uVar105 = 0;
                        do {
                          *(byte *)((long)puVar106 + uVar105 + lVar63) =
                               *(byte *)((long)puVar106 + uVar105 + lVar63 + 1);
                          uVar105 = uVar105 + 1;
                        } while (uVar78 != uVar105);
                        puVar106 = (uint *)((undefined1 *)((ulong)uVar69 + (long)puVar71) + 2);
                        *(undefined1 *)((ulong)uVar69 + (long)puVar71) = 0x2e;
                        if (puVar106 < puVar104) {
                          puVar106 = puVar104;
                        }
                      }
                    }
                    else {
                      uVar105 = uVar78 / 100000000;
                      uVar69 = (uint)uVar105;
                      lVar63 = 2 - (ulong)(uVar69 < 100000000);
                      iVar84 = (int)((uVar105 & 0xffffffff) / 10000);
                      iVar82 = iVar84 * -10000 + uVar69;
                      uVar78 = uVar105 * 0xfa0a1f00 + uVar78;
                      iVar91 = (int)(((uVar105 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                      uVar77 = (uint)(iVar91 * 0x29) >> 0xc;
                      uVar92 = uVar77 * -100 + iVar91;
                      uVar83 = iVar91 * -100 + iVar84;
                      *(char *)((long)puVar71 + 1) = (char)uVar77 + '0';
                      uVar105 = (ulong)(uVar92 < 10 && uVar69 < 100000000);
                      *(undefined2 *)((long)puVar71 + lVar63) =
                           *(undefined2 *)(digit_table + uVar105 + uVar92 * 2);
                      lVar63 = lVar63 - uVar105;
                      *(undefined2 *)((long)puVar71 + lVar63 + 2) =
                           *(undefined2 *)(digit_table + uVar83 * 2);
                      iVar91 = (int)uVar78;
                      if (iVar91 == 0) {
                        if (iVar82 == 0) {
                          uVar69 = (uint)(byte)dec_trailing_zero_table[uVar92];
                          if (uVar83 != 0) {
                            uVar69 = 0;
                          }
                          uVar69 = uVar69 + (byte)dec_trailing_zero_table[uVar83];
                          iVar91 = 4;
                        }
                        else {
                          uVar69 = (uint)(iVar82 * 0x147b) >> 0x13;
                          uVar77 = uVar69 * -100 + iVar82;
                          *(undefined2 *)((long)puVar71 + lVar63 + 4) =
                               *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                          *(undefined2 *)((long)puVar71 + lVar63 + 6) =
                               *(undefined2 *)(digit_table + uVar77 * 2);
                          uVar69 = (byte)dec_trailing_zero_table[uVar69] + 2;
                          if (uVar77 != 0) {
                            uVar69 = (uint)(byte)dec_trailing_zero_table[uVar77];
                          }
                          iVar91 = 8;
                        }
                        uVar69 = iVar91 - uVar69;
                      }
                      else {
                        uVar92 = (uint)(iVar82 * 0x147b) >> 0x13;
                        uVar69 = (uint)((uVar78 & 0xffffffff) * 0x68db8bb >> 0x20);
                        uVar96 = uVar69 >> 8;
                        uVar83 = uVar96 * 0x147b >> 0x13;
                        uVar77 = uVar83 * -100 + (uVar69 >> 8);
                        *(undefined2 *)((long)puVar71 + lVar63 + 4) =
                             *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                        *(undefined2 *)((long)puVar71 + lVar63 + 6) =
                             *(undefined2 *)(digit_table + (uVar92 * 0x7fffff9c + iVar82) * 2);
                        *(undefined2 *)((long)puVar71 + lVar63 + 8) =
                             *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                        *(undefined2 *)((long)puVar71 + lVar63 + 10) =
                             *(undefined2 *)(digit_table + uVar77 * 2);
                        iVar91 = uVar96 * -10000 + iVar91;
                        if (iVar91 == 0) {
                          uVar69 = (byte)dec_trailing_zero_table[uVar83] + 2;
                          if (uVar77 != 0) {
                            uVar69 = (uint)(byte)dec_trailing_zero_table[uVar77];
                          }
                          iVar91 = 0xc;
                        }
                        else {
                          uVar69 = (uint)(iVar91 * 0x147b) >> 0x13;
                          uVar77 = uVar69 * -100 + iVar91;
                          *(undefined2 *)((long)puVar71 + lVar63 + 0xc) =
                               *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                          *(undefined2 *)((long)puVar71 + lVar63 + 0xe) =
                               *(undefined2 *)(digit_table + uVar77 * 2);
                          uVar69 = (byte)dec_trailing_zero_table[uVar69] + 2;
                          if (uVar77 != 0) {
                            uVar69 = (uint)(byte)dec_trailing_zero_table[uVar77];
                          }
                          iVar91 = 0x10;
                        }
                        uVar69 = iVar91 - uVar69;
                      }
                      puVar88 = (undefined2 *)
                                ((long)puVar71 +
                                (((ulong)uVar69 + lVar63) - (ulong)((ulong)uVar69 + lVar63 == 2)));
                      uVar77 = (iVar61 + iVar70) - 1;
                      *(undefined1 *)puVar71 = *(undefined1 *)((long)puVar71 + 1);
                      *(undefined1 *)((long)puVar71 + 1) = 0x2e;
                      *puVar88 = 0x2d65;
                      uVar83 = uVar77 >> 0x1f;
                      pcVar60 = (char *)((long)puVar88 + (ulong)uVar83 + 1);
                      uVar69 = -uVar77;
                      if (0 < (int)uVar77) {
                        uVar69 = uVar77;
                      }
                      if (uVar69 < 100) {
                        *(undefined2 *)pcVar60 =
                             *(undefined2 *)(digit_table + (ulong)(uVar69 < 10) + (ulong)uVar69 * 2)
                        ;
                        puVar106 = (uint *)(pcVar60 + (2 - (ulong)(uVar69 < 10)));
                      }
                      else {
                        *pcVar60 = (char)(uVar69 * 0x290 >> 0x10) + '0';
                        *(undefined2 *)((long)puVar88 + (ulong)uVar83 + 2) =
                             *(undefined2 *)
                              (digit_table + ((uVar69 * 0x290 >> 0x10) * 0x7fffff9c + uVar69) * 2);
                        puVar106 = (uint *)((long)puVar88 + (ulong)uVar83 + 4);
                      }
                    }
                  }
                }
              }
LAB_018d627c:
              if (puVar106 != (uint *)0x0) {
                *(ushort *)puVar106 = 0xa2c;
                puVar106 = (uint *)((long)puVar106 + 2);
                goto LAB_018d6292;
              }
LAB_018d8f1a:
              if (dat_len != (usize *)0x0) {
                *dat_len = 0;
              }
              pyVar66 = &local_48;
              if (err != (yyjson_write_err *)0x0) {
                pyVar66 = err;
              }
              pyVar67->code = 4;
              pcVar60 = "nan or inf number is not allowed";
              goto LAB_018d8e50;
            }
            if (((uint)uVar105 & 7) == 5) {
              uVar74 = uVar105 >> 8;
              puVar104 = (uint *)(pyVar86->uni).str;
              uVar78 = uVar76;
              if ((local_c0 & uVar69) != 0) {
                uVar78 = 0x10;
              }
              uVar78 = uVar78 + uVar74 * 6;
              if (puVar90 <= (ulong *)((long)puVar106 + uVar78)) {
                uVar81 = sVar108 >> 1;
                if (sVar108 >> 1 <= uVar78) {
                  uVar81 = uVar78;
                }
                sVar64 = (uVar81 + 0xf & 0xfffffffffffffff0) + sVar108;
                pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar108,sVar64);
                if (pbVar80 == (byte *)0x0) goto LAB_018d8e77;
                puVar89 = (ulong *)(pbVar80 + (sVar64 - ((long)local_88 - (long)puVar90)));
                memmove(puVar89,pbVar80 + ((long)puVar90 - (long)local_f8),
                        (long)local_88 - (long)puVar90);
                puVar106 = (uint *)(pbVar80 + ((long)puVar106 - (long)local_f8));
                local_88 = (ulong *)(pbVar80 + sVar64);
                local_f8 = pbVar80;
              }
              lVar63 = lVar79;
              puVar75 = puVar106;
              if (lVar79 != 0 && (local_c0 & uVar69) == 0) {
                do {
                  puVar106 = (uint *)((long)puVar75 + lVar100);
                  *puVar75 = 0x20202020;
                  lVar63 = lVar63 + -1;
                  puVar75 = puVar106;
                } while (lVar63 != 0);
              }
              if ((puVar99 != enc_table_cpy) || ((pyVar86->tag & 0x18) == 0)) {
                puVar75 = (uint *)(uVar74 + (long)puVar104);
                *(byte *)puVar106 = 0x22;
LAB_018d4768:
                lVar63 = (long)puVar75 - (long)puVar104;
                if (0xf < lVar63) {
                  lVar57 = 0;
                  do {
                    puVar107 = (uint *)((long)puVar106 + lVar57 + 1);
                    puVar87 = (uint *)(lVar57 + (long)puVar104);
                    if (puVar99[*(byte *)((long)puVar104 + lVar57)] != '\0') goto LAB_018d4bb9;
                    if (puVar99[*(byte *)((long)puVar104 + lVar57 + 1)] != '\0') {
                      puVar107 = (uint *)((long)puVar106 + lVar57 + 1);
                      puVar87 = (uint *)((long)puVar104 + lVar57);
                      goto LAB_018d497c;
                    }
                    if (puVar99[*(byte *)((long)puVar104 + lVar57 + 2)] != '\0') {
                      puVar107 = (uint *)((long)puVar106 + lVar57 + 1);
                      puVar87 = (uint *)((long)puVar104 + lVar57);
                      goto LAB_018d49a3;
                    }
                    if (puVar99[*(byte *)((long)puVar104 + lVar57 + 3)] != '\0') {
                      puVar107 = (uint *)((long)puVar106 + lVar57 + 1);
                      puVar87 = (uint *)((long)puVar104 + lVar57);
                      goto LAB_018d49ce;
                    }
                    if (puVar99[*(byte *)((long)puVar104 + lVar57 + 4)] != '\0') {
                      puVar87 = (uint *)((byte *)(lVar57 + (long)puVar104) + 4);
                      puVar107 = (uint *)((long)puVar106 + lVar57 + 5);
                      *(undefined4 *)((long)puVar106 + lVar57 + 1) =
                           *(undefined4 *)(lVar57 + (long)puVar104);
                      goto LAB_018d4bb9;
                    }
                    if (puVar99[*(byte *)((long)puVar104 + lVar57 + 5)] != '\0') {
                      pbVar80 = (byte *)(lVar57 + (long)puVar104);
                      puVar87 = (uint *)(pbVar80 + 5);
                      puVar107 = (uint *)((long)puVar106 + lVar57 + 6);
                      *(byte *)((long)puVar107 + -1) = pbVar80[4];
                      *(undefined4 *)((long)puVar107 + -5) = *(undefined4 *)pbVar80;
                      goto LAB_018d4bb9;
                    }
                    if (puVar99[*(byte *)((long)puVar104 + lVar57 + 6)] != '\0') {
                      pbVar80 = (byte *)(lVar57 + (long)puVar104);
                      puVar87 = (uint *)(pbVar80 + 6);
                      puVar107 = (uint *)((long)puVar106 + lVar57 + 7);
                      *(ushort *)((long)puVar107 + -2) = *(ushort *)(pbVar80 + 4);
                      *(undefined4 *)((long)puVar107 + -6) = *(undefined4 *)pbVar80;
                      goto LAB_018d4bb9;
                    }
                    if (puVar99[*(byte *)((long)puVar104 + lVar57 + 7)] != '\0') {
                      pbVar80 = (byte *)(lVar57 + (long)puVar104);
                      puVar87 = (uint *)(pbVar80 + 7);
                      uVar3 = *(undefined4 *)pbVar80;
                      puVar107 = (uint *)((long)puVar106 + lVar57 + 8);
                      *(undefined4 *)((long)puVar106 + lVar57 + 4) = *(undefined4 *)(pbVar80 + 3);
                      *(undefined4 *)((long)puVar106 + lVar57 + 1) = uVar3;
                      goto LAB_018d4bb9;
                    }
                    if (puVar99[*(byte *)((long)puVar104 + lVar57 + 8)] != '\0') {
                      puVar87 = (uint *)((byte *)(lVar57 + (long)puVar104) + 8);
                      puVar107 = (uint *)((long)puVar106 + lVar57 + 9);
                      *(undefined8 *)((long)puVar106 + lVar57 + 1) =
                           *(undefined8 *)(lVar57 + (long)puVar104);
                      goto LAB_018d4bb9;
                    }
                    if (puVar99[*(byte *)((long)puVar104 + lVar57 + 9)] != '\0') {
                      pbVar80 = (byte *)(lVar57 + (long)puVar104);
                      puVar87 = (uint *)(pbVar80 + 9);
                      puVar107 = (uint *)((long)puVar106 + lVar57 + 10);
                      *(byte *)((long)puVar107 + -1) = pbVar80[8];
                      *(undefined8 *)((long)puVar107 + -9) = *(undefined8 *)pbVar80;
                      goto LAB_018d4bb9;
                    }
                    if (puVar99[*(byte *)((long)puVar104 + lVar57 + 10)] != '\0') {
                      pbVar80 = (byte *)(lVar57 + (long)puVar104);
                      puVar87 = (uint *)(pbVar80 + 10);
                      puVar107 = (uint *)((long)puVar106 + lVar57 + 0xb);
                      *(ushort *)((long)puVar107 + -2) = *(ushort *)(pbVar80 + 8);
                      *(undefined8 *)((long)puVar107 + -10) = *(undefined8 *)pbVar80;
                      goto LAB_018d4bb9;
                    }
                    if (puVar99[*(byte *)((long)puVar104 + lVar57 + 0xb)] != '\0') {
                      pbVar80 = (byte *)(lVar57 + (long)puVar104);
                      puVar87 = (uint *)(pbVar80 + 0xb);
                      puVar107 = (uint *)((long)puVar106 + lVar57 + 0xc);
                      puVar107[-1] = *(uint *)(pbVar80 + 7);
                      *(undefined8 *)((long)puVar107 + -0xb) = *(undefined8 *)pbVar80;
                      goto LAB_018d4bb9;
                    }
                    if (puVar99[*(byte *)((long)puVar104 + lVar57 + 0xc)] != '\0') {
                      pbVar80 = (byte *)(lVar57 + (long)puVar104);
                      puVar87 = (uint *)(pbVar80 + 0xc);
                      puVar107 = (uint *)((long)puVar106 + lVar57 + 0xd);
                      puVar107[-1] = *(uint *)(pbVar80 + 8);
                      *(undefined8 *)(puVar107 + -3) = *(undefined8 *)pbVar80;
                      goto LAB_018d4bb9;
                    }
                    if (puVar99[*(byte *)((long)puVar104 + lVar57 + 0xd)] != '\0') {
                      pbVar80 = (byte *)(lVar57 + (long)puVar104);
                      puVar87 = (uint *)(pbVar80 + 0xd);
                      uVar72 = *(undefined8 *)pbVar80;
                      puVar107 = (uint *)((long)puVar106 + lVar57 + 0xe);
                      *(undefined8 *)((long)puVar106 + lVar57 + 6) = *(undefined8 *)(pbVar80 + 5);
                      *(undefined8 *)((long)puVar106 + lVar57 + 1) = uVar72;
                      goto LAB_018d4bb9;
                    }
                    if (puVar99[*(byte *)((long)puVar104 + lVar57 + 0xe)] != '\0') {
                      pbVar80 = (byte *)(lVar57 + (long)puVar104);
                      puVar87 = (uint *)(pbVar80 + 0xe);
                      uVar72 = *(undefined8 *)pbVar80;
                      puVar107 = (uint *)((long)puVar106 + lVar57 + 0xf);
                      *(undefined8 *)((long)puVar106 + lVar57 + 7) = *(undefined8 *)(pbVar80 + 6);
                      *(undefined8 *)((long)puVar106 + lVar57 + 1) = uVar72;
                      goto LAB_018d4bb9;
                    }
                    if (puVar99[*(byte *)((long)puVar104 + lVar57 + 0xf)] != '\0') {
                      pbVar80 = (byte *)(lVar57 + (long)puVar104);
                      puVar87 = (uint *)(pbVar80 + 0xf);
                      uVar72 = *(undefined8 *)pbVar80;
                      puVar107 = (uint *)((long)puVar106 + lVar57 + 0x10);
                      *(undefined8 *)((long)puVar106 + lVar57 + 8) = *(undefined8 *)(pbVar80 + 7);
                      *(undefined8 *)((long)puVar106 + lVar57 + 1) = uVar72;
                      goto LAB_018d4bb9;
                    }
                    uVar72 = *(undefined8 *)(puVar87 + 2);
                    *(undefined8 *)puVar107 = *(undefined8 *)puVar87;
                    *(undefined8 *)((long)puVar106 + lVar57 + 9) = uVar72;
                    lVar57 = lVar57 + 0x10;
                    lVar63 = lVar63 + -0x10;
                  } while (0xf < lVar63);
                  puVar106 = (uint *)((long)puVar106 + lVar57);
                  puVar104 = (uint *)((long)puVar104 + lVar57);
                }
                puVar107 = (uint *)((long)puVar106 + 1);
                puVar87 = puVar104;
                for (lVar63 = (long)puVar75 - (long)puVar104; 3 < lVar63; lVar63 = lVar63 + -4) {
                  if (puVar99[(byte)*puVar87] != '\0') goto LAB_018d4bb9;
                  if (puVar99[*(byte *)((long)puVar87 + 1)] != '\0') goto LAB_018d497c;
                  if (puVar99[*(byte *)((long)puVar87 + 2)] != '\0') goto LAB_018d49a3;
                  if (puVar99[*(byte *)((long)puVar87 + 3)] != '\0') goto LAB_018d49ce;
                  *puVar107 = *puVar87;
                  puVar107 = puVar107 + 1;
                  puVar87 = puVar87 + 1;
                }
                while( true ) {
                  if (puVar75 <= puVar87) goto switchD_018d4be1_default;
                  uVar77 = *puVar87;
                  if (puVar99[(byte)uVar77] != '\0') break;
                  puVar87 = (uint *)((long)puVar87 + 1);
                  *(byte *)puVar107 = (byte)uVar77;
                  puVar107 = (uint *)((long)puVar107 + 1);
                }
                goto LAB_018d4bb9;
              }
              *(byte *)puVar106 = 0x22;
              puVar106 = (uint *)((long)puVar106 + 1);
              if (0xfff < uVar105) {
                do {
                  uVar72 = *(undefined8 *)(puVar104 + 2);
                  *(undefined8 *)puVar106 = *(undefined8 *)puVar104;
                  *(undefined8 *)(puVar106 + 2) = uVar72;
                  puVar106 = puVar106 + 4;
                  puVar104 = puVar104 + 4;
                  uVar74 = uVar74 - 0x10;
                } while (0xf < uVar74);
              }
              for (; 3 < uVar74; uVar74 = uVar74 - 4) {
                *puVar106 = *puVar104;
                puVar106 = puVar106 + 1;
                puVar104 = puVar104 + 1;
              }
              if (uVar74 != 0) {
                uVar78 = 0;
                do {
                  *(byte *)((long)puVar106 + uVar78) = *(byte *)((long)puVar104 + uVar78);
                  uVar78 = uVar78 + 1;
                } while (uVar74 != uVar78);
                puVar106 = (uint *)((long)puVar106 + uVar78);
              }
              *(byte *)puVar106 = 0x22;
              pbVar80 = (byte *)((long)puVar106 + 1);
              goto LAB_018d5e67;
            }
            if ((~(byte)uVar105 & 6) != 0) {
              if (bVar102 == 1) {
                uVar105 = uVar105 >> 8;
                pvVar8 = (pyVar86->uni).ptr;
                if (puVar90 <= (ulong *)((long)puVar106 + uVar105 + 3)) {
                  uVar78 = sVar108 >> 1;
                  if (sVar108 >> 1 <= uVar105 + 3) {
                    uVar78 = uVar105 + 3;
                  }
                  sVar64 = (uVar78 + 0xf & 0xfffffffffffffff0) + sVar108;
                  pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar108,sVar64);
                  if (pbVar80 == (byte *)0x0) goto LAB_018d8e77;
                  sVar73 = (long)local_88 - (long)puVar90;
                  memmove(pbVar80 + (sVar64 - sVar73),pbVar80 + ((long)puVar90 - (long)local_f8),
                          sVar73);
                  puVar106 = (uint *)(pbVar80 + ((long)puVar106 - (long)local_f8));
                  local_88 = (ulong *)(pbVar80 + sVar64);
                  puVar90 = (ulong *)(pbVar80 + (sVar64 - sVar73));
                  local_f8 = pbVar80;
                }
                switchD_012dd528::default(puVar106,pvVar8,uVar105);
                pbVar80 = (byte *)((long)puVar106 + uVar105);
                puVar106 = (uint *)(pbVar80 + 2);
                pbVar80[0] = 0x2c;
                pbVar80[1] = 10;
                puVar89 = puVar90;
              }
              else if (bVar102 == 2) {
                uVar78 = uVar76;
                if ((uVar69 & local_c0) != 0) {
                  uVar78 = 0x10;
                }
                if (puVar90 <= (ulong *)((long)puVar106 + uVar78)) {
                  uVar105 = sVar108 >> 1;
                  if (sVar108 >> 1 <= uVar78) {
                    uVar105 = uVar78;
                  }
                  sVar64 = (uVar105 + 0xf & 0xfffffffffffffff0) + sVar108;
                  pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar108,sVar64);
                  if (pbVar80 == (byte *)0x0) goto LAB_018d8e77;
                  puVar89 = (ulong *)(pbVar80 + (sVar64 - ((long)local_88 - (long)puVar90)));
                  memmove(puVar89,pbVar80 + ((long)puVar90 - (long)local_f8),
                          (long)local_88 - (long)puVar90);
                  puVar106 = (uint *)(pbVar80 + ((long)puVar106 - (long)local_f8));
                  local_88 = (ulong *)(pbVar80 + sVar64);
                  local_f8 = pbVar80;
                }
                lVar63 = lVar79;
                puVar104 = puVar106;
                if (lVar79 != 0 && (uVar69 & local_c0) == 0) {
                  do {
                    puVar106 = (uint *)((long)puVar104 + lVar100);
                    *puVar104 = 0x20202020;
                    lVar63 = lVar63 + -1;
                    puVar104 = puVar106;
                  } while (lVar63 != 0);
                }
                puVar106[0] = 0x6c6c756e;
                puVar106[1] = 0xa2c;
                puVar106 = (uint *)((long)puVar106 + 6);
              }
              else {
                if (bVar102 != 3) goto LAB_018d8e16;
                uVar78 = uVar76;
                if ((uVar69 & local_c0) != 0) {
                  uVar78 = 0x10;
                }
                if (puVar90 <= (ulong *)((long)puVar106 + uVar78)) {
                  uVar105 = sVar108 >> 1;
                  if (sVar108 >> 1 <= uVar78) {
                    uVar105 = uVar78;
                  }
                  sVar64 = (uVar105 + 0xf & 0xfffffffffffffff0) + sVar108;
                  pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar108,sVar64);
                  if (pbVar80 == (byte *)0x0) goto LAB_018d8e77;
                  puVar89 = (ulong *)(pbVar80 + (sVar64 - ((long)local_88 - (long)puVar90)));
                  memmove(puVar89,pbVar80 + ((long)puVar90 - (long)local_f8),
                          (long)local_88 - (long)puVar90);
                  puVar106 = (uint *)(pbVar80 + ((long)puVar106 - (long)local_f8));
                  local_88 = (ulong *)(pbVar80 + sVar64);
                  local_f8 = pbVar80;
                }
                lVar63 = lVar79;
                puVar104 = puVar106;
                if (lVar79 != 0 && (uVar69 & local_c0) == 0) {
                  do {
                    puVar106 = (uint *)((long)puVar104 + lVar100);
                    *puVar104 = 0x20202020;
                    lVar63 = lVar63 + -1;
                    puVar104 = puVar106;
                  } while (lVar63 != 0);
                }
                bVar110 = (pyVar86->tag & 0x18) != 0;
                uVar72 = 0xa2c65736c6166;
                if (bVar110) {
                  uVar72 = 0xa2c65757274;
                }
                *(undefined8 *)puVar106 = uVar72;
                puVar106 = (uint *)((long)puVar106 + (7 - (ulong)bVar110));
              }
              goto LAB_018d6292;
            }
            uVar69 = uVar69 & local_c0;
            if (uVar105 < 0x100) {
              uVar78 = uVar76;
              if (uVar69 != 0) {
                uVar78 = 0x10;
              }
              if (puVar90 <= (ulong *)((long)puVar106 + uVar78)) {
                uVar105 = sVar108 >> 1;
                if (sVar108 >> 1 <= uVar78) {
                  uVar105 = uVar78;
                }
                sVar64 = (uVar105 + 0xf & 0xfffffffffffffff0) + sVar108;
                pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar108,sVar64);
                if (pbVar80 == (byte *)0x0) goto LAB_018d8e77;
                puVar89 = (ulong *)(pbVar80 + (sVar64 - ((long)local_88 - (long)puVar90)));
                memmove(puVar89,pbVar80 + ((long)puVar90 - (long)local_f8),
                        (long)local_88 - (long)puVar90);
                puVar106 = (uint *)(pbVar80 + ((long)puVar106 - (long)local_f8));
                local_88 = (ulong *)(pbVar80 + sVar64);
                local_f8 = pbVar80;
              }
              lVar63 = lVar79;
              puVar104 = puVar106;
              if (lVar79 != 0 && uVar69 == 0) {
                do {
                  puVar106 = (uint *)((long)puVar104 + lVar100);
                  *puVar104 = 0x20202020;
                  lVar63 = lVar63 + -1;
                  puVar104 = puVar106;
                } while (lVar63 != 0);
              }
              bVar102 = (bVar102 == 7) * ' ';
              *(byte *)puVar106 = bVar102 + 0x5b;
              *(byte *)((long)puVar106 + 1) = bVar102 | 0x5d;
              *(ushort *)((long)puVar106 + 2) = 0xa2c;
              puVar106 = puVar106 + 1;
              goto LAB_018d6292;
            }
            local_90 = (uint *)(ulong)(bVar102 == 7);
            if (uVar69 != 0) {
              uVar95 = 0x20;
            }
            uVar78 = sVar108;
            if (puVar90 <= (ulong *)((long)puVar106 + uVar95)) {
              uVar78 = sVar108 >> 1;
              if (sVar108 >> 1 <= uVar95) {
                uVar78 = uVar95;
              }
              uVar78 = (uVar78 + 0xf & 0xfffffffffffffff0) + sVar108;
              pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar108,uVar78);
              if (pbVar80 == (byte *)0x0) goto LAB_018d8e77;
              puVar89 = (ulong *)(pbVar80 + (uVar78 - ((long)local_88 - (long)puVar90)));
              memmove(puVar89,pbVar80 + ((long)puVar90 - (long)local_f8),
                      (long)local_88 - (long)puVar90);
              puVar106 = (uint *)(pbVar80 + ((long)puVar106 - (long)local_f8));
              local_88 = (ulong *)(pbVar80 + uVar78);
              local_f8 = pbVar80;
            }
            puVar89[-2] = uVar65 + lVar93 * 2;
            lVar93 = (uVar105 >> 8) << (bVar102 == 7);
            puVar89[-1] = (ulong)local_80;
            lVar63 = lVar79;
            puVar104 = puVar106;
            if (lVar79 != 0 && uVar69 == 0) {
              do {
                puVar106 = (uint *)((long)puVar104 + lVar100);
                *puVar104 = 0x20202020;
                lVar63 = lVar63 + -1;
                puVar104 = puVar106;
              } while (lVar63 != 0);
            }
            *(byte *)puVar106 = (bVar102 == 7) << 5 | 0x5b;
            *(byte *)((long)puVar106 + 1) = 10;
            uVar58 = (pyVar86->uni).u64;
            if (bVar102 == 7) {
              uVar58 = *(uint64_t *)(uVar58 + 0x10);
            }
            puVar89 = puVar89 + -2;
            lVar79 = lVar79 + 1;
            puVar106 = (uint *)((long)puVar106 + 2);
            pyVar85 = *(yyjson_mut_val **)(uVar58 + 0x10);
            local_80 = pyVar86;
          } while( true );
        }
        local_f8 = (byte *)0x0;
LAB_018d8e77:
        if (dat_len != (usize *)0x0) {
          *dat_len = 0;
        }
        pyVar66 = &local_48;
        if (err != (yyjson_write_err *)0x0) {
          pyVar66 = err;
        }
        pyVar67->code = 2;
        pyVar66->msg = "memory allocation failed";
      }
      if (local_f8 != (byte *)0x0) {
        (*p_Var5)(pvVar6,local_f8);
      }
      goto LAB_018d92cd;
    }
    if ((flg & 2) != 0) {
      puVar103 = enc_table_esc_slash;
      if ((flg & 4) == 0) {
        puVar103 = enc_table_esc;
      }
      switch(bVar102 & 7) {
      case 1:
        goto switchD_018d414d_caseD_1;
      case 2:
        goto switchD_018d414d_caseD_2;
      case 3:
        goto switchD_018d414d_caseD_3;
      case 4:
        goto switchD_018d414d_caseD_4;
      case 5:
        goto switchD_018d414d_caseD_5;
      case 6:
        goto switchD_018d414d_caseD_6;
      case 7:
        goto switchD_018d414d_caseD_7;
      }
switchD_018d414d_caseD_0:
      if (dat_len != (usize *)0x0) {
        *dat_len = 0;
      }
      pyVar66 = &local_48;
      if (err != (yyjson_write_err *)0x0) {
        pyVar66 = err;
      }
      pyVar67->code = 3;
      pyVar66->msg = "invalid JSON value type";
      goto LAB_018d92cd;
    }
    puVar103 = enc_table_cpy_slash;
    if ((flg & 4) == 0) {
      puVar103 = enc_table_cpy;
    }
    switch(bVar102 & 7) {
    case 0:
      goto switchD_018d414d_caseD_0;
    case 1:
switchD_018d414d_caseD_1:
      uVar78 = uVar78 >> 8;
      pvVar8 = (val->uni).ptr;
      puVar106 = (uint *)(*p_Var4)(pvVar6,uVar78 + 2);
      if (puVar106 == (uint *)0x0) break;
      switchD_012dd528::default(puVar106,pvVar8,uVar78);
      local_70 = (uint *)((long)puVar106 + uVar78);
      goto LAB_018d9262;
    case 2:
switchD_018d414d_caseD_2:
      puVar106 = (uint *)(*p_Var4)(pvVar6,8);
      if (puVar106 != (uint *)0x0) {
        puVar106[0] = 0x6c6c756e;
        puVar106[1] = 0xa2c;
        local_70 = puVar106 + 1;
        goto LAB_018d9262;
      }
      break;
    case 3:
switchD_018d414d_caseD_3:
      puVar106 = (uint *)(*p_Var4)(pvVar6,8);
      if (puVar106 != (uint *)0x0) {
        bVar110 = (val->tag & 0x18) != 0;
        uVar72 = 0xa2c65736c6166;
        if (bVar110) {
          uVar72 = 0xa2c65757274;
        }
        *(undefined8 *)puVar106 = uVar72;
        local_70 = (uint *)((long)puVar106 + (5 - (ulong)bVar110));
        goto LAB_018d9262;
      }
      break;
    case 4:
switchD_018d414d_caseD_4:
      puVar106 = (uint *)(*p_Var4)(pvVar6,0x22);
      if (puVar106 == (uint *)0x0) break;
      pcVar60 = (char *)(val->uni).u64;
      uVar69 = (uint)((ulong)pcVar60 >> 0x20);
      if ((val->tag & 0x10) == 0) {
        uVar69 = uVar69 >> 0x1f & (uint)(val->tag >> 3);
        pcVar62 = (char *)-(long)pcVar60;
        if (uVar69 == 0) {
          pcVar62 = pcVar60;
        }
        *(byte *)puVar106 = 0x2d;
        pbVar80 = (byte *)((long)puVar106 + (ulong)uVar69);
        if (pcVar62 < (char *)0x5f5e100) {
          if (pcVar62 < (char *)0x64) {
            *(undefined2 *)pbVar80 =
                 *(undefined2 *)(digit_table + (ulong)(pcVar62 < (char *)0xa) + (long)pcVar62 * 2);
            pbVar80 = pbVar80 + -(ulong)(pcVar62 < (char *)0xa);
LAB_018dad9a:
            local_70 = (uint *)(pbVar80 + 2);
          }
          else {
            iVar70 = (int)pcVar62;
            if (pcVar62 < (char *)0x2710) {
              uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
              uVar78 = (ulong)(pcVar62 < (char *)0x3e8);
              *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + uVar78 + (ulong)uVar69 * 2);
              *(undefined2 *)(pbVar80 + (2 - uVar78)) =
                   *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
              local_70 = (uint *)(pbVar80 + (4 - uVar78));
            }
            else {
              if ((char *)0xf423f < pcVar62) {
                uVar69 = (uint)((ulong)((long)pcVar62 * 0x68db8bb) >> 0x20);
                uVar77 = uVar69 >> 8;
                iVar70 = uVar77 * -10000 + iVar70;
                uVar77 = uVar77 * 0x147b >> 0x13;
                uVar83 = (uint)(iVar70 * 0x147b) >> 0x13;
                iVar70 = uVar83 * -100 + iVar70;
                *(undefined2 *)pbVar80 =
                     *(undefined2 *)
                      (digit_table + (ulong)(pcVar62 < "edRowGroupE") + (ulong)uVar77 * 2);
                pbVar80 = pbVar80 + -(ulong)(pcVar62 < "edRowGroupE");
                *(undefined2 *)(pbVar80 + 2) =
                     *(undefined2 *)(digit_table + (uVar77 * -100 + (uVar69 >> 8)) * 2);
                uVar68 = *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                goto LAB_018da9a9;
              }
              iVar70 = (int)((ulong)((long)pcVar62 * 0x68db9) >> 0x20) * -10000 + iVar70;
              uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
              uVar78 = (ulong)(pcVar62 < (char *)0x186a0);
              *(undefined2 *)pbVar80 =
                   *(undefined2 *)
                    (digit_table + uVar78 + ((ulong)((long)pcVar62 * 0x68db9) >> 0x20) * 2);
              *(undefined2 *)(pbVar80 + (2 - uVar78)) =
                   *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
              *(undefined2 *)(pbVar80 + (4 - uVar78)) =
                   *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
              local_70 = (uint *)(pbVar80 + (6 - uVar78));
            }
          }
        }
        else {
          uVar78 = (ulong)pcVar62 / 100000000;
          pcVar60 = pcVar62 + uVar78 * 0xfa0a1f00;
          iVar70 = (int)uVar78;
          if (pcVar62 < (char *)0x2386f26fc10000) {
            if ("orINS_10unique_ptrINS_10ExpressionESt14default_deleteIS6_ELb1EEELb1EEE" <
                (char *)((ulong)pcVar62 >> 10)) {
              if ((ulong)pcVar62 >> 0xc < 0xe8d4a51) {
                uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                uVar78 = (ulong)((ulong)pcVar62 >> 0xb < 0x2e90edd);
                *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + uVar78 + (ulong)uVar69 * 2);
                *(undefined2 *)(pbVar80 + (2 - uVar78)) =
                     *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                pbVar80 = pbVar80 + (4 - uVar78);
              }
              else if (pcVar62 < (char *)0x5af3107a4000) {
                iVar70 = (int)(uVar78 * 0x68db9 >> 0x20) * -10000 + iVar70;
                uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                uVar95 = (ulong)((ulong)pcVar62 >> 0xd < 0x48c27395);
                *(undefined2 *)pbVar80 =
                     *(undefined2 *)(digit_table + uVar95 + (uVar78 * 0x68db9 >> 0x20) * 2);
                *(undefined2 *)(pbVar80 + (2 - uVar95)) =
                     *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                *(undefined2 *)(pbVar80 + (4 - uVar95)) =
                     *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                pbVar80 = pbVar80 + (6 - uVar95);
              }
              else {
                uVar69 = (uint)(uVar78 * 0x68db8bb >> 0x20);
                uVar77 = uVar69 >> 8;
                iVar70 = uVar77 * -10000 + iVar70;
                uVar77 = uVar77 * 0x147b >> 0x13;
                uVar83 = (uint)(iVar70 * 0x147b) >> 0x13;
                uVar78 = (ulong)(pcVar62 < (char *)0x38d7ea4c68000);
                *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + uVar78 + (ulong)uVar77 * 2);
                *(undefined2 *)(pbVar80 + (2 - uVar78)) =
                     *(undefined2 *)(digit_table + (uVar77 * -100 + (uVar69 >> 8)) * 2);
                *(undefined2 *)(pbVar80 + (4 - uVar78)) =
                     *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                *(undefined2 *)(pbVar80 + (6 - uVar78)) =
                     *(undefined2 *)(digit_table + (uVar83 * -100 + iVar70) * 2);
                pbVar80 = pbVar80 + (8 - uVar78);
              }
            }
            else {
              *(undefined2 *)pbVar80 =
                   *(undefined2 *)(digit_table + (ulong)(pcVar62 < (char *)0x3b9aca00) + uVar78 * 2)
              ;
              pbVar80 = pbVar80 + (2 - (ulong)(pcVar62 < (char *)0x3b9aca00));
            }
            uVar69 = (uint)(((ulong)pcVar60 & 0xffffffff) * 0x68db8bb >> 0x20);
            uVar77 = uVar69 >> 8;
            iVar70 = uVar77 * -10000 + (int)pcVar60;
            uVar77 = uVar77 * 0x147b >> 0x13;
            uVar83 = (uint)(iVar70 * 0x147b) >> 0x13;
            iVar70 = uVar83 * 0x7fffff9c + iVar70;
            *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + (ulong)uVar77 * 2);
            *(undefined2 *)(pbVar80 + 2) =
                 *(undefined2 *)(digit_table + (uVar77 * -100 + (uVar69 >> 8)) * 2);
            uVar68 = *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
LAB_018da9a9:
            *(undefined2 *)(pbVar80 + 4) = uVar68;
            *(undefined2 *)(pbVar80 + 6) = *(undefined2 *)(digit_table + (uint)(iVar70 * 2));
            local_70 = (uint *)(pbVar80 + 8);
          }
          else {
            uVar78 = (ulong)pcVar62 / 1000000000000;
            iVar61 = (int)uVar78;
            iVar70 = iVar70 + iVar61 * -10000;
            if (pcVar62 < (char *)0xde0b6b3a7640000) {
              iVar61 = (int)(uVar78 * 0x68db9 >> 0x20) * -10000 + iVar61;
              uVar69 = (uint)(iVar61 * 0x147b) >> 0x13;
              uVar95 = (ulong)(pcVar62 < (char *)0x16345785d8a0000);
              *(undefined2 *)pbVar80 =
                   *(undefined2 *)(digit_table + uVar95 + (uVar78 * 0x68db9 >> 0x20) * 2);
              *(undefined2 *)(pbVar80 + (2 - uVar95)) =
                   *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
              *(undefined2 *)(pbVar80 + (4 - uVar95)) =
                   *(undefined2 *)(digit_table + (uVar69 * -100 + iVar61) * 2);
              lVar93 = 6 - uVar95;
            }
            else {
              uVar69 = (uint)(uVar78 / 10000);
              iVar61 = uVar69 * -10000 + iVar61;
              uVar69 = uVar69 / 100;
              uVar77 = (uint)(iVar61 * 0x147b) >> 0x13;
              uVar95 = (ulong)(pcVar62 < (char *)0x8ac7230489e80000);
              *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + uVar95 + (ulong)uVar69 * 2);
              *(undefined2 *)(pbVar80 + (2 - uVar95)) =
                   *(undefined2 *)(digit_table + (uVar69 * -100 + (int)(uVar78 / 10000)) * 2);
              *(undefined2 *)(pbVar80 + (4 - uVar95)) =
                   *(undefined2 *)(digit_table + (ulong)uVar77 * 2);
              *(undefined2 *)(pbVar80 + (6 - uVar95)) =
                   *(undefined2 *)(digit_table + (uVar77 * -100 + iVar61) * 2);
              lVar93 = 8 - uVar95;
            }
            pbVar80 = pbVar80 + lVar93;
            uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
            *(undefined2 *)pbVar80 = *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
            *(undefined2 *)(pbVar80 + 2) =
                 *(undefined2 *)(digit_table + (uVar69 * 0x7fffff9c + iVar70) * 2);
            uVar69 = (uint)(((ulong)pcVar60 & 0xffffffff) * 0x68db8bb >> 0x20);
            uVar77 = uVar69 >> 8;
            iVar70 = uVar77 * -10000 + (int)pcVar60;
            uVar77 = uVar77 * 0x147b >> 0x13;
            uVar83 = (uint)(iVar70 * 0x147b) >> 0x13;
            *(undefined2 *)(pbVar80 + 4) = *(undefined2 *)(digit_table + (ulong)uVar77 * 2);
            *(undefined2 *)(pbVar80 + 6) =
                 *(undefined2 *)(digit_table + (uVar77 * -100 + (uVar69 >> 8)) * 2);
            *(undefined2 *)(pbVar80 + 8) = *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
            *(undefined2 *)(pbVar80 + 10) =
                 *(undefined2 *)(digit_table + (uVar83 * 0x7fffff9c + iVar70) * 2);
            local_70 = (uint *)(pbVar80 + 0xc);
          }
        }
      }
      else {
        uVar78 = (ulong)pcVar60 & 0xfffffffffffff;
        uVar69 = uVar69 >> 0x14 & 0x7ff;
        if (uVar69 == 0x7ff) {
          if ((flg & 0x10) == 0) {
            if ((flg & 8) == 0) {
              local_70 = (uint *)0x0;
            }
            else if (uVar78 == 0) {
              *(byte *)puVar106 = 0x2d;
              lVar93 = -((long)pcVar60 >> 0x3f);
              *(undefined8 *)((long)puVar106 + lVar93) = 0x7974696e69666e49;
              local_70 = (uint *)((long)puVar106 + lVar93 + 8);
            }
            else {
              *puVar106 = 0x4e614e;
              local_70 = (uint *)((long)puVar106 + 3);
            }
          }
          else {
            *puVar106 = 0x6c6c756e;
            local_70 = puVar106 + 1;
          }
        }
        else {
          *(byte *)puVar106 = 0x2d;
          lVar93 = -((long)pcVar60 >> 0x3f);
          puVar71 = (undefined8 *)((long)puVar106 + lVar93);
          if (((ulong)pcVar60 & 0x7fffffffffffffff) == 0) {
            *(undefined4 *)puVar71 = 0x302e30;
            local_70 = (uint *)((long)puVar71 + 3);
          }
          else if (uVar69 == 0) {
            yyjson_mut_write_opts_impl();
          }
          else {
            uVar95 = uVar78 + 0x10000000000000;
            if (uVar69 - 0x3ff < 0x35) {
              lVar100 = 0;
              if (uVar95 != 0) {
                for (; (uVar95 >> lVar100 & 1) == 0; lVar100 = lVar100 + 1) {
                }
              }
              if (0x433 - uVar69 <= (uint)lVar100) {
                pcVar60 = (char *)(uVar95 >> ((byte)(0x433 - uVar69) & 0x3f));
                iVar70 = (int)pcVar60;
                if (pcVar60 < (char *)0x5f5e100) {
                  if (pcVar60 < (char *)0x64) {
                    *(undefined2 *)puVar71 =
                         *(undefined2 *)
                          (digit_table + (ulong)(pcVar60 < (char *)0xa) + (long)pcVar60 * 2);
                    pbVar80 = (byte *)((long)puVar71 + (2 - (ulong)(pcVar60 < (char *)0xa)));
                  }
                  else if (pcVar60 < (char *)0x2710) {
                    uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                    uVar78 = (ulong)(pcVar60 < (char *)0x3e8);
                    *(undefined2 *)puVar71 =
                         *(undefined2 *)(digit_table + uVar78 + (ulong)uVar69 * 2);
                    *(undefined2 *)((long)puVar71 + (2 - uVar78)) =
                         *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                    pbVar80 = (byte *)((long)puVar71 + (4 - uVar78));
                  }
                  else if (pcVar60 < (char *)0xf4240) {
                    iVar70 = (int)((ulong)((long)pcVar60 * 0x68db9) >> 0x20) * -10000 + iVar70;
                    uVar69 = (uint)(iVar70 * 0x147b) >> 0x13;
                    uVar78 = (ulong)(pcVar60 < (char *)0x186a0);
                    *(undefined2 *)puVar71 =
                         *(undefined2 *)
                          (digit_table + uVar78 + ((ulong)((long)pcVar60 * 0x68db9) >> 0x20) * 2);
                    *(undefined2 *)((long)puVar71 + (2 - uVar78)) =
                         *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                    *(undefined2 *)((long)puVar71 + (4 - uVar78)) =
                         *(undefined2 *)(digit_table + (uVar69 * -100 + iVar70) * 2);
                    pbVar80 = (byte *)((long)puVar71 + (6 - uVar78));
                  }
                  else {
                    uVar69 = (uint)((ulong)((long)pcVar60 * 0x68db8bb) >> 0x20);
                    uVar77 = uVar69 >> 8;
                    iVar70 = uVar77 * -10000 + iVar70;
                    uVar77 = uVar77 * 0x147b >> 0x13;
                    uVar83 = (uint)(iVar70 * 0x147b) >> 0x13;
                    uVar78 = (ulong)(pcVar60 < "edRowGroupE");
                    *(undefined2 *)puVar71 =
                         *(undefined2 *)(digit_table + uVar78 + (ulong)uVar77 * 2);
                    *(undefined2 *)((long)puVar71 + (2 - uVar78)) =
                         *(undefined2 *)(digit_table + (uVar77 * -100 + (uVar69 >> 8)) * 2);
                    *(undefined2 *)((long)puVar71 + (4 - uVar78)) =
                         *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                    *(undefined2 *)((long)puVar71 + (6 - uVar78)) =
                         *(undefined2 *)(digit_table + (uVar83 * -100 + iVar70) * 2);
                    pbVar80 = (byte *)((long)puVar71 + (8 - uVar78));
                  }
                }
                else {
                  auVar29._8_8_ = 0;
                  auVar29._0_8_ = pcVar60;
                  uVar78 = SUB168(auVar29 * ZEXT816(0xabcc77118461d),8) >> 0xe;
                  iVar61 = (int)uVar78;
                  uVar69 = iVar61 * -100000000 + iVar70;
                  if ("orINS_10unique_ptrINS_10ExpressionESt14default_deleteIS6_ELb1EEELb1EEE" <
                      (char *)((ulong)pcVar60 >> 10)) {
                    if ((ulong)pcVar60 >> 0xc < 0xe8d4a51) {
                      uVar77 = (uint)(iVar61 * 0x147b) >> 0x13;
                      uVar78 = (ulong)((ulong)pcVar60 >> 0xb < 0x2e90edd);
                      *(undefined2 *)puVar71 =
                           *(undefined2 *)(digit_table + uVar78 + (ulong)uVar77 * 2);
                      *(undefined2 *)((long)puVar71 + (2 - uVar78)) =
                           *(undefined2 *)(digit_table + (uVar77 * -100 + iVar61) * 2);
                      puVar88 = (undefined2 *)((long)puVar71 + (4 - uVar78));
                    }
                    else if (pcVar60 < (char *)0x5af3107a4000) {
                      iVar61 = (int)(uVar78 * 0x68db9 >> 0x20) * -10000 + iVar61;
                      uVar77 = (uint)(iVar61 * 0x147b) >> 0x13;
                      uVar95 = (ulong)((ulong)pcVar60 >> 0xd < 0x48c27395);
                      *(undefined2 *)puVar71 =
                           *(undefined2 *)(digit_table + uVar95 + (uVar78 * 0x68db9 >> 0x20) * 2);
                      *(undefined2 *)((long)puVar71 + (2 - uVar95)) =
                           *(undefined2 *)(digit_table + (ulong)uVar77 * 2);
                      *(undefined2 *)((long)puVar71 + (4 - uVar95)) =
                           *(undefined2 *)(digit_table + (uVar77 * -100 + iVar61) * 2);
                      puVar88 = (undefined2 *)((long)puVar71 + (6 - uVar95));
                    }
                    else {
                      uVar77 = (uint)(uVar78 * 0x68db8bb >> 0x20);
                      uVar83 = uVar77 >> 8;
                      iVar61 = uVar83 * -10000 + iVar61;
                      uVar83 = uVar83 * 0x147b >> 0x13;
                      uVar92 = (uint)(iVar61 * 0x147b) >> 0x13;
                      uVar78 = (ulong)(pcVar60 < (char *)0x38d7ea4c68000);
                      *(undefined2 *)puVar71 =
                           *(undefined2 *)(digit_table + uVar78 + (ulong)uVar83 * 2);
                      *(undefined2 *)((long)puVar71 + (2 - uVar78)) =
                           *(undefined2 *)(digit_table + (uVar83 * -100 + (uVar77 >> 8)) * 2);
                      *(undefined2 *)((long)puVar71 + (4 - uVar78)) =
                           *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                      *(undefined2 *)((long)puVar71 + (6 - uVar78)) =
                           *(undefined2 *)(digit_table + (uVar92 * -100 + iVar61) * 2);
                      puVar88 = (undefined2 *)((long)puVar71 + (8 - uVar78));
                    }
                  }
                  else {
                    *(undefined2 *)puVar71 =
                         *(undefined2 *)
                          (digit_table + (ulong)(pcVar60 < (char *)0x3b9aca00) + uVar78 * 2);
                    puVar88 = (undefined2 *)
                              ((long)puVar71 + (2 - (ulong)(pcVar60 < (char *)0x3b9aca00)));
                  }
                  uVar77 = (uint)((ulong)uVar69 * 0x68db8bb >> 0x20);
                  uVar83 = uVar77 >> 8;
                  iVar70 = uVar83 * -10000 + uVar69;
                  uVar69 = uVar83 * 0x147b >> 0x13;
                  uVar83 = (uint)(iVar70 * 0x147b) >> 0x13;
                  *puVar88 = *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                  puVar88[1] = *(undefined2 *)(digit_table + (uVar69 * -100 + (uVar77 >> 8)) * 2);
                  puVar88[2] = *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                  puVar88[3] = *(undefined2 *)(digit_table + (uVar83 * 0x7fffff9c + iVar70) * 2);
                  pbVar80 = (byte *)(puVar88 + 4);
                }
                pbVar80[0] = 0x2e;
                pbVar80[1] = 0x30;
                goto LAB_018dad9a;
              }
            }
            uVar76 = (ulong)((uint)pcVar60 & 1);
            iVar70 = uVar69 * 0x4d105 + -0x200a5;
            if (uVar69 == 1 || uVar78 != 0) {
              iVar70 = uVar69 * 0x4d105;
            }
            iVar70 = iVar70 + -0x1439b7ff >> 0x14;
            uVar65 = *(ulong *)(pow10_sig_table + (ulong)(iVar70 * -2 + 0x2ae) * 8);
            uVar105 = *(long *)(pow10_sig_table + (ulong)(iVar70 * -2 + 0x2af) * 8) +
                      (ulong)(iVar70 - 1U < 0xffffffc8);
            bVar102 = ((char)((uint)(iVar70 * -0x3526b) >> 0x10) + (char)uVar69) - 0x32;
            uVar78 = (ulong)(uVar69 != 1 && uVar78 == 0) + uVar95 * 4 + -2 << (bVar102 & 0x3f);
            auVar23._8_8_ = 0;
            auVar23._0_8_ = uVar105;
            auVar42._8_8_ = 0;
            auVar42._0_8_ = uVar78;
            auVar54._8_8_ = 0;
            auVar54._0_8_ = SUB168(auVar23 * auVar42,8);
            auVar24._8_8_ = 0;
            auVar24._0_8_ = uVar65;
            auVar43._8_8_ = 0;
            auVar43._0_8_ = uVar78;
            auVar54 = auVar24 * auVar43 + auVar54;
            uVar78 = uVar95 * 4 << (bVar102 & 0x3f);
            auVar25._8_8_ = 0;
            auVar25._0_8_ = uVar105;
            auVar44._8_8_ = 0;
            auVar44._0_8_ = uVar78;
            auVar55._8_8_ = 0;
            auVar55._0_8_ = SUB168(auVar25 * auVar44,8);
            auVar26._8_8_ = 0;
            auVar26._0_8_ = uVar65;
            auVar45._8_8_ = 0;
            auVar45._0_8_ = uVar78;
            auVar55 = auVar26 * auVar45 + auVar55;
            uVar78 = auVar55._8_8_;
            uVar95 = uVar95 * 4 + 2 << (bVar102 & 0x3f);
            auVar27._8_8_ = 0;
            auVar27._0_8_ = uVar105;
            auVar46._8_8_ = 0;
            auVar46._0_8_ = uVar95;
            auVar56._8_8_ = 0;
            auVar56._0_8_ = SUB168(auVar27 * auVar46,8);
            auVar28._8_8_ = 0;
            auVar28._0_8_ = uVar65;
            auVar47._8_8_ = 0;
            auVar47._0_8_ = uVar95;
            auVar56 = auVar28 * auVar47 + auVar56;
            uVar95 = ((ulong)((auVar54 & (undefined1  [16])0xfffffffffffffffe) !=
                             (undefined1  [16])0x0) | auVar54._8_8_) + uVar76;
            uVar76 = ((ulong)((auVar56 & (undefined1  [16])0xfffffffffffffffe) !=
                             (undefined1  [16])0x0) | auVar56._8_8_) - uVar76;
            if (uVar78 < 0x28) {
LAB_018d94aa:
              uVar105 = (auVar55 & (undefined1  [16])0xfffffffffffffffe) != (undefined1  [16])0x0 |
                        uVar78;
              uVar65 = uVar78 & 0xfffffffffffffffc;
              bVar110 = true;
              if (uVar105 <= uVar65 + 2) {
                bVar110 = (bool)((byte)(uVar78 >> 2) & 0x3f & uVar105 == uVar65 + 2);
              }
              bVar109 = uVar65 + 4 <= uVar76;
              if (uVar65 < uVar95 == bVar109) {
                bVar110 = bVar109;
              }
              uVar78 = (uVar78 >> 2) + (ulong)bVar110;
            }
            else {
              uVar105 = uVar78 / 0x28;
              uVar65 = uVar105 * 0x28 + 0x28;
              if (uVar105 * 0x28 < uVar95 != uVar65 <= uVar76) goto LAB_018d94aa;
              uVar78 = (uVar105 + 1) - (ulong)(uVar76 < uVar65);
              iVar70 = iVar70 + 1;
            }
            iVar61 = (0x11 - (uint)(uVar78 < 10000000000000000)) - (uint)(uVar78 < 1000000000000000)
            ;
            if (iVar61 + iVar70 + 5U < 0x1b) {
              uVar69 = iVar61 + iVar70;
              if ((int)uVar69 < 1) {
                uVar95 = uVar78 / 100000000;
                uVar83 = (uint)uVar95;
                puVar88 = (undefined2 *)
                          ((long)puVar71 + (((ulong)(2 - uVar69) + 1) - (ulong)(uVar83 < 100000000))
                          );
                iVar91 = (int)((uVar95 & 0xffffffff) / 10000);
                iVar61 = iVar91 * -10000 + uVar83;
                uVar78 = uVar95 * 0xfa0a1f00 + uVar78;
                iVar70 = (int)(((uVar95 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                uVar92 = (uint)(iVar70 * 0x29) >> 0xc;
                uVar96 = uVar92 * -100 + iVar70;
                uVar77 = iVar70 * -100 + iVar91;
                *(char *)((long)puVar71 + (ulong)(2 - uVar69)) = (char)uVar92 + '0';
                uVar95 = (ulong)(uVar96 < 10 && uVar83 < 100000000);
                *puVar88 = *(undefined2 *)(digit_table + uVar95 + uVar96 * 2);
                *(undefined2 *)((long)puVar88 + (2 - uVar95)) =
                     *(undefined2 *)(digit_table + uVar77 * 2);
                iVar70 = (int)uVar78;
                if (iVar70 == 0) {
                  if (iVar61 == 0) {
                    uVar83 = 0;
                    if (uVar77 == 0) {
                      uVar83 = (uint)(byte)dec_trailing_zero_table[uVar96];
                    }
                    uVar77 = 4 - (uVar83 + (byte)dec_trailing_zero_table[uVar77]);
                  }
                  else {
                    uVar77 = (uint)(iVar61 * 0x147b) >> 0x13;
                    uVar83 = uVar77 * -100 + iVar61;
                    *(undefined2 *)((long)puVar88 + (4 - uVar95)) =
                         *(undefined2 *)(digit_table + (ulong)uVar77 * 2);
                    *(undefined2 *)((long)puVar88 + (6 - uVar95)) =
                         *(undefined2 *)(digit_table + uVar83 * 2);
                    uVar77 = (byte)dec_trailing_zero_table[uVar77] + 2;
                    if (uVar83 != 0) {
                      uVar77 = (uint)(byte)dec_trailing_zero_table[uVar83];
                    }
                    uVar77 = 8 - uVar77;
                  }
                }
                else {
                  uVar96 = (uint)(iVar61 * 0x147b) >> 0x13;
                  uVar77 = (uint)((uVar78 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar92 = uVar77 >> 8;
                  uVar83 = uVar92 * 0x147b >> 0x13;
                  uVar78 = (ulong)uVar83;
                  uVar83 = uVar83 * -100 + (uVar77 >> 8);
                  *(undefined2 *)((long)puVar88 + (4 - uVar95)) =
                       *(undefined2 *)(digit_table + (ulong)uVar96 * 2);
                  *(undefined2 *)((long)puVar88 + (6 - uVar95)) =
                       *(undefined2 *)(digit_table + (uVar96 * 0x7fffff9c + iVar61) * 2);
                  *(undefined2 *)((long)puVar88 + (8 - uVar95)) =
                       *(undefined2 *)(digit_table + uVar78 * 2);
                  *(undefined2 *)((long)puVar88 + (10 - uVar95)) =
                       *(undefined2 *)(digit_table + uVar83 * 2);
                  iVar70 = uVar92 * -10000 + iVar70;
                  if (iVar70 == 0) {
                    iVar70 = 0xc;
                  }
                  else {
                    uVar77 = (uint)(iVar70 * 0x147b) >> 0x13;
                    uVar78 = (ulong)uVar77;
                    uVar83 = uVar77 * -100 + iVar70;
                    *(undefined2 *)((long)puVar88 + (0xc - uVar95)) =
                         *(undefined2 *)(digit_table + uVar78 * 2);
                    *(undefined2 *)((long)puVar88 + (0xe - uVar95)) =
                         *(undefined2 *)(digit_table + uVar83 * 2);
                    iVar70 = 0x10;
                  }
                  uVar77 = (byte)dec_trailing_zero_table[uVar78] + 2;
                  if (uVar83 != 0) {
                    uVar77 = (uint)(byte)dec_trailing_zero_table[uVar83];
                  }
                  uVar77 = iVar70 - uVar77;
                }
                local_70 = (uint *)((long)puVar88 + (uVar77 - uVar95));
                *(undefined2 *)puVar71 = 0x2e30;
                if ((int)uVar69 < 0) {
                  sVar73 = 1;
                  if (1 < (int)-uVar69) {
                    sVar73 = (size_t)-uVar69;
                  }
                  switchD_01306cb1::default((undefined2 *)((long)puVar71 + 2),0x30,sVar73);
                }
              }
              else {
                uVar95 = uVar78 / 100000000;
                uVar83 = (uint)uVar95;
                puVar88 = (undefined2 *)((long)puVar71 + (2 - (ulong)(uVar83 < 100000000)));
                iVar91 = (int)((uVar95 & 0xffffffff) / 10000);
                iVar61 = iVar91 * -10000 + uVar83;
                uVar78 = uVar95 * 0xfa0a1f00 + uVar78;
                iVar70 = (int)(((uVar95 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
                uVar92 = (uint)(iVar70 * 0x29) >> 0xc;
                uVar96 = uVar92 * -100 + iVar70;
                uVar77 = iVar70 * -100 + iVar91;
                *puVar71 = 0x3030303030303030;
                puVar71[1] = 0x3030303030303030;
                puVar71[2] = 0x3030303030303030;
                *(char *)((long)puVar71 + 1) = (char)uVar92 + '0';
                uVar95 = (ulong)(uVar96 < 10 && uVar83 < 100000000);
                *puVar88 = *(undefined2 *)(digit_table + uVar95 + uVar96 * 2);
                *(undefined2 *)((long)puVar88 + (2 - uVar95)) =
                     *(undefined2 *)(digit_table + uVar77 * 2);
                iVar70 = (int)uVar78;
                if (iVar70 == 0) {
                  if (iVar61 == 0) {
                    uVar83 = 0;
                    if (uVar77 == 0) {
                      uVar83 = (uint)(byte)dec_trailing_zero_table[uVar96];
                    }
                    uVar77 = 4 - (uVar83 + (byte)dec_trailing_zero_table[uVar77]);
                  }
                  else {
                    uVar77 = (uint)(iVar61 * 0x147b) >> 0x13;
                    uVar83 = uVar77 * -100 + iVar61;
                    *(undefined2 *)((long)puVar88 + (4 - uVar95)) =
                         *(undefined2 *)(digit_table + (ulong)uVar77 * 2);
                    *(undefined2 *)((long)puVar88 + (6 - uVar95)) =
                         *(undefined2 *)(digit_table + uVar83 * 2);
                    uVar77 = (byte)dec_trailing_zero_table[uVar77] + 2;
                    if (uVar83 != 0) {
                      uVar77 = (uint)(byte)dec_trailing_zero_table[uVar83];
                    }
                    uVar77 = 8 - uVar77;
                  }
                }
                else {
                  uVar92 = (uint)(iVar61 * 0x147b) >> 0x13;
                  uVar77 = (uint)((uVar78 & 0xffffffff) * 0x68db8bb >> 0x20);
                  uVar96 = uVar77 >> 8;
                  uVar83 = uVar96 * 0x147b >> 0x13;
                  uVar78 = (ulong)uVar83;
                  uVar83 = uVar83 * -100 + (uVar77 >> 8);
                  *(undefined2 *)((long)puVar88 + (4 - uVar95)) =
                       *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                  *(undefined2 *)((long)puVar88 + (6 - uVar95)) =
                       *(undefined2 *)(digit_table + (uVar92 * 0x7fffff9c + iVar61) * 2);
                  *(undefined2 *)((long)puVar88 + (8 - uVar95)) =
                       *(undefined2 *)(digit_table + uVar78 * 2);
                  *(undefined2 *)((long)puVar88 + (10 - uVar95)) =
                       *(undefined2 *)(digit_table + uVar83 * 2);
                  iVar70 = uVar96 * -10000 + iVar70;
                  if (iVar70 == 0) {
                    iVar70 = 0xc;
                  }
                  else {
                    uVar77 = (uint)(iVar70 * 0x147b) >> 0x13;
                    uVar78 = (ulong)uVar77;
                    uVar83 = uVar77 * -100 + iVar70;
                    *(undefined2 *)((long)puVar88 + (0xc - uVar95)) =
                         *(undefined2 *)(digit_table + uVar78 * 2);
                    *(undefined2 *)((long)puVar88 + (0xe - uVar95)) =
                         *(undefined2 *)(digit_table + uVar83 * 2);
                    iVar70 = 0x10;
                  }
                  uVar77 = (byte)dec_trailing_zero_table[uVar78] + 2;
                  if (uVar83 != 0) {
                    uVar77 = (uint)(byte)dec_trailing_zero_table[uVar83];
                  }
                  uVar77 = iVar70 - uVar77;
                }
                puVar104 = (uint *)((long)puVar88 + (uVar77 - uVar95));
                uVar78 = 1;
                if (1 < (int)uVar69) {
                  uVar78 = (ulong)uVar69;
                }
                uVar95 = 0;
                do {
                  *(byte *)((long)puVar106 + uVar95 + lVar93) =
                       *(byte *)((long)puVar106 + uVar95 + lVar93 + 1);
                  uVar95 = uVar95 + 1;
                } while (uVar78 != uVar95);
                local_70 = (uint *)((undefined1 *)((long)puVar71 + (ulong)uVar69) + 2);
                *(undefined1 *)((long)puVar71 + (ulong)uVar69) = 0x2e;
                if (local_70 < puVar104) {
                  local_70 = puVar104;
                }
              }
            }
            else {
              uVar95 = uVar78 / 100000000;
              uVar69 = (uint)uVar95;
              lVar93 = 2 - (ulong)(uVar69 < 100000000);
              iVar82 = (int)((uVar95 & 0xffffffff) / 10000);
              iVar84 = iVar82 * -10000 + uVar69;
              uVar78 = uVar95 * 0xfa0a1f00 + uVar78;
              iVar91 = (int)(((uVar95 & 0xffffffff) / 10000) * 0x28f5d >> 0x18);
              uVar77 = (uint)(iVar91 * 0x29) >> 0xc;
              uVar92 = uVar77 * -100 + iVar91;
              uVar83 = iVar91 * -100 + iVar82;
              *(char *)((long)puVar71 + 1) = (char)uVar77 + '0';
              uVar95 = (ulong)(uVar92 < 10 && uVar69 < 100000000);
              *(undefined2 *)((long)puVar71 + lVar93) =
                   *(undefined2 *)(digit_table + uVar95 + uVar92 * 2);
              lVar93 = lVar93 - uVar95;
              *(undefined2 *)((long)puVar71 + lVar93 + 2) =
                   *(undefined2 *)(digit_table + uVar83 * 2);
              iVar91 = (int)uVar78;
              if (iVar91 == 0) {
                if (iVar84 == 0) {
                  uVar69 = 0;
                  if (uVar83 == 0) {
                    uVar69 = (uint)(byte)dec_trailing_zero_table[uVar92];
                  }
                  uVar69 = uVar69 + (byte)dec_trailing_zero_table[uVar83];
                  iVar91 = 4;
                }
                else {
                  uVar69 = (uint)(iVar84 * 0x147b) >> 0x13;
                  uVar77 = uVar69 * -100 + iVar84;
                  *(undefined2 *)((long)puVar71 + lVar93 + 4) =
                       *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                  *(undefined2 *)((long)puVar71 + lVar93 + 6) =
                       *(undefined2 *)(digit_table + uVar77 * 2);
                  uVar69 = (byte)dec_trailing_zero_table[uVar69] + 2;
                  if (uVar77 != 0) {
                    uVar69 = (uint)(byte)dec_trailing_zero_table[uVar77];
                  }
                  iVar91 = 8;
                }
                uVar69 = iVar91 - uVar69;
              }
              else {
                uVar92 = (uint)(iVar84 * 0x147b) >> 0x13;
                uVar69 = (uint)((uVar78 & 0xffffffff) * 0x68db8bb >> 0x20);
                uVar96 = uVar69 >> 8;
                uVar83 = uVar96 * 0x147b >> 0x13;
                uVar77 = uVar83 * -100 + (uVar69 >> 8);
                *(undefined2 *)((long)puVar71 + lVar93 + 4) =
                     *(undefined2 *)(digit_table + (ulong)uVar92 * 2);
                *(undefined2 *)((long)puVar71 + lVar93 + 6) =
                     *(undefined2 *)(digit_table + (uVar92 * 0x7fffff9c + iVar84) * 2);
                *(undefined2 *)((long)puVar71 + lVar93 + 8) =
                     *(undefined2 *)(digit_table + (ulong)uVar83 * 2);
                *(undefined2 *)((long)puVar71 + lVar93 + 10) =
                     *(undefined2 *)(digit_table + uVar77 * 2);
                iVar91 = uVar96 * -10000 + iVar91;
                if (iVar91 == 0) {
                  uVar69 = (byte)dec_trailing_zero_table[uVar83] + 2;
                  if (uVar77 != 0) {
                    uVar69 = (uint)(byte)dec_trailing_zero_table[uVar77];
                  }
                  uVar69 = 0xc - uVar69;
                }
                else {
                  uVar69 = (uint)(iVar91 * 0x147b) >> 0x13;
                  uVar77 = uVar69 * -100 + iVar91;
                  *(undefined2 *)((long)puVar71 + lVar93 + 0xc) =
                       *(undefined2 *)(digit_table + (ulong)uVar69 * 2);
                  *(undefined2 *)((long)puVar71 + lVar93 + 0xe) =
                       *(undefined2 *)(digit_table + uVar77 * 2);
                  uVar69 = (byte)dec_trailing_zero_table[uVar69] + 2;
                  if (uVar77 != 0) {
                    uVar69 = (uint)(byte)dec_trailing_zero_table[uVar77];
                  }
                  uVar69 = 0x10 - uVar69;
                }
              }
              puVar88 = (undefined2 *)
                        ((long)puVar71 +
                        (((ulong)uVar69 + lVar93) - (ulong)((ulong)uVar69 + lVar93 == 2)));
              uVar77 = (iVar61 + iVar70) - 1;
              *(undefined1 *)puVar71 = *(undefined1 *)((long)puVar71 + 1);
              *(undefined1 *)((long)puVar71 + 1) = 0x2e;
              *puVar88 = 0x2d65;
              uVar83 = uVar77 >> 0x1f;
              pcVar60 = (char *)((long)puVar88 + (ulong)uVar83 + 1);
              uVar69 = -uVar77;
              if (0 < (int)uVar77) {
                uVar69 = uVar77;
              }
              if (uVar69 < 100) {
                *(undefined2 *)pcVar60 =
                     *(undefined2 *)(digit_table + (ulong)(uVar69 < 10) + (ulong)uVar69 * 2);
                pbVar80 = (byte *)(pcVar60 + -(ulong)(uVar69 < 10));
                goto LAB_018dad9a;
              }
              *pcVar60 = (char)(uVar69 * 0x290 >> 0x10) + '0';
              *(undefined2 *)((long)puVar88 + (ulong)uVar83 + 2) =
                   *(undefined2 *)
                    (digit_table + ((uVar69 * 0x290 >> 0x10) * 0x7fffff9c + uVar69) * 2);
              local_70 = (uint *)((long)puVar88 + (ulong)uVar83 + 4);
            }
          }
        }
      }
      if (local_70 != (uint *)0x0) goto LAB_018d9262;
      (*p_Var5)(pvVar6,puVar106);
      if (dat_len != (usize *)0x0) {
        *dat_len = 0;
      }
      pyVar66 = &local_48;
      if (err != (yyjson_write_err *)0x0) {
        pyVar66 = err;
      }
      pyVar67->code = 4;
      pcVar60 = "nan or inf number is not allowed";
      goto LAB_018d92c9;
    case 5:
switchD_018d414d_caseD_5:
      uVar95 = uVar78 >> 8;
      puVar104 = (uint *)(val->uni).str;
      puVar106 = (uint *)(*p_Var4)(pvVar6,uVar95 * 6 + 4);
      if (puVar106 != (uint *)0x0) {
        if ((puVar103 != enc_table_cpy) || ((val->tag & 0x18) == 0)) {
          puVar87 = (uint *)(uVar95 + (long)puVar104);
          *(byte *)puVar106 = 0x22;
          puVar75 = puVar106;
LAB_018d951d:
          lVar93 = (long)puVar87 - (long)puVar104;
          if (0xf < lVar93) {
            lVar100 = 0;
            do {
              puVar59 = (uint *)((long)puVar75 + lVar100 + 1);
              puVar107 = (uint *)((long)puVar104 + lVar100);
              if (puVar103[*(byte *)((long)puVar104 + lVar100)] != '\0') goto LAB_018d98fd;
              if (puVar103[*(byte *)((long)puVar104 + lVar100 + 1)] != '\0') {
                puVar59 = (uint *)((long)puVar75 + lVar100 + 1);
                puVar107 = (uint *)((long)puVar104 + lVar100);
                goto LAB_018d9709;
              }
              if (puVar103[*(byte *)((long)puVar104 + lVar100 + 2)] != '\0') {
                puVar59 = (uint *)((long)puVar75 + lVar100 + 1);
                puVar107 = (uint *)((long)puVar104 + lVar100);
                goto LAB_018d972a;
              }
              if (puVar103[*(byte *)((long)puVar104 + lVar100 + 3)] != '\0') {
                puVar59 = (uint *)((long)puVar75 + lVar100 + 1);
                puVar107 = (uint *)((long)puVar104 + lVar100);
                goto LAB_018d974f;
              }
              if (puVar103[*(byte *)((long)puVar104 + lVar100 + 4)] != '\0') {
                puVar107 = (uint *)((byte *)((long)puVar104 + lVar100) + 4);
                puVar59 = (uint *)((long)puVar75 + lVar100 + 5);
                *(undefined4 *)((long)puVar75 + lVar100 + 1) =
                     *(undefined4 *)((long)puVar104 + lVar100);
                goto LAB_018d98fd;
              }
              if (puVar103[*(byte *)((long)puVar104 + lVar100 + 5)] != '\0') {
                pbVar80 = (byte *)((long)puVar104 + lVar100);
                puVar107 = (uint *)(pbVar80 + 5);
                puVar59 = (uint *)((long)puVar75 + lVar100 + 6);
                *(byte *)((long)puVar59 + -1) = pbVar80[4];
                *(undefined4 *)((long)puVar59 + -5) = *(undefined4 *)pbVar80;
                goto LAB_018d98fd;
              }
              if (puVar103[*(byte *)((long)puVar104 + lVar100 + 6)] != '\0') {
                pbVar80 = (byte *)((long)puVar104 + lVar100);
                puVar107 = (uint *)(pbVar80 + 6);
                puVar59 = (uint *)((long)puVar75 + lVar100 + 7);
                *(ushort *)((long)puVar59 + -2) = *(ushort *)(pbVar80 + 4);
                *(undefined4 *)((long)puVar59 + -6) = *(undefined4 *)pbVar80;
                goto LAB_018d98fd;
              }
              if (puVar103[*(byte *)((long)puVar104 + lVar100 + 7)] != '\0') {
                pbVar80 = (byte *)((long)puVar104 + lVar100);
                puVar107 = (uint *)(pbVar80 + 7);
                uVar3 = *(undefined4 *)pbVar80;
                puVar59 = (uint *)((long)puVar75 + lVar100 + 8);
                *(undefined4 *)((long)puVar75 + lVar100 + 4) = *(undefined4 *)(pbVar80 + 3);
                *(undefined4 *)((long)puVar75 + lVar100 + 1) = uVar3;
                goto LAB_018d98fd;
              }
              if (puVar103[*(byte *)((long)puVar104 + lVar100 + 8)] != '\0') {
                puVar107 = (uint *)((byte *)((long)puVar104 + lVar100) + 8);
                puVar59 = (uint *)((long)puVar75 + lVar100 + 9);
                *(undefined8 *)((long)puVar75 + lVar100 + 1) =
                     *(undefined8 *)((long)puVar104 + lVar100);
                goto LAB_018d98fd;
              }
              if (puVar103[*(byte *)((long)puVar104 + lVar100 + 9)] != '\0') {
                pbVar80 = (byte *)((long)puVar104 + lVar100);
                puVar107 = (uint *)(pbVar80 + 9);
                puVar59 = (uint *)((long)puVar75 + lVar100 + 10);
                *(byte *)((long)puVar59 + -1) = pbVar80[8];
                *(undefined8 *)((long)puVar59 + -9) = *(undefined8 *)pbVar80;
                goto LAB_018d98fd;
              }
              if (puVar103[*(byte *)((long)puVar104 + lVar100 + 10)] != '\0') {
                pbVar80 = (byte *)((long)puVar104 + lVar100);
                puVar107 = (uint *)(pbVar80 + 10);
                puVar59 = (uint *)((long)puVar75 + lVar100 + 0xb);
                *(ushort *)((long)puVar59 + -2) = *(ushort *)(pbVar80 + 8);
                *(undefined8 *)((long)puVar59 + -10) = *(undefined8 *)pbVar80;
                goto LAB_018d98fd;
              }
              if (puVar103[*(byte *)((long)puVar104 + lVar100 + 0xb)] != '\0') {
                pbVar80 = (byte *)((long)puVar104 + lVar100);
                puVar107 = (uint *)(pbVar80 + 0xb);
                puVar59 = (uint *)((long)puVar75 + lVar100 + 0xc);
                puVar59[-1] = *(uint *)(pbVar80 + 7);
                *(undefined8 *)((long)puVar59 + -0xb) = *(undefined8 *)pbVar80;
                goto LAB_018d98fd;
              }
              if (puVar103[*(byte *)((long)puVar104 + lVar100 + 0xc)] != '\0') {
                pbVar80 = (byte *)((long)puVar104 + lVar100);
                puVar107 = (uint *)(pbVar80 + 0xc);
                puVar59 = (uint *)((long)puVar75 + lVar100 + 0xd);
                puVar59[-1] = *(uint *)(pbVar80 + 8);
                *(undefined8 *)(puVar59 + -3) = *(undefined8 *)pbVar80;
                goto LAB_018d98fd;
              }
              if (puVar103[*(byte *)((long)puVar104 + lVar100 + 0xd)] != '\0') {
                pbVar80 = (byte *)((long)puVar104 + lVar100);
                puVar107 = (uint *)(pbVar80 + 0xd);
                uVar72 = *(undefined8 *)pbVar80;
                puVar59 = (uint *)((long)puVar75 + lVar100 + 0xe);
                *(undefined8 *)((long)puVar75 + lVar100 + 6) = *(undefined8 *)(pbVar80 + 5);
                *(undefined8 *)((long)puVar75 + lVar100 + 1) = uVar72;
                goto LAB_018d98fd;
              }
              if (puVar103[*(byte *)((long)puVar104 + lVar100 + 0xe)] != '\0') {
                pbVar80 = (byte *)((long)puVar104 + lVar100);
                puVar107 = (uint *)(pbVar80 + 0xe);
                uVar72 = *(undefined8 *)pbVar80;
                puVar59 = (uint *)((long)puVar75 + lVar100 + 0xf);
                *(undefined8 *)((long)puVar75 + lVar100 + 7) = *(undefined8 *)(pbVar80 + 6);
                *(undefined8 *)((long)puVar75 + lVar100 + 1) = uVar72;
                goto LAB_018d98fd;
              }
              if (puVar103[*(byte *)((long)puVar104 + lVar100 + 0xf)] != '\0') {
                pbVar80 = (byte *)((long)puVar104 + lVar100);
                puVar107 = (uint *)(pbVar80 + 0xf);
                uVar72 = *(undefined8 *)pbVar80;
                puVar59 = (uint *)((long)puVar75 + lVar100 + 0x10);
                *(undefined8 *)((long)puVar75 + lVar100 + 8) = *(undefined8 *)(pbVar80 + 7);
                *(undefined8 *)((long)puVar75 + lVar100 + 1) = uVar72;
                goto LAB_018d98fd;
              }
              uVar69 = puVar107[1];
              uVar77 = puVar107[2];
              uVar83 = puVar107[3];
              *puVar59 = *puVar107;
              *(uint *)((long)puVar75 + lVar100 + 5) = uVar69;
              *(uint *)((long)puVar75 + lVar100 + 9) = uVar77;
              *(uint *)((long)puVar75 + lVar100 + 0xd) = uVar83;
              lVar100 = lVar100 + 0x10;
              lVar93 = lVar93 + -0x10;
            } while (0xf < lVar93);
            puVar75 = (uint *)((long)puVar75 + lVar100);
            puVar104 = (uint *)((long)puVar104 + lVar100);
          }
          puVar59 = (uint *)((long)puVar75 + 1);
          puVar107 = puVar104;
          for (lVar93 = (long)puVar87 - (long)puVar104; 3 < lVar93; lVar93 = lVar93 + -4) {
            if (puVar103[(byte)*puVar107] != '\0') goto LAB_018d98fd;
            if (puVar103[*(byte *)((long)puVar107 + 1)] != '\0') goto LAB_018d9709;
            if (puVar103[*(byte *)((long)puVar107 + 2)] != '\0') goto LAB_018d972a;
            if (puVar103[*(byte *)((long)puVar107 + 3)] != '\0') goto LAB_018d974f;
            *puVar59 = *puVar107;
            puVar59 = puVar59 + 1;
            puVar107 = puVar107 + 1;
          }
          while( true ) {
            if (puVar87 <= puVar107) goto switchD_018d9927_default;
            uVar69 = *puVar107;
            if (puVar103[(byte)uVar69] != '\0') break;
            puVar107 = (uint *)((long)puVar107 + 1);
            *(byte *)puVar59 = (byte)uVar69;
            puVar59 = (uint *)((long)puVar59 + 1);
          }
          goto LAB_018d98fd;
        }
        puVar75 = (uint *)((long)puVar106 + 1);
        *(byte *)puVar106 = 0x22;
        if (0xfff < uVar78) {
          do {
            uVar72 = *(undefined8 *)(puVar104 + 2);
            *(undefined8 *)puVar75 = *(undefined8 *)puVar104;
            *(undefined8 *)(puVar75 + 2) = uVar72;
            puVar75 = puVar75 + 4;
            puVar104 = puVar104 + 4;
            uVar95 = uVar95 - 0x10;
          } while (0xf < uVar95);
        }
        for (; 3 < uVar95; uVar95 = uVar95 - 4) {
          *puVar75 = *puVar104;
          puVar75 = puVar75 + 1;
          puVar104 = puVar104 + 1;
        }
        if (uVar95 != 0) {
          uVar78 = 0;
          do {
            *(byte *)((long)puVar75 + uVar78) = *(byte *)((long)puVar104 + uVar78);
            uVar78 = uVar78 + 1;
          } while (uVar95 != uVar78);
          puVar75 = (uint *)((long)puVar75 + uVar78);
        }
        *(byte *)puVar75 = 0x22;
        local_70 = (uint *)((long)puVar75 + 1);
        goto LAB_018d9262;
      }
      break;
    case 6:
switchD_018d414d_caseD_6:
      puVar106 = (uint *)(*p_Var4)(pvVar6,4);
      if (puVar106 != (uint *)0x0) {
        *(ushort *)puVar106 = 0x5d5b;
LAB_018d9253:
        local_70 = (uint *)((long)puVar106 + 2);
        goto LAB_018d9262;
      }
      break;
    case 7:
switchD_018d414d_caseD_7:
      puVar106 = (uint *)(*p_Var4)(pvVar6,4);
      if (puVar106 != (uint *)0x0) {
        *(ushort *)puVar106 = 0x7d7b;
        goto LAB_018d9253;
      }
    }
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar66 = &local_48;
    if (err != (yyjson_write_err *)0x0) {
      pyVar66 = err;
    }
    pyVar67->code = 2;
    pcVar60 = "memory allocation failed";
    goto LAB_018d92c9;
  }
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar66 = &local_48;
  if (err != (yyjson_write_err *)0x0) {
    pyVar66 = err;
  }
  pyVar66->msg = "input JSON is NULL";
  pyVar67->code = 1;
  goto LAB_018d92cd;
LAB_018d70ad:
  *(byte *)puVar59 = (byte)*puVar107;
  puVar59 = (uint *)((long)puVar59 + 1);
  puVar107 = (uint *)((long)puVar107 + 1);
  goto LAB_018d727f;
LAB_018d70c9:
  *(ushort *)puVar59 = (ushort)*puVar107;
  puVar59 = (uint *)((long)puVar59 + 2);
  puVar107 = (uint *)((long)puVar107 + 2);
  goto LAB_018d727f;
LAB_018d70e9:
  *(byte *)((long)puVar59 + 2) = *(byte *)((long)puVar107 + 2);
  *(ushort *)puVar59 = (ushort)*puVar107;
  puVar59 = (uint *)((long)puVar59 + 3);
  puVar107 = (uint *)((long)puVar107 + 3);
LAB_018d727f:
  puVar106 = puVar107 + 1;
  if (puVar106 <= puVar87) {
LAB_018d728c:
    bVar102 = (byte)*puVar107;
    switch(puVar103[bVar102]) {
    case 0:
      goto switchD_018d72a6_caseD_0;
    case 1:
      goto switchD_018d72a6_caseD_1;
    case 2:
      *(ushort *)puVar59 = *(ushort *)(esc_single_char_table + (ulong)bVar102 * 2);
      puVar59 = (uint *)((long)puVar59 + 2);
      puVar107 = (uint *)((long)puVar107 + 1);
      goto LAB_018d727f;
    case 3:
      *puVar59 = 0x3030755c;
      *(ushort *)(puVar59 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar107 * 2);
      goto LAB_018d74e9;
    case 4:
      uVar2 = (ushort)*puVar107;
      if ((uVar2 & 0x1e) != 0 && (uVar2 & 0xc0e0) == 0x80c0) {
        *(ushort *)puVar59 = uVar2;
        puVar59 = (uint *)((long)puVar59 + 2);
        puVar107 = (uint *)((long)puVar107 + 2);
        goto LAB_018d727f;
      }
      break;
    case 5:
      yyjson_mut_write_opts_impl();
      uVar95 = extraout_RAX_01;
      goto LAB_018d7533;
    case 6:
      if (puVar87 < puVar106) {
        uVar69 = (uint)(ushort)*puVar107;
        uVar77 = (uint)(uint3)*puVar107;
        if (((uint3)*puVar107 & 0xc0c0f0) != 0x8080e0) goto LAB_018d75a6;
LAB_018d748f:
        bVar110 = false;
        if (((uVar69 & 0x200f) != 0) && ((uVar69 & 0x200f) != 0x200d)) {
          *puVar59 = uVar77;
          puVar59 = (uint *)((long)puVar59 + 3);
          puVar107 = (uint *)((long)puVar107 + 3);
          bVar110 = true;
        }
      }
      else {
        uVar69 = *puVar107;
        uVar77 = uVar69;
        if ((uVar69 & 0xc0c0f0) == 0x8080e0) goto LAB_018d748f;
LAB_018d75a6:
        bVar110 = false;
      }
      if (bVar110) goto LAB_018d727f;
      break;
    case 7:
      yyjson_mut_write_opts_impl();
      uVar95 = extraout_RAX_02;
LAB_018d7533:
      puVar107 = local_58;
      puVar59 = local_70;
      if ((uVar95 & 1) == 0) goto LAB_018d73b2;
      goto LAB_018d727f;
    case 8:
      uVar69 = *puVar107;
      bVar110 = false;
      if (((uVar69 & 0xc0c0c0f8) == 0x808080f0) && ((uVar69 & 0x3007) != 0)) {
        if (((byte)uVar69 >> 2 & (uVar69 & 0x3003) != 0) == 0) {
          *puVar59 = uVar69;
          puVar59 = puVar59 + 1;
          bVar110 = true;
          puVar107 = puVar106;
        }
        else {
          bVar110 = false;
        }
      }
      if (bVar110) goto LAB_018d727f;
      break;
    case 9:
      goto switchD_018d72a6_caseD_9;
    default:
      goto switchD_018d72a6_default;
    }
LAB_018d74b4:
    if ((flg & 0x20) == 0) goto LAB_018d7fe4;
    *(byte *)puVar59 = (byte)*puVar107;
    puVar107 = (uint *)((long)puVar107 + 1);
    puVar59 = (uint *)((long)puVar59 + 1);
    goto LAB_018d727f;
  }
  if (puVar87 != puVar107) {
    if ((long)(ulong)((byte)puVar103[(byte)*puVar107] >> 1) <= (long)puVar87 - (long)puVar107)
    goto LAB_018d728c;
switchD_018d72a6_caseD_1:
    if ((flg & 2) == 0) goto LAB_018d74b4;
    goto LAB_018d73b2;
  }
switchD_018d72a6_default:
  *(byte *)puVar59 = 0x22;
  pbVar80 = (byte *)((long)puVar59 + 1);
LAB_018d84b2:
  if (pbVar80 == (byte *)0x0) goto LAB_018d8f59;
LAB_018d84c0:
  bVar102 = 0x3a;
  if ((~(uint)lVar93 & (uint)uVar78) == 0) {
    bVar102 = 0x2c;
  }
  *pbVar80 = bVar102;
  puVar75 = (uint *)(pbVar80 + 1);
  sVar108 = uVar65;
  puVar87 = puVar104;
LAB_018d84dd:
  lVar93 = lVar93 + -1;
  if (lVar93 == 0) goto LAB_018d8da5;
  goto LAB_018d6aab;
switchD_018d72a6_caseD_9:
  uVar69 = *puVar107;
  bVar110 = false;
  if (((uVar69 & 0xc0c0c0f8) == 0x808080f0) && ((uVar69 & 0x3007) != 0)) {
    if (((byte)uVar69 >> 2 & (uVar69 & 0x3003) != 0) == 0) {
      bVar102 = *(byte *)((long)puVar107 + 2);
      uVar69 = (bVar102 & 0x3f) * 0x40;
      bVar1 = *(byte *)((long)puVar107 + 3);
      uVar77 = (uVar69 + ((*(byte *)((long)puVar107 + 1) & 0x3f) << 0xc |
                         ((byte)*puVar107 & 7) << 0x12)) - 0x10000;
      *(ushort *)puVar59 = 0x755c;
      *(ushort *)((long)puVar59 + 2) =
           *(ushort *)(esc_hex_char_table + (ulong)((uVar77 >> 10) + 0xd800 >> 8) * 2);
      *(ushort *)(puVar59 + 1) = *(ushort *)(esc_hex_char_table + (uVar77 >> 9 & 0x1fe));
      *(ushort *)((long)puVar59 + 6) = 0x755c;
      *(ushort *)(puVar59 + 2) = *(ushort *)(esc_hex_char_table + (ulong)(bVar102 >> 1 & 6) + 0x1b8)
      ;
      *(ushort *)((long)puVar59 + 10) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar69 & 0xff | bVar1 & 0x3f) * 2);
      puVar59 = puVar59 + 3;
      bVar110 = true;
      puVar107 = puVar106;
    }
    else {
      bVar110 = false;
    }
  }
  if (!bVar110) {
LAB_018d73b2:
    if ((flg & 0x20) == 0) {
LAB_018d7fe4:
      pbVar80 = (byte *)0x0;
      goto LAB_018d84b2;
    }
    *(ushort *)puVar59 = 0x755c;
    ((ushort *)((long)puVar59 + 2))[0] = 0x4646;
    ((ushort *)((long)puVar59 + 2))[1] = 0x4446;
LAB_018d74e9:
    puVar107 = (uint *)((long)puVar107 + 1);
    puVar59 = (uint *)((long)puVar59 + 6);
  }
  goto LAB_018d727f;
switchD_018d72a6_caseD_0:
  puVar106 = (uint *)((long)puVar107 + 1);
  *(byte *)puVar59 = bVar102;
  puVar75 = puVar59;
  goto LAB_018d6eea;
LAB_018d8da5:
  pbVar80 = local_f8 + ~(ulong)puVar75;
  lVar100 = 0;
  pyVar85 = val;
  do {
    local_80 = pyVar85;
    *(byte *)((long)puVar75 + -1) = (char)local_e0 * ' ' + 0x5d;
    puVar104 = (uint *)((long)puVar75 + 1);
    *(byte *)puVar75 = 0x2c;
    if (local_90 <= (uint *)((long)puVar87 + lVar100)) {
      if (local_ec < '\0') {
        if ((uint *)((long)puVar87 + lVar100) <= (uint *)((long)puVar75 + 3)) {
          uVar78 = 2;
          if (2 < sVar108 >> 1) {
            uVar78 = sVar108 >> 1;
          }
          uVar78 = uVar78 + 0xf & 0xfffffffffffffff0;
          pbVar101 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar108,uVar78 + sVar108);
          if (pbVar101 == (byte *)0x0) goto LAB_018d8ec1;
          memmove(pbVar101 + (long)((long)puVar87 + lVar100 + ((uVar78 + sVar108) - (long)local_90))
                  ,(byte *)((long)puVar87 + (lVar100 - (long)local_f8)) + (long)pbVar101,
                  (size_t)((long)local_90 + (-lVar100 - (long)puVar87)));
          puVar104 = (uint *)(pbVar101 + -(long)pbVar80);
          local_f8 = pbVar101;
        }
        *(byte *)((long)puVar104 + -1) = 10;
        puVar75 = puVar104;
      }
      *(byte *)puVar75 = 0;
      if (dat_len != (usize *)0x0) {
        *dat_len = (long)puVar75 - (long)local_f8;
      }
      goto LAB_018dae92;
    }
    puVar89 = (ulong *)((long)puVar87 + lVar100);
    val = *(yyjson_mut_val **)((long)puVar87 + lVar100 + 8);
    local_e0 = *puVar89 & 0xffffffffffffff01;
    lVar100 = lVar100 + 0x10;
    pbVar80 = pbVar80 + -1;
    lVar93 = (*puVar89 >> 1) - 1;
    puVar75 = puVar104;
    pyVar85 = val;
  } while (lVar93 == 0);
  puVar106 = (uint *)((long)puVar87 + lVar100);
  goto LAB_018d6a8c;
LAB_018d497c:
  *(byte *)puVar107 = (byte)*puVar87;
  puVar107 = (uint *)((long)puVar107 + 1);
  puVar87 = (uint *)((long)puVar87 + 1);
  goto LAB_018d4bb9;
LAB_018d49a3:
  *(ushort *)puVar107 = (ushort)*puVar87;
  puVar107 = (uint *)((long)puVar107 + 2);
  puVar87 = (uint *)((long)puVar87 + 2);
  goto LAB_018d4bb9;
LAB_018d49ce:
  *(byte *)((long)puVar107 + 2) = *(byte *)((long)puVar87 + 2);
  *(ushort *)puVar107 = (ushort)*puVar87;
  puVar107 = (uint *)((long)puVar107 + 3);
  puVar87 = (uint *)((long)puVar87 + 3);
LAB_018d4bb9:
  puVar106 = puVar87 + 1;
  if (puVar106 <= puVar75) {
LAB_018d4bc6:
    bVar102 = (byte)*puVar87;
    switch(puVar99[bVar102]) {
    case 0:
      goto switchD_018d4be1_caseD_0;
    case 1:
      goto switchD_018d4be1_caseD_1;
    case 2:
      *(ushort *)puVar107 = *(ushort *)(esc_single_char_table + (ulong)bVar102 * 2);
      puVar107 = (uint *)((long)puVar107 + 2);
      puVar87 = (uint *)((long)puVar87 + 1);
      goto LAB_018d4bb9;
    case 3:
      *puVar107 = 0x3030755c;
      *(ushort *)(puVar107 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar87 * 2);
      goto LAB_018d4e26;
    case 4:
      uVar2 = (ushort)*puVar87;
      if ((uVar2 & 0x1e) != 0 && (uVar2 & 0xc0e0) == 0x80c0) {
        *(ushort *)puVar107 = uVar2;
        puVar107 = (uint *)((long)puVar107 + 2);
        puVar87 = (uint *)((long)puVar87 + 2);
        goto LAB_018d4bb9;
      }
      break;
    case 5:
      yyjson_mut_write_opts_impl();
      uVar78 = extraout_RAX;
      goto LAB_018d4e64;
    case 6:
      if (puVar75 < puVar106) {
        uVar77 = (uint)(uint3)*puVar87;
        uVar83 = (uint)(ushort)*puVar87;
        if ((uVar77 & 0xc0c0f0) != 0x8080e0) goto LAB_018d4ed3;
LAB_018d4dd1:
        bVar110 = false;
        if (((uVar83 & 0x200f) != 0) && ((uVar83 & 0x200f) != 0x200d)) {
          *puVar107 = uVar77;
          puVar107 = (uint *)((long)puVar107 + 3);
          puVar87 = (uint *)((long)puVar87 + 3);
          bVar110 = true;
        }
      }
      else {
        uVar77 = *puVar87;
        uVar83 = uVar77;
        if ((uVar77 & 0xc0c0f0) == 0x8080e0) goto LAB_018d4dd1;
LAB_018d4ed3:
        bVar110 = false;
      }
      if (bVar110) goto LAB_018d4bb9;
      break;
    case 7:
      yyjson_mut_write_opts_impl();
      uVar78 = extraout_RAX_00;
LAB_018d4e64:
      puVar107 = local_70;
      puVar87 = local_58;
      if ((uVar78 & 1) == 0) goto LAB_018d4cf5;
      goto LAB_018d4bb9;
    case 8:
      uVar77 = *puVar87;
      bVar110 = false;
      if (((uVar77 & 0xc0c0c0f8) == 0x808080f0) && ((uVar77 & 0x3007) != 0)) {
        if (((byte)uVar77 >> 2 & (uVar77 & 0x3003) != 0) == 0) {
          *puVar107 = uVar77;
          puVar107 = puVar107 + 1;
          bVar110 = true;
          puVar87 = puVar106;
        }
        else {
          bVar110 = false;
        }
      }
      if (bVar110) goto LAB_018d4bb9;
      break;
    case 9:
      goto switchD_018d4be1_caseD_9;
    default:
      goto switchD_018d4be1_default;
    }
LAB_018d4df5:
    if ((flg & 0x20) == 0) goto LAB_018d5989;
    *(byte *)puVar107 = (byte)*puVar87;
    puVar107 = (uint *)((long)puVar107 + 1);
    puVar87 = (uint *)((long)puVar87 + 1);
    goto LAB_018d4bb9;
  }
  if (puVar75 != puVar87) {
    if ((long)(ulong)((byte)puVar99[(byte)*puVar87] >> 1) <= (long)puVar75 - (long)puVar87)
    goto LAB_018d4bc6;
switchD_018d4be1_caseD_1:
    if ((flg & 2) == 0) goto LAB_018d4df5;
    goto LAB_018d4cf5;
  }
switchD_018d4be1_default:
  *(byte *)puVar107 = 0x22;
  pbVar80 = (byte *)((long)puVar107 + 1);
LAB_018d5e59:
  if (pbVar80 == (byte *)0x0) goto LAB_018d8f59;
LAB_018d5e67:
  bVar110 = (local_c0 & ~uVar69) == 0;
  bVar102 = 0x3a;
  if (bVar110) {
    bVar102 = 0x2c;
  }
  *pbVar80 = bVar102;
  bVar102 = 0x20;
  if (bVar110) {
    bVar102 = 10;
  }
  pbVar80[1] = bVar102;
  puVar106 = (uint *)(pbVar80 + 2);
LAB_018d6292:
  lVar93 = lVar93 + -1;
  lVar63 = lVar79;
  if (lVar93 == 0) goto LAB_018d681a;
  pyVar86 = pyVar86->next;
  sVar108 = sVar64;
  puVar90 = puVar89;
  goto LAB_018d4276;
switchD_018d4be1_caseD_9:
  uVar77 = *puVar87;
  bVar110 = false;
  if (((uVar77 & 0xc0c0c0f8) == 0x808080f0) && ((uVar77 & 0x3007) != 0)) {
    if (((byte)uVar77 >> 2 & (uVar77 & 0x3003) != 0) == 0) {
      bVar102 = *(byte *)((long)puVar87 + 2);
      uVar77 = (bVar102 & 0x3f) * 0x40;
      bVar1 = *(byte *)((long)puVar87 + 3);
      uVar83 = (uVar77 + ((*(byte *)((long)puVar87 + 1) & 0x3f) << 0xc |
                         ((byte)*puVar87 & 7) << 0x12)) - 0x10000;
      *(ushort *)puVar107 = 0x755c;
      *(ushort *)((long)puVar107 + 2) =
           *(ushort *)(esc_hex_char_table + (ulong)((uVar83 >> 10) + 0xd800 >> 8) * 2);
      *(ushort *)(puVar107 + 1) = *(ushort *)(esc_hex_char_table + (uVar83 >> 9 & 0x1fe));
      *(ushort *)((long)puVar107 + 6) = 0x755c;
      *(ushort *)(puVar107 + 2) =
           *(ushort *)(esc_hex_char_table + (ulong)(bVar102 >> 1 & 6) + 0x1b8);
      *(ushort *)((long)puVar107 + 10) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar77 & 0xff | bVar1 & 0x3f) * 2);
      puVar107 = puVar107 + 3;
      bVar110 = true;
      puVar87 = puVar106;
    }
    else {
      bVar110 = false;
    }
  }
  if (!bVar110) {
LAB_018d4cf5:
    if ((flg & 0x20) == 0) {
LAB_018d5989:
      pbVar80 = (byte *)0x0;
      goto LAB_018d5e59;
    }
    *(ushort *)puVar107 = 0x755c;
    ((ushort *)((long)puVar107 + 2))[0] = 0x4646;
    ((ushort *)((long)puVar107 + 2))[1] = 0x4446;
LAB_018d4e26:
    puVar107 = (uint *)((long)puVar107 + 6);
    puVar87 = (uint *)((long)puVar87 + 1);
  }
  goto LAB_018d4bb9;
switchD_018d4be1_caseD_0:
  puVar104 = (uint *)((long)puVar87 + 1);
  *(byte *)puVar107 = bVar102;
  puVar106 = puVar107;
  goto LAB_018d4768;
LAB_018d8f59:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar66 = &local_48;
  if (err != (yyjson_write_err *)0x0) {
    pyVar66 = err;
  }
  pyVar67->code = 7;
  pcVar60 = "invalid utf-8 encoding in string";
LAB_018d8e50:
  pyVar66->msg = pcVar60;
  if (local_f8 != (byte *)0x0) {
    (*p_Var5)(pvVar6,local_f8);
  }
  goto LAB_018d92cd;
LAB_018d8e16:
  if (dat_len != (usize *)0x0) {
    *dat_len = 0;
  }
  pyVar66 = &local_48;
  if (err != (yyjson_write_err *)0x0) {
    pyVar66 = err;
  }
  pyVar67->code = 3;
  pcVar60 = "invalid JSON value type";
  goto LAB_018d8e50;
  while( true ) {
    pyVar85 = local_80->next;
    puVar89 = puVar90 + 2;
    uVar95 = *puVar90;
    local_80 = (yyjson_mut_val *)puVar90[1];
    local_90 = (uint *)(uVar95 & 0xffffffffffffff01);
    puVar106 = (uint *)(pbVar80 + 3);
    pbVar80[1] = 0x2c;
    pbVar80[2] = 10;
    lVar93 = (uVar95 >> 1) - 1;
    lVar63 = lVar79;
    sVar64 = uVar78;
    if (lVar93 != 0) break;
LAB_018d681a:
    pbVar80 = (byte *)((long)puVar106 + -1);
    *(byte *)((long)puVar106 + -2) = 10;
    uVar78 = sVar64;
    puVar90 = puVar89;
    if (puVar89 <= (ulong *)((long)puVar106 + lVar63 * 4 + -1)) {
      uVar78 = sVar64 >> 1;
      if (sVar64 >> 1 <= (ulong)(lVar63 * 4)) {
        uVar78 = lVar63 * 4;
      }
      uVar78 = (uVar78 + 0xf & 0xfffffffffffffff0) + sVar64;
      pbVar101 = (byte *)(*p_Var7)(pvVar6,local_f8,sVar64,uVar78);
      if (pbVar101 == (byte *)0x0) goto LAB_018d8e77;
      puVar90 = (ulong *)(pbVar101 + (uVar78 - ((long)local_88 - (long)puVar89)));
      memmove(puVar90,pbVar101 + ((long)puVar89 - (long)local_f8),(long)local_88 - (long)puVar89);
      pbVar80 = pbVar101 + ((long)pbVar80 - (long)local_f8);
      local_88 = (ulong *)(pbVar101 + uVar78);
      local_f8 = pbVar101;
    }
    lVar79 = lVar63 + -1;
    if (lVar79 != 0) {
      lVar93 = 1;
      do {
        pbVar80[0] = 0x20;
        pbVar80[1] = 0x20;
        pbVar80[2] = 0x20;
        pbVar80[3] = 0x20;
        pbVar80 = pbVar80 + lVar100;
        lVar93 = lVar93 + 1;
      } while (lVar63 != lVar93);
    }
    *pbVar80 = (char)local_90 * ' ' + 0x5d;
    if (local_88 <= puVar90) {
      pbVar101 = pbVar80 + 1;
      if (local_ec < '\0') {
        if (puVar90 <= pbVar80 + 3) {
          uVar95 = 2;
          if (2 < uVar78 >> 1) {
            uVar95 = uVar78 >> 1;
          }
          sVar108 = (uVar95 + 0xf & 0xfffffffffffffff0) + uVar78;
          pbVar80 = (byte *)(*p_Var7)(pvVar6,local_f8,uVar78,sVar108);
          if (pbVar80 == (byte *)0x0) goto LAB_018d8e77;
          memmove(pbVar80 + (sVar108 - ((long)local_88 - (long)puVar90)),
                  pbVar80 + ((long)puVar90 - (long)local_f8),(long)local_88 - (long)puVar90);
          pbVar101 = pbVar80 + ((long)pbVar101 - (long)local_f8);
          local_f8 = pbVar80;
        }
        *pbVar101 = 10;
        pbVar101 = pbVar101 + 1;
      }
      *pbVar101 = 0;
      if (dat_len != (usize *)0x0) {
        *dat_len = (long)pbVar101 - (long)local_f8;
      }
LAB_018dae92:
      pyVar67->code = 0;
      pyVar67 = &local_48;
      if (err != (yyjson_write_err *)0x0) {
        pyVar67 = err;
      }
      pyVar67->msg = "success";
      return (char *)local_f8;
    }
  }
  goto LAB_018d424a;
LAB_018d9709:
  *(byte *)puVar59 = (byte)*puVar107;
  puVar59 = (uint *)((long)puVar59 + 1);
  puVar107 = (uint *)((long)puVar107 + 1);
  goto LAB_018d98fd;
LAB_018d972a:
  *(ushort *)puVar59 = (ushort)*puVar107;
  puVar59 = (uint *)((long)puVar59 + 2);
  puVar107 = (uint *)((long)puVar107 + 2);
  goto LAB_018d98fd;
switchD_018d9927_caseD_9:
  uVar69 = *puVar107;
  bVar110 = false;
  if (((uVar69 & 0xc0c0c0f8) == 0x808080f0) && ((uVar69 & 0x3007) != 0)) {
    if (((byte)uVar69 >> 2 & (uVar69 & 0x3003) != 0) == 0) {
      bVar102 = *(byte *)((long)puVar107 + 2);
      uVar69 = (bVar102 & 0x3f) * 0x40;
      bVar1 = *(byte *)((long)puVar107 + 3);
      uVar77 = (uVar69 + ((*(byte *)((long)puVar107 + 1) & 0x3f) << 0xc |
                         ((byte)*puVar107 & 7) << 0x12)) - 0x10000;
      *(ushort *)puVar59 = 0x755c;
      *(ushort *)((long)puVar59 + 2) =
           *(ushort *)(esc_hex_char_table + (ulong)((uVar77 >> 10) + 0xd800 >> 8) * 2);
      *(ushort *)(puVar59 + 1) = *(ushort *)(esc_hex_char_table + (uVar77 >> 9 & 0x1fe));
      *(ushort *)((long)puVar59 + 6) = 0x755c;
      *(ushort *)(puVar59 + 2) = *(ushort *)(esc_hex_char_table + (ulong)(bVar102 >> 1 & 6) + 0x1b8)
      ;
      *(ushort *)((long)puVar59 + 10) =
           *(ushort *)(esc_hex_char_table + (ulong)(uVar69 & 0xff | bVar1 & 0x3f) * 2);
      puVar59 = puVar59 + 3;
      bVar110 = true;
      puVar107 = puVar104;
    }
    else {
      bVar110 = false;
    }
  }
  if (!bVar110) {
LAB_018d9a27:
    if ((flg & 0x20) == 0) {
LAB_018da56d:
      local_70 = (uint *)0x0;
      goto LAB_018da9cc;
    }
    *(ushort *)puVar59 = 0x755c;
    ((ushort *)((long)puVar59 + 2))[0] = 0x4646;
    ((ushort *)((long)puVar59 + 2))[1] = 0x4446;
LAB_018d9b4c:
    puVar59 = (uint *)((long)puVar59 + 6);
    puVar107 = (uint *)((long)puVar107 + 1);
  }
  goto LAB_018d98fd;
switchD_018d9927_caseD_0:
  puVar104 = (uint *)((long)puVar107 + 1);
  *(byte *)puVar59 = bVar102;
  puVar75 = puVar59;
  goto LAB_018d951d;
LAB_018d974f:
  *(byte *)((long)puVar59 + 2) = *(byte *)((long)puVar107 + 2);
  *(ushort *)puVar59 = (ushort)*puVar107;
  puVar59 = (uint *)((long)puVar59 + 3);
  puVar107 = (uint *)((long)puVar107 + 3);
LAB_018d98fd:
  puVar104 = puVar107 + 1;
  if (puVar104 <= puVar87) {
LAB_018d990a:
    bVar102 = (byte)*puVar107;
    switch(puVar103[bVar102]) {
    case 0:
      goto switchD_018d9927_caseD_0;
    case 1:
      goto switchD_018d9927_caseD_1;
    case 2:
      *(ushort *)puVar59 = *(ushort *)(esc_single_char_table + (ulong)bVar102 * 2);
      puVar59 = (uint *)((long)puVar59 + 2);
      puVar107 = (uint *)((long)puVar107 + 1);
      goto LAB_018d98fd;
    case 3:
      *puVar59 = 0x3030755c;
      *(ushort *)(puVar59 + 1) = *(ushort *)(esc_hex_char_table + (ulong)(byte)*puVar107 * 2);
      goto LAB_018d9b4c;
    case 4:
      uVar2 = (ushort)*puVar107;
      if ((uVar2 & 0x1e) != 0 && (uVar2 & 0xc0e0) == 0x80c0) {
        *(ushort *)puVar59 = uVar2;
        puVar59 = (uint *)((long)puVar59 + 2);
        puVar107 = (uint *)((long)puVar107 + 2);
        goto LAB_018d98fd;
      }
      break;
    case 5:
      yyjson_mut_write_opts_impl();
      uVar78 = extraout_RAX_03;
      goto LAB_018d9b8a;
    case 6:
      if (puVar87 < puVar104) {
        uVar69 = (uint)(uint3)*puVar107;
        if ((uVar69 & 0xc0c0f0) == 0x8080e0) {
          bVar110 = false;
          if ((*puVar107 & 0x200f) != 0) {
            if ((*puVar107 & 0x200f) != 0x200d) goto LAB_018d9b0d;
            goto LAB_018d9b19;
          }
        }
        bVar110 = false;
      }
      else {
        uVar69 = *puVar107;
        if ((uVar69 & 0xc0c0f0) == 0x8080e0) {
          bVar110 = false;
          if (((uVar69 & 0x200f) != 0) && ((uVar69 & 0x200f) != 0x200d)) {
LAB_018d9b0d:
            *puVar59 = uVar69;
            puVar59 = (uint *)((long)puVar59 + 3);
            puVar107 = (uint *)((long)puVar107 + 3);
            bVar110 = true;
          }
        }
        else {
          bVar110 = false;
        }
      }
LAB_018d9b19:
      if (bVar110) goto LAB_018d98fd;
      break;
    case 7:
      yyjson_mut_write_opts_impl();
      uVar78 = extraout_RAX_04;
LAB_018d9b8a:
      puVar59 = local_70;
      puVar107 = local_58;
      if ((uVar78 & 1) == 0) goto LAB_018d9a27;
      goto LAB_018d98fd;
    case 8:
      uVar69 = *puVar107;
      bVar110 = false;
      if (((uVar69 & 0xc0c0c0f8) == 0x808080f0) && ((uVar69 & 0x3007) != 0)) {
        if (((byte)uVar69 >> 2 & (uVar69 & 0x3003) != 0) == 0) {
          *puVar59 = uVar69;
          puVar59 = puVar59 + 1;
          bVar110 = true;
          puVar107 = puVar104;
        }
        else {
          bVar110 = false;
        }
      }
      if (bVar110) goto LAB_018d98fd;
      break;
    case 9:
      goto switchD_018d9927_caseD_9;
    default:
      goto switchD_018d9927_default;
    }
LAB_018d9b21:
    if ((flg & 0x20) == 0) goto LAB_018da56d;
    *(byte *)puVar59 = (byte)*puVar107;
    puVar59 = (uint *)((long)puVar59 + 1);
    puVar107 = (uint *)((long)puVar107 + 1);
    goto LAB_018d98fd;
  }
  if (puVar87 != puVar107) {
    if ((long)(ulong)((byte)puVar103[(byte)*puVar107] >> 1) <= (long)puVar87 - (long)puVar107)
    goto LAB_018d990a;
switchD_018d9927_caseD_1:
    if ((flg & 2) == 0) goto LAB_018d9b21;
    goto LAB_018d9a27;
  }
switchD_018d9927_default:
  *(byte *)puVar59 = 0x22;
  local_70 = (uint *)((long)puVar59 + 1);
LAB_018da9cc:
  if (local_70 == (uint *)0x0) {
    (*p_Var5)(pvVar6,puVar106);
    if (dat_len != (usize *)0x0) {
      *dat_len = 0;
    }
    pyVar66 = &local_48;
    if (err != (yyjson_write_err *)0x0) {
      pyVar66 = err;
    }
    pyVar67->code = 7;
    pcVar60 = "invalid utf-8 encoding in string";
LAB_018d92c9:
    pyVar66->msg = pcVar60;
LAB_018d92cd:
    puVar106 = (uint *)0x0;
  }
  else {
LAB_018d9262:
    if (local_ec < '\0') {
      *(byte *)local_70 = 10;
      local_70 = (uint *)((long)local_70 + 1);
    }
    *(byte *)local_70 = 0;
    if (dat_len != (usize *)0x0) {
      *dat_len = (long)local_70 - (long)puVar106;
    }
    *(undefined8 *)pyVar67 = 0;
    pyVar67->msg = (char *)0x0;
  }
  return (char *)puVar106;
}

Assistant:

static char *yyjson_mut_write_opts_impl(const yyjson_mut_val *val,
                                        usize estimated_val_num,
                                        yyjson_write_flag flg,
                                        const yyjson_alc *alc_ptr,
                                        usize *dat_len,
                                        yyjson_write_err *err) {
    yyjson_write_err dummy_err;
    usize dummy_dat_len;
    yyjson_alc alc = alc_ptr ? *alc_ptr : YYJSON_DEFAULT_ALC;
    yyjson_mut_val *root = constcast(yyjson_mut_val *)val;

    err = err ? err : &dummy_err;
    dat_len = dat_len ? dat_len : &dummy_dat_len;

    if (unlikely(!root)) {
        *dat_len = 0;
        err->msg = "input JSON is NULL";
        err->code = YYJSON_WRITE_ERROR_INVALID_PARAMETER;
        return NULL;
    }

    if (!unsafe_yyjson_is_ctn(root) || unsafe_yyjson_get_len(root) == 0) {
        return (char *)yyjson_mut_write_single(root, flg, alc, dat_len, err);
    } else if (flg & (YYJSON_WRITE_PRETTY | YYJSON_WRITE_PRETTY_TWO_SPACES)) {
        return (char *)yyjson_mut_write_pretty(root, estimated_val_num,
                                               flg, alc, dat_len, err);
    } else {
        return (char *)yyjson_mut_write_minify(root, estimated_val_num,
                                               flg, alc, dat_len, err);
    }
}